

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  uint uVar83;
  ulong uVar84;
  ulong uVar85;
  uint uVar86;
  ulong uVar87;
  long lVar88;
  bool bVar89;
  float fVar90;
  float fVar116;
  float fVar118;
  vint4 bi_2;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar120;
  undefined1 auVar108 [32];
  float fVar117;
  float fVar119;
  float fVar121;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar125;
  float fVar157;
  float fVar158;
  vint4 bi_1;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar159;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar134 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  vint4 ai;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar181;
  float fVar193;
  float fVar194;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [28];
  float fVar195;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  vint4 bi;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar209 [32];
  float fVar210;
  float fVar228;
  float fVar229;
  vint4 ai_2;
  undefined1 auVar211 [16];
  float fVar231;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar230;
  float fVar232;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar235;
  float fVar237;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar233;
  float fVar234;
  float fVar236;
  undefined1 auVar227 [64];
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar251;
  float fVar256;
  undefined1 auVar241 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar267;
  float fVar268;
  float fVar271;
  float fVar272;
  float fVar275;
  float fVar276;
  float fVar278;
  undefined1 auVar244 [32];
  float fVar255;
  float fVar260;
  float fVar265;
  float fVar269;
  float fVar273;
  float fVar277;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar261;
  float fVar266;
  float fVar270;
  float fVar274;
  undefined1 auVar250 [64];
  float fVar279;
  float fVar287;
  float fVar288;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar290;
  undefined1 auVar283 [32];
  float fVar289;
  float fVar291;
  float fVar293;
  float fVar295;
  float fVar297;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar292;
  float fVar294;
  float fVar296;
  undefined1 auVar286 [64];
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar307;
  float fVar312;
  vint4 ai_1;
  undefined1 auVar303 [16];
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  float fVar348;
  float fVar349;
  float fVar350;
  undefined1 auVar346 [32];
  undefined1 auVar351 [16];
  float fVar355;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  float fVar356;
  float fVar360;
  float fVar361;
  undefined1 auVar357 [16];
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  undefined1 auVar358 [32];
  float fVar367;
  float fVar371;
  float fVar372;
  undefined1 auVar368 [16];
  float fVar373;
  undefined1 auVar369 [32];
  float fVar374;
  float fVar375;
  float fVar376;
  undefined1 auVar370 [64];
  float fVar377;
  float fVar385;
  float fVar388;
  undefined1 auVar380 [16];
  float fVar378;
  float fVar386;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  undefined1 auVar381 [32];
  float fVar379;
  float fVar387;
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_ba0;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  undefined8 local_b20;
  undefined8 uStack_b18;
  ulong local_b10;
  float local_b08;
  float local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [16];
  undefined8 *local_9e8;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 auStack_9d0 [16];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [16];
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint uStack_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560 [4];
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540 [4];
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar347 [64];
  undefined1 auVar354 [64];
  undefined1 auVar359 [64];
  
  PVar3 = prim[1];
  uVar84 = (ulong)(byte)PVar3;
  auVar128 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar128 = vinsertps_avx(auVar128,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar164 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar164 = vinsertps_avx(auVar164,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar210 = *(float *)(prim + uVar84 * 0x19 + 0x12);
  auVar128 = vsubps_avx(auVar128,*(undefined1 (*) [16])(prim + uVar84 * 0x19 + 6));
  auVar160._0_4_ = fVar210 * auVar128._0_4_;
  auVar160._4_4_ = fVar210 * auVar128._4_4_;
  auVar160._8_4_ = fVar210 * auVar128._8_4_;
  auVar160._12_4_ = fVar210 * auVar128._12_4_;
  auVar280._0_4_ = fVar210 * auVar164._0_4_;
  auVar280._4_4_ = fVar210 * auVar164._4_4_;
  auVar280._8_4_ = fVar210 * auVar164._8_4_;
  auVar280._12_4_ = fVar210 * auVar164._12_4_;
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 5 + 6)));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xb + 6)));
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar84 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar87 = (ulong)(uint)((int)(uVar84 * 9) * 2);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 + uVar84 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar87 = (ulong)(uint)((int)(uVar84 * 5) << 2);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar91 = vshufps_avx(auVar280,auVar280,0);
  auVar126 = vshufps_avx(auVar280,auVar280,0x55);
  auVar161 = vshufps_avx(auVar280,auVar280,0xaa);
  fVar210 = auVar161._0_4_;
  fVar181 = auVar161._4_4_;
  fVar228 = auVar161._8_4_;
  fVar193 = auVar161._12_4_;
  fVar238 = auVar126._0_4_;
  fVar251 = auVar126._4_4_;
  fVar256 = auVar126._8_4_;
  fVar261 = auVar126._12_4_;
  fVar229 = auVar91._0_4_;
  fVar194 = auVar91._4_4_;
  fVar231 = auVar91._8_4_;
  fVar195 = auVar91._12_4_;
  auVar368._0_4_ = fVar229 * auVar128._0_4_ + fVar238 * auVar164._0_4_ + fVar210 * auVar97._0_4_;
  auVar368._4_4_ = fVar194 * auVar128._4_4_ + fVar251 * auVar164._4_4_ + fVar181 * auVar97._4_4_;
  auVar368._8_4_ = fVar231 * auVar128._8_4_ + fVar256 * auVar164._8_4_ + fVar228 * auVar97._8_4_;
  auVar368._12_4_ = fVar195 * auVar128._12_4_ + fVar261 * auVar164._12_4_ + fVar193 * auVar97._12_4_
  ;
  auVar380._0_4_ = fVar229 * auVar166._0_4_ + fVar238 * auVar129._0_4_ + auVar96._0_4_ * fVar210;
  auVar380._4_4_ = fVar194 * auVar166._4_4_ + fVar251 * auVar129._4_4_ + auVar96._4_4_ * fVar181;
  auVar380._8_4_ = fVar231 * auVar166._8_4_ + fVar256 * auVar129._8_4_ + auVar96._8_4_ * fVar228;
  auVar380._12_4_ = fVar195 * auVar166._12_4_ + fVar261 * auVar129._12_4_ + auVar96._12_4_ * fVar193
  ;
  auVar281._0_4_ = fVar229 * auVar92._0_4_ + fVar238 * auVar93._0_4_ + auVar127._0_4_ * fVar210;
  auVar281._4_4_ = fVar194 * auVar92._4_4_ + fVar251 * auVar93._4_4_ + auVar127._4_4_ * fVar181;
  auVar281._8_4_ = fVar231 * auVar92._8_4_ + fVar256 * auVar93._8_4_ + auVar127._8_4_ * fVar228;
  auVar281._12_4_ = fVar195 * auVar92._12_4_ + fVar261 * auVar93._12_4_ + auVar127._12_4_ * fVar193;
  auVar91 = vshufps_avx(auVar160,auVar160,0);
  auVar126 = vshufps_avx(auVar160,auVar160,0x55);
  auVar161 = vshufps_avx(auVar160,auVar160,0xaa);
  fVar210 = auVar161._0_4_;
  fVar181 = auVar161._4_4_;
  fVar228 = auVar161._8_4_;
  fVar193 = auVar161._12_4_;
  fVar238 = auVar126._0_4_;
  fVar251 = auVar126._4_4_;
  fVar256 = auVar126._8_4_;
  fVar261 = auVar126._12_4_;
  fVar229 = auVar91._0_4_;
  fVar194 = auVar91._4_4_;
  fVar231 = auVar91._8_4_;
  fVar195 = auVar91._12_4_;
  auVar196._0_4_ = fVar229 * auVar128._0_4_ + fVar238 * auVar164._0_4_ + fVar210 * auVar97._0_4_;
  auVar196._4_4_ = fVar194 * auVar128._4_4_ + fVar251 * auVar164._4_4_ + fVar181 * auVar97._4_4_;
  auVar196._8_4_ = fVar231 * auVar128._8_4_ + fVar256 * auVar164._8_4_ + fVar228 * auVar97._8_4_;
  auVar196._12_4_ = fVar195 * auVar128._12_4_ + fVar261 * auVar164._12_4_ + fVar193 * auVar97._12_4_
  ;
  auVar126._0_4_ = fVar229 * auVar166._0_4_ + auVar96._0_4_ * fVar210 + fVar238 * auVar129._0_4_;
  auVar126._4_4_ = fVar194 * auVar166._4_4_ + auVar96._4_4_ * fVar181 + fVar251 * auVar129._4_4_;
  auVar126._8_4_ = fVar231 * auVar166._8_4_ + auVar96._8_4_ * fVar228 + fVar256 * auVar129._8_4_;
  auVar126._12_4_ = fVar195 * auVar166._12_4_ + auVar96._12_4_ * fVar193 + fVar261 * auVar129._12_4_
  ;
  auVar91._0_4_ = fVar229 * auVar92._0_4_ + fVar238 * auVar93._0_4_ + auVar127._0_4_ * fVar210;
  auVar91._4_4_ = fVar194 * auVar92._4_4_ + fVar251 * auVar93._4_4_ + auVar127._4_4_ * fVar181;
  auVar91._8_4_ = fVar231 * auVar92._8_4_ + fVar256 * auVar93._8_4_ + auVar127._8_4_ * fVar228;
  auVar91._12_4_ = fVar195 * auVar92._12_4_ + fVar261 * auVar93._12_4_ + auVar127._12_4_ * fVar193;
  auVar241._8_4_ = 0x7fffffff;
  auVar241._0_8_ = 0x7fffffff7fffffff;
  auVar241._12_4_ = 0x7fffffff;
  auVar128 = vandps_avx(auVar368,auVar241);
  auVar182._8_4_ = 0x219392ef;
  auVar182._0_8_ = 0x219392ef219392ef;
  auVar182._12_4_ = 0x219392ef;
  auVar128 = vcmpps_avx(auVar128,auVar182,1);
  auVar164 = vblendvps_avx(auVar368,auVar182,auVar128);
  auVar128 = vandps_avx(auVar380,auVar241);
  auVar128 = vcmpps_avx(auVar128,auVar182,1);
  auVar97 = vblendvps_avx(auVar380,auVar182,auVar128);
  auVar128 = vandps_avx(auVar281,auVar241);
  auVar128 = vcmpps_avx(auVar128,auVar182,1);
  auVar128 = vblendvps_avx(auVar281,auVar182,auVar128);
  auVar166 = vrcpps_avx(auVar164);
  fVar238 = auVar166._0_4_;
  auVar161._0_4_ = fVar238 * auVar164._0_4_;
  fVar251 = auVar166._4_4_;
  auVar161._4_4_ = fVar251 * auVar164._4_4_;
  fVar256 = auVar166._8_4_;
  auVar161._8_4_ = fVar256 * auVar164._8_4_;
  fVar261 = auVar166._12_4_;
  auVar161._12_4_ = fVar261 * auVar164._12_4_;
  auVar282._8_4_ = 0x3f800000;
  auVar282._0_8_ = &DAT_3f8000003f800000;
  auVar282._12_4_ = 0x3f800000;
  auVar164 = vsubps_avx(auVar282,auVar161);
  fVar238 = fVar238 + fVar238 * auVar164._0_4_;
  fVar251 = fVar251 + fVar251 * auVar164._4_4_;
  fVar256 = fVar256 + fVar256 * auVar164._8_4_;
  fVar261 = fVar261 + fVar261 * auVar164._12_4_;
  auVar164 = vrcpps_avx(auVar97);
  fVar210 = auVar164._0_4_;
  auVar211._0_4_ = fVar210 * auVar97._0_4_;
  fVar228 = auVar164._4_4_;
  auVar211._4_4_ = fVar228 * auVar97._4_4_;
  fVar229 = auVar164._8_4_;
  auVar211._8_4_ = fVar229 * auVar97._8_4_;
  fVar231 = auVar164._12_4_;
  auVar211._12_4_ = fVar231 * auVar97._12_4_;
  auVar164 = vsubps_avx(auVar282,auVar211);
  fVar210 = fVar210 + fVar210 * auVar164._0_4_;
  fVar228 = fVar228 + fVar228 * auVar164._4_4_;
  fVar229 = fVar229 + fVar229 * auVar164._8_4_;
  fVar231 = fVar231 + fVar231 * auVar164._12_4_;
  auVar164 = vrcpps_avx(auVar128);
  fVar181 = auVar164._0_4_;
  auVar183._0_4_ = fVar181 * auVar128._0_4_;
  fVar193 = auVar164._4_4_;
  auVar183._4_4_ = fVar193 * auVar128._4_4_;
  fVar194 = auVar164._8_4_;
  auVar183._8_4_ = fVar194 * auVar128._8_4_;
  fVar195 = auVar164._12_4_;
  auVar183._12_4_ = fVar195 * auVar128._12_4_;
  auVar128 = vsubps_avx(auVar282,auVar183);
  fVar181 = fVar181 + fVar181 * auVar128._0_4_;
  fVar193 = fVar193 + fVar193 * auVar128._4_4_;
  fVar194 = fVar194 + fVar194 * auVar128._8_4_;
  fVar195 = fVar195 + fVar195 * auVar128._12_4_;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar84 * 7 + 6);
  auVar128 = vpmovsxwd_avx(auVar128);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,auVar196);
  auVar162._0_4_ = fVar238 * auVar128._0_4_;
  auVar162._4_4_ = fVar251 * auVar128._4_4_;
  auVar162._8_4_ = fVar256 * auVar128._8_4_;
  auVar162._12_4_ = fVar261 * auVar128._12_4_;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + uVar84 * 9 + 6);
  auVar128 = vpmovsxwd_avx(auVar164);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,auVar196);
  auVar197._0_4_ = fVar238 * auVar128._0_4_;
  auVar197._4_4_ = fVar251 * auVar128._4_4_;
  auVar197._8_4_ = fVar256 * auVar128._8_4_;
  auVar197._12_4_ = fVar261 * auVar128._12_4_;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar164 = vpmovsxwd_avx(auVar97);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar84 * -2 + 6);
  auVar128 = vpmovsxwd_avx(auVar166);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,auVar126);
  auVar303._0_4_ = auVar128._0_4_ * fVar210;
  auVar303._4_4_ = auVar128._4_4_ * fVar228;
  auVar303._8_4_ = auVar128._8_4_ * fVar229;
  auVar303._12_4_ = auVar128._12_4_ * fVar231;
  auVar128 = vcvtdq2ps_avx(auVar164);
  auVar128 = vsubps_avx(auVar128,auVar126);
  auVar127._0_4_ = fVar210 * auVar128._0_4_;
  auVar127._4_4_ = fVar228 * auVar128._4_4_;
  auVar127._8_4_ = fVar229 * auVar128._8_4_;
  auVar127._12_4_ = fVar231 * auVar128._12_4_;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar87 + uVar84 + 6);
  auVar128 = vpmovsxwd_avx(auVar129);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,auVar91);
  auVar212._0_4_ = auVar128._0_4_ * fVar181;
  auVar212._4_4_ = auVar128._4_4_ * fVar193;
  auVar212._8_4_ = auVar128._8_4_ * fVar194;
  auVar212._12_4_ = auVar128._12_4_ * fVar195;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar84 * 0x17 + 6);
  auVar128 = vpmovsxwd_avx(auVar96);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,auVar91);
  auVar92._0_4_ = auVar128._0_4_ * fVar181;
  auVar92._4_4_ = auVar128._4_4_ * fVar193;
  auVar92._8_4_ = auVar128._8_4_ * fVar194;
  auVar92._12_4_ = auVar128._12_4_ * fVar195;
  auVar128 = vpminsd_avx(auVar162,auVar197);
  auVar164 = vpminsd_avx(auVar303,auVar127);
  auVar128 = vmaxps_avx(auVar128,auVar164);
  auVar164 = vpminsd_avx(auVar212,auVar92);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar342._4_4_ = uVar1;
  auVar342._0_4_ = uVar1;
  auVar342._8_4_ = uVar1;
  auVar342._12_4_ = uVar1;
  auVar164 = vmaxps_avx(auVar164,auVar342);
  auVar128 = vmaxps_avx(auVar128,auVar164);
  local_510._0_4_ = auVar128._0_4_ * 0.99999964;
  local_510._4_4_ = auVar128._4_4_ * 0.99999964;
  local_510._8_4_ = auVar128._8_4_ * 0.99999964;
  local_510._12_4_ = auVar128._12_4_ * 0.99999964;
  auVar128 = vpmaxsd_avx(auVar162,auVar197);
  auVar164 = vpmaxsd_avx(auVar303,auVar127);
  auVar128 = vminps_avx(auVar128,auVar164);
  auVar164 = vpmaxsd_avx(auVar212,auVar92);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar163._4_4_ = uVar1;
  auVar163._0_4_ = uVar1;
  auVar163._8_4_ = uVar1;
  auVar163._12_4_ = uVar1;
  auVar164 = vminps_avx(auVar164,auVar163);
  auVar128 = vminps_avx(auVar128,auVar164);
  auVar93._0_4_ = auVar128._0_4_ * 1.0000004;
  auVar93._4_4_ = auVar128._4_4_ * 1.0000004;
  auVar93._8_4_ = auVar128._8_4_ * 1.0000004;
  auVar93._12_4_ = auVar128._12_4_ * 1.0000004;
  auVar128 = vpshufd_avx(ZEXT116((byte)PVar3),0);
  auVar164 = vpcmpgtd_avx(auVar128,_DAT_01ff0cf0);
  auVar128 = vcmpps_avx(local_510,auVar93,2);
  auVar128 = vandps_avx(auVar128,auVar164);
  uVar83 = vmovmskps_avx(auVar128);
  if (uVar83 == 0) {
    return;
  }
  auVar106._16_16_ = mm_lookupmask_ps._240_16_;
  auVar106._0_16_ = mm_lookupmask_ps._240_16_;
  uVar83 = uVar83 & 0xff;
  local_4a0 = vblendps_avx(auVar106,ZEXT832(0) << 0x20,0x80);
  local_9e8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8f0 = prim;
LAB_00f99087:
  local_8e8 = (ulong)uVar83;
  lVar88 = 0;
  if (local_8e8 != 0) {
    for (; (uVar83 >> lVar88 & 1) == 0; lVar88 = lVar88 + 1) {
    }
  }
  local_8e8 = local_8e8 - 1 & local_8e8;
  uVar83 = *(uint *)(local_8f0 + 2);
  uVar4 = *(uint *)(local_8f0 + lVar88 * 4 + 6);
  local_b10 = (ulong)uVar4;
  pGVar5 = (context->scene->geometries).items[uVar83].ptr;
  uVar87 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_b10);
  p_Var6 = pGVar5[1].intersectionFilterN;
  lVar88 = *(long *)&pGVar5[1].time_range.upper;
  auVar128 = *(undefined1 (*) [16])(lVar88 + (long)p_Var6 * uVar87);
  auVar164 = *(undefined1 (*) [16])(lVar88 + (uVar87 + 1) * (long)p_Var6);
  auVar97 = *(undefined1 (*) [16])(lVar88 + (uVar87 + 2) * (long)p_Var6);
  lVar7 = 0;
  if (local_8e8 != 0) {
    for (; (local_8e8 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  auVar166 = *(undefined1 (*) [16])(lVar88 + (uVar87 + 3) * (long)p_Var6);
  if (((local_8e8 != 0) && (uVar87 = local_8e8 - 1 & local_8e8, uVar87 != 0)) &&
     (lVar88 = 0, uVar87 != 0)) {
    for (; (uVar87 >> lVar88 & 1) == 0; lVar88 = lVar88 + 1) {
    }
  }
  auVar129 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar96 = vinsertps_avx(auVar129,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar210 = *(float *)(ray + k * 4 + 0x40);
  auVar343._4_4_ = fVar210;
  auVar343._0_4_ = fVar210;
  auVar343._8_4_ = fVar210;
  auVar343._12_4_ = fVar210;
  fStack_7f0 = fVar210;
  _local_800 = auVar343;
  fStack_7ec = fVar210;
  fStack_7e8 = fVar210;
  fStack_7e4 = fVar210;
  auVar347 = ZEXT3264(_local_800);
  fVar181 = *(float *)(ray + k * 4 + 0x50);
  auVar351._4_4_ = fVar181;
  auVar351._0_4_ = fVar181;
  auVar351._8_4_ = fVar181;
  auVar351._12_4_ = fVar181;
  fStack_810 = fVar181;
  _local_820 = auVar351;
  fStack_80c = fVar181;
  fStack_808 = fVar181;
  fStack_804 = fVar181;
  auVar354 = ZEXT3264(_local_820);
  auVar129 = vunpcklps_avx(auVar343,auVar351);
  fVar228 = *(float *)(ray + k * 4 + 0x60);
  auVar357._4_4_ = fVar228;
  auVar357._0_4_ = fVar228;
  auVar357._8_4_ = fVar228;
  auVar357._12_4_ = fVar228;
  fStack_830 = fVar228;
  _local_840 = auVar357;
  fStack_82c = fVar228;
  fStack_828 = fVar228;
  fStack_824 = fVar228;
  auVar359 = ZEXT3264(_local_840);
  _local_970 = vinsertps_avx(auVar129,auVar357,0x28);
  auVar370 = ZEXT1664(_local_970);
  auVar94._0_4_ = (auVar128._0_4_ + auVar164._0_4_ + auVar97._0_4_ + auVar166._0_4_) * 0.25;
  auVar94._4_4_ = (auVar128._4_4_ + auVar164._4_4_ + auVar97._4_4_ + auVar166._4_4_) * 0.25;
  auVar94._8_4_ = (auVar128._8_4_ + auVar164._8_4_ + auVar97._8_4_ + auVar166._8_4_) * 0.25;
  auVar94._12_4_ = (auVar128._12_4_ + auVar164._12_4_ + auVar97._12_4_ + auVar166._12_4_) * 0.25;
  auVar129 = vsubps_avx(auVar94,auVar96);
  auVar129 = vdpps_avx(auVar129,_local_970,0x7f);
  local_980 = vdpps_avx(_local_970,_local_970,0x7f);
  auVar92 = vrcpss_avx(local_980,local_980);
  fVar193 = auVar129._0_4_ * auVar92._0_4_ * (2.0 - local_980._0_4_ * auVar92._0_4_);
  auVar92 = vshufps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),0);
  auVar213._0_4_ = auVar96._0_4_ + local_970._0_4_ * auVar92._0_4_;
  auVar213._4_4_ = auVar96._4_4_ + local_970._4_4_ * auVar92._4_4_;
  auVar213._8_4_ = auVar96._8_4_ + local_970._8_4_ * auVar92._8_4_;
  auVar213._12_4_ = auVar96._12_4_ + local_970._12_4_ * auVar92._12_4_;
  auVar129 = vblendps_avx(auVar213,_DAT_01feba10,8);
  _local_a40 = vsubps_avx(auVar128,auVar129);
  _local_a50 = vsubps_avx(auVar97,auVar129);
  _local_a60 = vsubps_avx(auVar164,auVar129);
  _local_a70 = vsubps_avx(auVar166,auVar129);
  auVar128 = vshufps_avx(_local_a40,_local_a40,0);
  register0x00001250 = auVar128;
  _local_1a0 = auVar128;
  auVar128 = vshufps_avx(_local_a40,_local_a40,0x55);
  register0x00001250 = auVar128;
  _local_1c0 = auVar128;
  auVar128 = vshufps_avx(_local_a40,_local_a40,0xaa);
  register0x00001250 = auVar128;
  _local_1e0 = auVar128;
  auVar128 = vshufps_avx(_local_a40,_local_a40,0xff);
  register0x00001290 = auVar128;
  _local_360 = auVar128;
  auVar128 = vshufps_avx(_local_a60,_local_a60,0);
  register0x00001290 = auVar128;
  _local_200 = auVar128;
  auVar128 = vshufps_avx(_local_a60,_local_a60,0x55);
  register0x00001290 = auVar128;
  _local_220 = auVar128;
  auVar128 = vshufps_avx(_local_a60,_local_a60,0xaa);
  register0x00001290 = auVar128;
  _local_240 = auVar128;
  auVar128 = vshufps_avx(_local_a60,_local_a60,0xff);
  register0x00001290 = auVar128;
  _local_380 = auVar128;
  auVar128 = vshufps_avx(_local_a50,_local_a50,0);
  register0x00001290 = auVar128;
  _local_3a0 = auVar128;
  auVar128 = vshufps_avx(_local_a50,_local_a50,0x55);
  register0x00001290 = auVar128;
  _local_3c0 = auVar128;
  auVar128 = vshufps_avx(_local_a50,_local_a50,0xaa);
  register0x00001290 = auVar128;
  _local_3e0 = auVar128;
  auVar128 = vshufps_avx(_local_a50,_local_a50,0xff);
  register0x00001290 = auVar128;
  _local_400 = auVar128;
  auVar128 = vshufps_avx(_local_a70,_local_a70,0);
  register0x00001290 = auVar128;
  _local_420 = auVar128;
  auVar128 = vshufps_avx(_local_a70,_local_a70,0x55);
  register0x00001290 = auVar128;
  _local_440 = auVar128;
  auVar128 = vshufps_avx(_local_a70,_local_a70,0xaa);
  register0x00001290 = auVar128;
  _local_460 = auVar128;
  auVar128 = vshufps_avx(_local_a70,_local_a70,0xff);
  register0x00001290 = auVar128;
  _local_480 = auVar128;
  auVar128 = ZEXT416((uint)(fVar210 * fVar210 + fVar181 * fVar181 + fVar228 * fVar228));
  auVar128 = vshufps_avx(auVar128,auVar128,0);
  local_260._16_16_ = auVar128;
  local_260._0_16_ = auVar128;
  fVar210 = *(float *)(ray + k * 4 + 0x30);
  local_900 = ZEXT416((uint)fVar193);
  auVar128 = vshufps_avx(ZEXT416((uint)(fVar210 - fVar193)),ZEXT416((uint)(fVar210 - fVar193)),0);
  local_280._16_16_ = auVar128;
  local_280._0_16_ = auVar128;
  local_750 = vshufps_avx(ZEXT416(uVar83),ZEXT416(uVar83),0);
  local_760 = vshufps_avx(ZEXT416(uVar4),ZEXT416(uVar4),0);
  register0x00001390 = auVar92;
  _local_940 = auVar92;
  auVar250 = ZEXT3264(_local_940);
  uVar87 = 1;
  uVar84 = 0;
  auVar107._8_4_ = 0x7fffffff;
  auVar107._0_8_ = 0x7fffffff7fffffff;
  auVar107._12_4_ = 0x7fffffff;
  auVar107._16_4_ = 0x7fffffff;
  auVar107._20_4_ = 0x7fffffff;
  auVar107._24_4_ = 0x7fffffff;
  auVar107._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_260,auVar107);
  auVar128 = vsqrtss_avx(local_980,local_980);
  local_b04 = auVar128._0_4_;
  auVar128 = vsqrtss_avx(local_980,local_980);
  local_b08 = auVar128._0_4_;
  auVar286 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar227 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    local_a00 = auVar286._0_16_;
    auVar128 = vmovshdup_avx(local_a00);
    fVar238 = auVar128._0_4_ - auVar286._0_4_;
    auVar128 = vshufps_avx(local_a00,local_a00,0);
    local_7a0._16_16_ = auVar128;
    local_7a0._0_16_ = auVar128;
    auVar164 = vshufps_avx(ZEXT416((uint)fVar238),ZEXT416((uint)fVar238),0);
    local_7c0._16_16_ = auVar164;
    local_7c0._0_16_ = auVar164;
    fVar125 = auVar164._0_4_;
    fVar157 = auVar164._4_4_;
    fVar158 = auVar164._8_4_;
    fVar159 = auVar164._12_4_;
    fVar90 = auVar128._0_4_;
    auVar189._0_4_ = fVar90 + fVar125 * 0.0;
    fVar116 = auVar128._4_4_;
    auVar189._4_4_ = fVar116 + fVar157 * 0.14285715;
    fVar118 = auVar128._8_4_;
    auVar189._8_4_ = fVar118 + fVar158 * 0.2857143;
    fVar120 = auVar128._12_4_;
    auVar189._12_4_ = fVar120 + fVar159 * 0.42857146;
    auVar189._16_4_ = fVar90 + fVar125 * 0.5714286;
    auVar189._20_4_ = fVar116 + fVar157 * 0.71428573;
    auVar189._24_4_ = fVar118 + fVar158 * 0.8571429;
    auVar189._28_4_ = fVar120 + fVar159;
    auVar106 = vsubps_avx(auVar227._0_32_,auVar189);
    fVar181 = auVar106._0_4_;
    fVar228 = auVar106._4_4_;
    fVar193 = auVar106._8_4_;
    fVar229 = auVar106._12_4_;
    fVar194 = auVar106._16_4_;
    fVar231 = auVar106._20_4_;
    fVar195 = auVar106._24_4_;
    fVar256 = fVar181 * fVar181 * fVar181;
    fVar252 = fVar228 * fVar228 * fVar228;
    fVar257 = fVar193 * fVar193 * fVar193;
    fVar262 = fVar229 * fVar229 * fVar229;
    fVar266 = fVar194 * fVar194 * fVar194;
    fVar270 = fVar231 * fVar231 * fVar231;
    fVar274 = fVar195 * fVar195 * fVar195;
    fVar279 = auVar189._0_4_ * auVar189._0_4_ * auVar189._0_4_;
    fVar287 = auVar189._4_4_ * auVar189._4_4_ * auVar189._4_4_;
    fVar288 = auVar189._8_4_ * auVar189._8_4_ * auVar189._8_4_;
    fVar290 = auVar189._12_4_ * auVar189._12_4_ * auVar189._12_4_;
    fVar292 = auVar189._16_4_ * auVar189._16_4_ * auVar189._16_4_;
    fVar294 = auVar189._20_4_ * auVar189._20_4_ * auVar189._20_4_;
    fVar296 = auVar189._24_4_ * auVar189._24_4_ * auVar189._24_4_;
    fVar251 = auVar189._0_4_ * fVar181;
    fVar261 = auVar189._4_4_ * fVar228;
    fVar230 = auVar189._8_4_ * fVar193;
    fVar232 = auVar189._12_4_ * fVar229;
    fVar233 = auVar189._16_4_ * fVar194;
    fVar234 = auVar189._20_4_ * fVar231;
    fVar236 = auVar189._24_4_ * fVar195;
    fVar355 = auVar354._28_4_ + auVar370._28_4_;
    fVar337 = auVar286._28_4_ + auVar227._28_4_ + fVar355;
    fVar349 = fVar355 + auVar250._28_4_ + auVar359._28_4_ + auVar347._28_4_;
    fVar355 = fVar256 * 0.16666667;
    fVar253 = fVar252 * 0.16666667;
    fVar258 = fVar257 * 0.16666667;
    fVar263 = fVar262 * 0.16666667;
    fVar267 = fVar266 * 0.16666667;
    fVar271 = fVar270 * 0.16666667;
    fVar275 = fVar274 * 0.16666667;
    fVar298 = (fVar279 + fVar256 * 4.0 + fVar181 * fVar251 * 12.0 + auVar189._0_4_ * fVar251 * 6.0)
              * 0.16666667;
    fVar307 = (fVar287 + fVar252 * 4.0 + fVar228 * fVar261 * 12.0 + auVar189._4_4_ * fVar261 * 6.0)
              * 0.16666667;
    fVar312 = (fVar288 + fVar257 * 4.0 + fVar193 * fVar230 * 12.0 + auVar189._8_4_ * fVar230 * 6.0)
              * 0.16666667;
    fVar317 = (fVar290 + fVar262 * 4.0 + fVar229 * fVar232 * 12.0 + auVar189._12_4_ * fVar232 * 6.0)
              * 0.16666667;
    fVar322 = (fVar292 + fVar266 * 4.0 + fVar194 * fVar233 * 12.0 + auVar189._16_4_ * fVar233 * 6.0)
              * 0.16666667;
    fVar327 = (fVar294 + fVar270 * 4.0 + fVar231 * fVar234 * 12.0 + auVar189._20_4_ * fVar234 * 6.0)
              * 0.16666667;
    fVar332 = (fVar296 + fVar274 * 4.0 + fVar195 * fVar236 * 12.0 + auVar189._24_4_ * fVar236 * 6.0)
              * 0.16666667;
    fVar256 = (fVar279 * 4.0 + fVar256 + auVar189._0_4_ * fVar251 * 12.0 + fVar181 * fVar251 * 6.0)
              * 0.16666667;
    fVar252 = (fVar287 * 4.0 + fVar252 + auVar189._4_4_ * fVar261 * 12.0 + fVar228 * fVar261 * 6.0)
              * 0.16666667;
    fVar257 = (fVar288 * 4.0 + fVar257 + auVar189._8_4_ * fVar230 * 12.0 + fVar193 * fVar230 * 6.0)
              * 0.16666667;
    fVar262 = (fVar290 * 4.0 + fVar262 + auVar189._12_4_ * fVar232 * 12.0 + fVar229 * fVar232 * 6.0)
              * 0.16666667;
    fVar266 = (fVar292 * 4.0 + fVar266 + auVar189._16_4_ * fVar233 * 12.0 + fVar194 * fVar233 * 6.0)
              * 0.16666667;
    fVar270 = (fVar294 * 4.0 + fVar270 + auVar189._20_4_ * fVar234 * 12.0 + fVar231 * fVar234 * 6.0)
              * 0.16666667;
    fVar274 = (fVar296 * 4.0 + fVar274 + auVar189._24_4_ * fVar236 * 12.0 + fVar195 * fVar236 * 6.0)
              * 0.16666667;
    fVar279 = fVar279 * 0.16666667;
    fVar287 = fVar287 * 0.16666667;
    fVar288 = fVar288 * 0.16666667;
    fVar290 = fVar290 * 0.16666667;
    fVar292 = fVar292 * 0.16666667;
    fVar294 = fVar294 * 0.16666667;
    fVar296 = fVar296 * 0.16666667;
    fVar366 = auVar359._28_4_ + 12.0;
    fVar350 = fVar349 + 12.166667;
    fVar299 = (float)local_1a0._0_4_ * fVar355 +
              (float)local_200._0_4_ * fVar298 +
              fVar279 * (float)local_420._0_4_ + fVar256 * (float)local_3a0._0_4_;
    fVar308 = (float)local_1a0._4_4_ * fVar253 +
              (float)local_200._4_4_ * fVar307 +
              fVar287 * (float)local_420._4_4_ + fVar252 * (float)local_3a0._4_4_;
    fVar313 = fStack_198 * fVar258 +
              fStack_1f8 * fVar312 + fVar288 * fStack_418 + fVar257 * fStack_398;
    fVar318 = fStack_194 * fVar263 +
              fStack_1f4 * fVar317 + fVar290 * fStack_414 + fVar262 * fStack_394;
    fVar323 = fStack_190 * fVar267 +
              fStack_1f0 * fVar322 + fVar292 * fStack_410 + fVar266 * fStack_390;
    fVar328 = fStack_18c * fVar271 +
              fStack_1ec * fVar327 + fVar294 * fStack_40c + fVar270 * fStack_38c;
    fVar333 = fStack_188 * fVar275 +
              fStack_1e8 * fVar332 + fVar296 * fStack_408 + fVar274 * fStack_388;
    fVar338 = fVar337 + fVar350;
    fVar300 = (float)local_1c0._0_4_ * fVar355 +
              (float)local_220._0_4_ * fVar298 +
              fVar279 * (float)local_440._0_4_ + fVar256 * (float)local_3c0._0_4_;
    fVar309 = (float)local_1c0._4_4_ * fVar253 +
              (float)local_220._4_4_ * fVar307 +
              fVar287 * (float)local_440._4_4_ + fVar252 * (float)local_3c0._4_4_;
    fVar314 = fStack_1b8 * fVar258 +
              fStack_218 * fVar312 + fVar288 * fStack_438 + fVar257 * fStack_3b8;
    fVar319 = fStack_1b4 * fVar263 +
              fStack_214 * fVar317 + fVar290 * fStack_434 + fVar262 * fStack_3b4;
    fVar324 = fStack_1b0 * fVar267 +
              fStack_210 * fVar322 + fVar292 * fStack_430 + fVar266 * fStack_3b0;
    fVar329 = fStack_1ac * fVar271 +
              fStack_20c * fVar327 + fVar294 * fStack_42c + fVar270 * fStack_3ac;
    fVar334 = fStack_1a8 * fVar275 +
              fStack_208 * fVar332 + fVar296 * fStack_428 + fVar274 * fStack_3a8;
    fVar339 = fVar338 + fVar366 + 12.166667;
    fVar301 = (float)local_1e0._0_4_ * fVar355 +
              fVar298 * (float)local_240._0_4_ +
              fVar279 * (float)local_460._0_4_ + fVar256 * (float)local_3e0._0_4_;
    fVar310 = (float)local_1e0._4_4_ * fVar253 +
              fVar307 * (float)local_240._4_4_ +
              fVar287 * (float)local_460._4_4_ + fVar252 * (float)local_3e0._4_4_;
    fVar315 = fStack_1d8 * fVar258 +
              fVar312 * fStack_238 + fVar288 * fStack_458 + fVar257 * fStack_3d8;
    fVar320 = fStack_1d4 * fVar263 +
              fVar317 * fStack_234 + fVar290 * fStack_454 + fVar262 * fStack_3d4;
    fVar325 = fStack_1d0 * fVar267 +
              fVar322 * fStack_230 + fVar292 * fStack_450 + fVar266 * fStack_3d0;
    fVar330 = fStack_1cc * fVar271 +
              fVar327 * fStack_22c + fVar294 * fStack_44c + fVar270 * fStack_3cc;
    fVar335 = fStack_1c8 * fVar275 +
              fVar332 * fStack_228 + fVar296 * fStack_448 + fVar274 * fStack_3c8;
    fVar340 = fVar339 + fVar366 + auVar370._28_4_ + 12.0;
    local_7e0._0_4_ =
         fVar355 * (float)local_360._0_4_ +
         fVar298 * (float)local_380._0_4_ +
         fVar256 * (float)local_400._0_4_ + fVar279 * (float)local_480._0_4_;
    local_7e0._4_4_ =
         fVar253 * (float)local_360._4_4_ +
         fVar307 * (float)local_380._4_4_ +
         fVar252 * (float)local_400._4_4_ + fVar287 * (float)local_480._4_4_;
    local_7e0._8_4_ =
         fVar258 * fStack_358 + fVar312 * fStack_378 + fVar257 * fStack_3f8 + fVar288 * fStack_478;
    local_7e0._12_4_ =
         fVar263 * fStack_354 + fVar317 * fStack_374 + fVar262 * fStack_3f4 + fVar290 * fStack_474;
    local_7e0._16_4_ =
         fVar267 * fStack_350 + fVar322 * fStack_370 + fVar266 * fStack_3f0 + fVar292 * fStack_470;
    local_7e0._20_4_ =
         fVar271 * fStack_34c + fVar327 * fStack_36c + fVar270 * fStack_3ec + fVar294 * fStack_46c;
    local_7e0._24_4_ =
         fVar275 * fStack_348 + fVar332 * fStack_368 + fVar274 * fStack_3e8 + fVar296 * fStack_468;
    local_7e0._28_4_ = auVar250._28_4_ + fVar337 + fVar349 + auVar286._28_4_;
    auVar141._4_4_ = auVar189._4_4_ * -auVar189._4_4_;
    auVar141._0_4_ = auVar189._0_4_ * -auVar189._0_4_;
    auVar141._8_4_ = auVar189._8_4_ * -auVar189._8_4_;
    auVar141._12_4_ = auVar189._12_4_ * -auVar189._12_4_;
    auVar141._16_4_ = auVar189._16_4_ * -auVar189._16_4_;
    auVar141._20_4_ = auVar189._20_4_ * -auVar189._20_4_;
    auVar141._24_4_ = auVar189._24_4_ * -auVar189._24_4_;
    auVar141._28_4_ = auVar189._28_4_;
    auVar16._4_4_ = fVar261 * 4.0;
    auVar16._0_4_ = fVar251 * 4.0;
    auVar16._8_4_ = fVar230 * 4.0;
    auVar16._12_4_ = fVar232 * 4.0;
    auVar16._16_4_ = fVar233 * 4.0;
    auVar16._20_4_ = fVar234 * 4.0;
    auVar16._24_4_ = fVar236 * 4.0;
    auVar16._28_4_ = auVar227._28_4_;
    auVar106 = vsubps_avx(auVar141,auVar16);
    fVar263 = fVar181 * -fVar181 * 0.5;
    fVar267 = fVar228 * -fVar228 * 0.5;
    fVar275 = fVar193 * -fVar193 * 0.5;
    fVar279 = fVar229 * -fVar229 * 0.5;
    fVar287 = fVar194 * -fVar194 * 0.5;
    fVar288 = fVar231 * -fVar231 * 0.5;
    fVar290 = fVar195 * -fVar195 * 0.5;
    fVar355 = auVar106._0_4_ * 0.5;
    fVar257 = auVar106._4_4_ * 0.5;
    fVar258 = auVar106._8_4_ * 0.5;
    fVar262 = auVar106._12_4_ * 0.5;
    fVar270 = auVar106._16_4_ * 0.5;
    fVar271 = auVar106._20_4_ * 0.5;
    fVar274 = auVar106._24_4_ * 0.5;
    fVar256 = (fVar181 * fVar181 + fVar251 * 4.0) * 0.5;
    fVar261 = (fVar228 * fVar228 + fVar261 * 4.0) * 0.5;
    fVar230 = (fVar193 * fVar193 + fVar230 * 4.0) * 0.5;
    fVar232 = (fVar229 * fVar229 + fVar232 * 4.0) * 0.5;
    fVar233 = (fVar194 * fVar194 + fVar233 * 4.0) * 0.5;
    fVar252 = (fVar231 * fVar231 + fVar234 * 4.0) * 0.5;
    fVar253 = (fVar195 * fVar195 + fVar236 * 4.0) * 0.5;
    fVar181 = auVar189._0_4_ * auVar189._0_4_ * 0.5;
    fVar228 = auVar189._4_4_ * auVar189._4_4_ * 0.5;
    fVar193 = auVar189._8_4_ * auVar189._8_4_ * 0.5;
    fVar229 = auVar189._12_4_ * auVar189._12_4_ * 0.5;
    fVar194 = auVar189._16_4_ * auVar189._16_4_ * 0.5;
    fVar231 = auVar189._20_4_ * auVar189._20_4_ * 0.5;
    fVar251 = auVar189._24_4_ * auVar189._24_4_ * 0.5;
    fVar278 = fVar340 + fVar350 + fVar350 + 4.0;
    auVar128 = vpermilps_avx(ZEXT416((uint)(fVar238 * 0.04761905)),0);
    fVar195 = auVar128._0_4_;
    fVar239 = fVar195 * ((float)local_1a0._0_4_ * fVar263 +
                        (float)local_200._0_4_ * fVar355 +
                        fVar256 * (float)local_3a0._0_4_ + fVar181 * (float)local_420._0_4_);
    fVar234 = auVar128._4_4_;
    fVar254 = fVar234 * ((float)local_1a0._4_4_ * fVar267 +
                        (float)local_200._4_4_ * fVar257 +
                        fVar261 * (float)local_3a0._4_4_ + fVar228 * (float)local_420._4_4_);
    local_960._4_4_ = fVar254;
    local_960._0_4_ = fVar239;
    fVar236 = auVar128._8_4_;
    fVar259 = fVar236 * (fStack_198 * fVar275 +
                        fStack_1f8 * fVar258 + fVar230 * fStack_398 + fVar193 * fStack_418);
    local_960._8_4_ = fVar259;
    fVar266 = auVar128._12_4_;
    fVar264 = fVar266 * (fStack_194 * fVar279 +
                        fStack_1f4 * fVar262 + fVar232 * fStack_394 + fVar229 * fStack_414);
    local_960._12_4_ = fVar264;
    fVar268 = fVar195 * (fStack_190 * fVar287 +
                        fStack_1f0 * fVar270 + fVar233 * fStack_390 + fVar194 * fStack_410);
    local_960._16_4_ = fVar268;
    fVar272 = fVar234 * (fStack_18c * fVar288 +
                        fStack_1ec * fVar271 + fVar252 * fStack_38c + fVar231 * fStack_40c);
    local_960._20_4_ = fVar272;
    fVar276 = fVar236 * (fStack_188 * fVar290 +
                        fStack_1e8 * fVar274 + fVar253 * fStack_388 + fVar251 * fStack_408);
    local_960._24_4_ = fVar276;
    local_960._28_4_ = fVar278;
    fVar367 = fVar195 * ((float)local_1c0._0_4_ * fVar263 +
                        (float)local_220._0_4_ * fVar355 +
                        fVar256 * (float)local_3c0._0_4_ + fVar181 * (float)local_440._0_4_);
    fVar371 = fVar234 * ((float)local_1c0._4_4_ * fVar267 +
                        (float)local_220._4_4_ * fVar257 +
                        fVar261 * (float)local_3c0._4_4_ + fVar228 * (float)local_440._4_4_);
    auVar20._4_4_ = fVar371;
    auVar20._0_4_ = fVar367;
    fVar372 = fVar236 * (fStack_1b8 * fVar275 +
                        fStack_218 * fVar258 + fVar230 * fStack_3b8 + fVar193 * fStack_438);
    auVar20._8_4_ = fVar372;
    fVar373 = fVar266 * (fStack_1b4 * fVar279 +
                        fStack_214 * fVar262 + fVar232 * fStack_3b4 + fVar229 * fStack_434);
    auVar20._12_4_ = fVar373;
    fVar374 = fVar195 * (fStack_1b0 * fVar287 +
                        fStack_210 * fVar270 + fVar233 * fStack_3b0 + fVar194 * fStack_430);
    auVar20._16_4_ = fVar374;
    fVar375 = fVar234 * (fStack_1ac * fVar288 +
                        fStack_20c * fVar271 + fVar252 * fStack_3ac + fVar231 * fStack_42c);
    auVar20._20_4_ = fVar375;
    fVar376 = fVar236 * (fStack_1a8 * fVar290 +
                        fStack_208 * fVar274 + fVar253 * fStack_3a8 + fVar251 * fStack_428);
    auVar20._24_4_ = fVar376;
    auVar20._28_4_ = uStack_184;
    fVar377 = fVar195 * ((float)local_1e0._0_4_ * fVar263 +
                        fVar181 * (float)local_460._0_4_ + fVar256 * (float)local_3e0._0_4_ +
                        (float)local_240._0_4_ * fVar355);
    fVar385 = fVar234 * ((float)local_1e0._4_4_ * fVar267 +
                        fVar228 * (float)local_460._4_4_ + fVar261 * (float)local_3e0._4_4_ +
                        (float)local_240._4_4_ * fVar257);
    auVar21._4_4_ = fVar385;
    auVar21._0_4_ = fVar377;
    fVar388 = fVar236 * (fStack_1d8 * fVar275 +
                        fVar193 * fStack_458 + fVar230 * fStack_3d8 + fStack_238 * fVar258);
    auVar21._8_4_ = fVar388;
    fVar390 = fVar266 * (fStack_1d4 * fVar279 +
                        fVar229 * fStack_454 + fVar232 * fStack_3d4 + fStack_234 * fVar262);
    auVar21._12_4_ = fVar390;
    fVar392 = fVar195 * (fStack_1d0 * fVar287 +
                        fVar194 * fStack_450 + fVar233 * fStack_3d0 + fStack_230 * fVar270);
    auVar21._16_4_ = fVar392;
    fVar394 = fVar234 * (fStack_1cc * fVar288 +
                        fVar231 * fStack_44c + fVar252 * fStack_3cc + fStack_22c * fVar271);
    auVar21._20_4_ = fVar394;
    fVar396 = fVar236 * (fStack_1c8 * fVar290 +
                        fVar251 * fStack_448 + fVar253 * fStack_3c8 + fStack_228 * fVar274);
    auVar21._24_4_ = fVar396;
    auVar21._28_4_ = uStack_1a4;
    fVar238 = fVar195 * (fVar263 * (float)local_360._0_4_ +
                        fVar355 * (float)local_380._0_4_ +
                        fVar181 * (float)local_480._0_4_ + fVar256 * (float)local_400._0_4_);
    fVar355 = fVar234 * (fVar267 * (float)local_360._4_4_ +
                        fVar257 * (float)local_380._4_4_ +
                        fVar228 * (float)local_480._4_4_ + fVar261 * (float)local_400._4_4_);
    auVar144._4_4_ = fVar355;
    auVar144._0_4_ = fVar238;
    fVar263 = fVar236 * (fVar275 * fStack_358 +
                        fVar258 * fStack_378 + fVar193 * fStack_478 + fVar230 * fStack_3f8);
    auVar144._8_4_ = fVar263;
    fVar267 = fVar266 * (fVar279 * fStack_354 +
                        fVar262 * fStack_374 + fVar229 * fStack_474 + fVar232 * fStack_3f4);
    auVar144._12_4_ = fVar267;
    fVar195 = fVar195 * (fVar287 * fStack_350 +
                        fVar270 * fStack_370 + fVar194 * fStack_470 + fVar233 * fStack_3f0);
    auVar144._16_4_ = fVar195;
    fVar234 = fVar234 * (fVar288 * fStack_34c +
                        fVar271 * fStack_36c + fVar231 * fStack_46c + fVar252 * fStack_3ec);
    auVar144._20_4_ = fVar234;
    fVar236 = fVar236 * (fVar290 * fStack_348 +
                        fVar274 * fStack_368 + fVar251 * fStack_468 + fVar253 * fStack_3e8);
    auVar144._24_4_ = fVar236;
    auVar144._28_4_ = fVar266;
    auVar72._4_4_ = fVar309;
    auVar72._0_4_ = fVar300;
    auVar72._8_4_ = fVar314;
    auVar72._12_4_ = fVar319;
    auVar72._16_4_ = fVar324;
    auVar72._20_4_ = fVar329;
    auVar72._24_4_ = fVar334;
    auVar72._28_4_ = fVar339;
    auVar106 = vperm2f128_avx(auVar72,auVar72,1);
    auVar106 = vshufps_avx(auVar106,auVar72,0x30);
    _local_9e0 = vshufps_avx(auVar72,auVar106,0x29);
    auVar74._4_4_ = fVar310;
    auVar74._0_4_ = fVar301;
    auVar74._8_4_ = fVar315;
    auVar74._12_4_ = fVar320;
    auVar74._16_4_ = fVar325;
    auVar74._20_4_ = fVar330;
    auVar74._24_4_ = fVar335;
    auVar74._28_4_ = fVar340;
    auVar106 = vperm2f128_avx(auVar74,auVar74,1);
    auVar106 = vshufps_avx(auVar106,auVar74,0x30);
    local_b00 = vshufps_avx(auVar74,auVar106,0x29);
    auVar107 = vsubps_avx(local_7e0,auVar144);
    auVar106 = vperm2f128_avx(auVar107,auVar107,1);
    auVar106 = vshufps_avx(auVar106,auVar107,0x30);
    local_660 = vshufps_avx(auVar107,auVar106,0x29);
    local_5c0 = vsubps_avx(_local_9e0,auVar72);
    local_5a0 = vsubps_avx(local_b00,auVar74);
    fVar228 = local_5c0._0_4_;
    fVar256 = local_5c0._4_4_;
    auVar384._4_4_ = fVar385 * fVar256;
    auVar384._0_4_ = fVar377 * fVar228;
    fVar252 = local_5c0._8_4_;
    auVar384._8_4_ = fVar388 * fVar252;
    fVar270 = local_5c0._12_4_;
    auVar384._12_4_ = fVar390 * fVar270;
    fVar292 = local_5c0._16_4_;
    auVar384._16_4_ = fVar392 * fVar292;
    fVar327 = local_5c0._20_4_;
    auVar384._20_4_ = fVar394 * fVar327;
    fVar9 = local_5c0._24_4_;
    auVar384._24_4_ = fVar396 * fVar9;
    auVar384._28_4_ = auVar107._28_4_;
    fVar193 = local_5a0._0_4_;
    fVar261 = local_5a0._4_4_;
    auVar142._4_4_ = fVar371 * fVar261;
    auVar142._0_4_ = fVar367 * fVar193;
    fVar253 = local_5a0._8_4_;
    auVar142._8_4_ = fVar372 * fVar253;
    fVar271 = local_5a0._12_4_;
    auVar142._12_4_ = fVar373 * fVar271;
    fVar294 = local_5a0._16_4_;
    auVar142._16_4_ = fVar374 * fVar294;
    fVar332 = local_5a0._20_4_;
    auVar142._20_4_ = fVar375 * fVar332;
    fVar10 = local_5a0._24_4_;
    auVar142._24_4_ = fVar376 * fVar10;
    auVar142._28_4_ = auVar106._28_4_;
    auVar141 = vsubps_avx(auVar142,auVar384);
    auVar76._4_4_ = fVar308;
    auVar76._0_4_ = fVar299;
    auVar76._8_4_ = fVar313;
    auVar76._12_4_ = fVar318;
    auVar76._16_4_ = fVar323;
    auVar76._20_4_ = fVar328;
    auVar76._24_4_ = fVar333;
    auVar76._28_4_ = fVar338;
    auVar106 = vperm2f128_avx(auVar76,auVar76,1);
    auVar106 = vshufps_avx(auVar106,auVar76,0x30);
    local_ac0 = vshufps_avx(auVar76,auVar106,0x29);
    local_5e0 = vsubps_avx(local_ac0,auVar76);
    auVar17._4_4_ = fVar261 * fVar254;
    auVar17._0_4_ = fVar193 * fVar239;
    auVar17._8_4_ = fVar253 * fVar259;
    auVar17._12_4_ = fVar271 * fVar264;
    auVar17._16_4_ = fVar294 * fVar268;
    auVar17._20_4_ = fVar332 * fVar272;
    auVar17._24_4_ = fVar10 * fVar276;
    auVar17._28_4_ = auVar106._28_4_;
    fVar229 = local_5e0._0_4_;
    fVar230 = local_5e0._4_4_;
    auVar18._4_4_ = fVar385 * fVar230;
    auVar18._0_4_ = fVar377 * fVar229;
    fVar257 = local_5e0._8_4_;
    auVar18._8_4_ = fVar388 * fVar257;
    fVar274 = local_5e0._12_4_;
    auVar18._12_4_ = fVar390 * fVar274;
    fVar296 = local_5e0._16_4_;
    auVar18._16_4_ = fVar392 * fVar296;
    fVar337 = local_5e0._20_4_;
    auVar18._20_4_ = fVar394 * fVar337;
    fVar11 = local_5e0._24_4_;
    auVar18._24_4_ = fVar396 * fVar11;
    auVar18._28_4_ = local_b00._28_4_;
    auVar16 = vsubps_avx(auVar18,auVar17);
    auVar19._4_4_ = fVar371 * fVar230;
    auVar19._0_4_ = fVar367 * fVar229;
    auVar19._8_4_ = fVar372 * fVar257;
    auVar19._12_4_ = fVar373 * fVar274;
    auVar19._16_4_ = fVar374 * fVar296;
    auVar19._20_4_ = fVar375 * fVar337;
    auVar19._24_4_ = fVar376 * fVar11;
    auVar19._28_4_ = local_b00._28_4_;
    auVar346._4_4_ = fVar256 * fVar254;
    auVar346._0_4_ = fVar228 * fVar239;
    auVar346._8_4_ = fVar252 * fVar259;
    auVar346._12_4_ = fVar270 * fVar264;
    auVar346._16_4_ = fVar292 * fVar268;
    auVar346._20_4_ = fVar327 * fVar272;
    auVar346._24_4_ = fVar9 * fVar276;
    auVar346._28_4_ = uStack_1c4;
    auVar144 = vsubps_avx(auVar346,auVar19);
    fVar181 = auVar144._28_4_;
    auVar140._0_4_ = fVar229 * fVar229 + fVar228 * fVar228 + fVar193 * fVar193;
    auVar140._4_4_ = fVar230 * fVar230 + fVar256 * fVar256 + fVar261 * fVar261;
    auVar140._8_4_ = fVar257 * fVar257 + fVar252 * fVar252 + fVar253 * fVar253;
    auVar140._12_4_ = fVar274 * fVar274 + fVar270 * fVar270 + fVar271 * fVar271;
    auVar140._16_4_ = fVar296 * fVar296 + fVar292 * fVar292 + fVar294 * fVar294;
    auVar140._20_4_ = fVar337 * fVar337 + fVar327 * fVar327 + fVar332 * fVar332;
    auVar140._24_4_ = fVar11 * fVar11 + fVar9 * fVar9 + fVar10 * fVar10;
    auVar140._28_4_ = fVar181 + fVar181 + auVar141._28_4_;
    auVar106 = vrcpps_avx(auVar140);
    fVar287 = auVar106._0_4_;
    fVar288 = auVar106._4_4_;
    auVar22._4_4_ = fVar288 * auVar140._4_4_;
    auVar22._0_4_ = fVar287 * auVar140._0_4_;
    fVar290 = auVar106._8_4_;
    auVar22._8_4_ = fVar290 * auVar140._8_4_;
    fVar312 = auVar106._12_4_;
    auVar22._12_4_ = fVar312 * auVar140._12_4_;
    fVar317 = auVar106._16_4_;
    auVar22._16_4_ = fVar317 * auVar140._16_4_;
    fVar322 = auVar106._20_4_;
    auVar22._20_4_ = fVar322 * auVar140._20_4_;
    fVar366 = auVar106._24_4_;
    auVar22._24_4_ = fVar366 * auVar140._24_4_;
    auVar22._28_4_ = uStack_1c4;
    auVar174._8_4_ = 0x3f800000;
    auVar174._0_8_ = &DAT_3f8000003f800000;
    auVar174._12_4_ = 0x3f800000;
    auVar174._16_4_ = 0x3f800000;
    auVar174._20_4_ = 0x3f800000;
    auVar174._24_4_ = 0x3f800000;
    auVar174._28_4_ = 0x3f800000;
    auVar384 = vsubps_avx(auVar174,auVar22);
    fVar287 = auVar384._0_4_ * fVar287 + fVar287;
    fVar288 = auVar384._4_4_ * fVar288 + fVar288;
    fVar290 = auVar384._8_4_ * fVar290 + fVar290;
    fVar312 = auVar384._12_4_ * fVar312 + fVar312;
    fVar317 = auVar384._16_4_ * fVar317 + fVar317;
    fVar322 = auVar384._20_4_ * fVar322 + fVar322;
    fVar366 = auVar384._24_4_ * fVar366 + fVar366;
    auVar107 = vperm2f128_avx(auVar20,auVar20,1);
    auVar107 = vshufps_avx(auVar107,auVar20,0x30);
    local_ae0 = vshufps_avx(auVar20,auVar107,0x29);
    auVar107 = vperm2f128_avx(auVar21,auVar21,1);
    auVar107 = vshufps_avx(auVar107,auVar21,0x30);
    local_9c0 = vshufps_avx(auVar21,auVar107,0x29);
    fVar378 = local_9c0._0_4_;
    fVar386 = local_9c0._4_4_;
    auVar23._4_4_ = fVar386 * fVar256;
    auVar23._0_4_ = fVar378 * fVar228;
    fVar389 = local_9c0._8_4_;
    auVar23._8_4_ = fVar389 * fVar252;
    fVar391 = local_9c0._12_4_;
    auVar23._12_4_ = fVar391 * fVar270;
    fVar393 = local_9c0._16_4_;
    auVar23._16_4_ = fVar393 * fVar292;
    fVar395 = local_9c0._20_4_;
    auVar23._20_4_ = fVar395 * fVar327;
    fVar397 = local_9c0._24_4_;
    auVar23._24_4_ = fVar397 * fVar9;
    auVar23._28_4_ = auVar107._28_4_;
    fVar194 = local_ae0._0_4_;
    fVar232 = local_ae0._4_4_;
    auVar24._4_4_ = fVar261 * fVar232;
    auVar24._0_4_ = fVar193 * fVar194;
    fVar258 = local_ae0._8_4_;
    auVar24._8_4_ = fVar253 * fVar258;
    fVar275 = local_ae0._12_4_;
    auVar24._12_4_ = fVar271 * fVar275;
    fVar298 = local_ae0._16_4_;
    auVar24._16_4_ = fVar294 * fVar298;
    fVar349 = local_ae0._20_4_;
    auVar24._20_4_ = fVar332 * fVar349;
    fVar12 = local_ae0._24_4_;
    auVar24._24_4_ = fVar10 * fVar12;
    auVar24._28_4_ = uStack_184;
    auVar142 = vsubps_avx(auVar24,auVar23);
    auVar107 = vperm2f128_avx(local_960,local_960,1);
    auVar107 = vshufps_avx(auVar107,local_960,0x30);
    local_9a0 = vshufps_avx(local_960,auVar107,0x29);
    fVar231 = local_9a0._0_4_;
    fVar233 = local_9a0._4_4_;
    auVar25._4_4_ = fVar261 * fVar233;
    auVar25._0_4_ = fVar193 * fVar231;
    fVar262 = local_9a0._8_4_;
    auVar25._8_4_ = fVar253 * fVar262;
    fVar279 = local_9a0._12_4_;
    auVar25._12_4_ = fVar271 * fVar279;
    fVar307 = local_9a0._16_4_;
    auVar25._16_4_ = fVar294 * fVar307;
    fVar350 = local_9a0._20_4_;
    auVar25._20_4_ = fVar332 * fVar350;
    fVar13 = local_9a0._24_4_;
    auVar25._24_4_ = fVar10 * fVar13;
    auVar25._28_4_ = auVar107._28_4_;
    auVar26._4_4_ = fVar386 * fVar230;
    auVar26._0_4_ = fVar378 * fVar229;
    auVar26._8_4_ = fVar389 * fVar257;
    auVar26._12_4_ = fVar391 * fVar274;
    auVar26._16_4_ = fVar393 * fVar296;
    auVar26._20_4_ = fVar395 * fVar337;
    uVar4 = local_9c0._28_4_;
    auVar26._24_4_ = fVar397 * fVar11;
    auVar26._28_4_ = uVar4;
    auVar17 = vsubps_avx(auVar26,auVar25);
    auVar27._4_4_ = fVar230 * fVar232;
    auVar27._0_4_ = fVar229 * fVar194;
    auVar27._8_4_ = fVar257 * fVar258;
    auVar27._12_4_ = fVar274 * fVar275;
    auVar27._16_4_ = fVar296 * fVar298;
    auVar27._20_4_ = fVar337 * fVar349;
    auVar27._24_4_ = fVar11 * fVar12;
    auVar27._28_4_ = uVar4;
    auVar28._4_4_ = fVar256 * fVar233;
    auVar28._0_4_ = fVar228 * fVar231;
    auVar28._8_4_ = fVar252 * fVar262;
    auVar28._12_4_ = fVar270 * fVar279;
    auVar28._16_4_ = fVar292 * fVar307;
    auVar28._20_4_ = fVar327 * fVar350;
    auVar28._24_4_ = fVar9 * fVar13;
    auVar28._28_4_ = fStack_1e4;
    auVar107 = vsubps_avx(auVar28,auVar27);
    fVar251 = auVar107._28_4_;
    auVar29._4_4_ =
         (auVar141._4_4_ * auVar141._4_4_ +
         auVar16._4_4_ * auVar16._4_4_ + auVar144._4_4_ * auVar144._4_4_) * fVar288;
    auVar29._0_4_ =
         (auVar141._0_4_ * auVar141._0_4_ +
         auVar16._0_4_ * auVar16._0_4_ + auVar144._0_4_ * auVar144._0_4_) * fVar287;
    auVar29._8_4_ =
         (auVar141._8_4_ * auVar141._8_4_ +
         auVar16._8_4_ * auVar16._8_4_ + auVar144._8_4_ * auVar144._8_4_) * fVar290;
    auVar29._12_4_ =
         (auVar141._12_4_ * auVar141._12_4_ +
         auVar16._12_4_ * auVar16._12_4_ + auVar144._12_4_ * auVar144._12_4_) * fVar312;
    auVar29._16_4_ =
         (auVar141._16_4_ * auVar141._16_4_ +
         auVar16._16_4_ * auVar16._16_4_ + auVar144._16_4_ * auVar144._16_4_) * fVar317;
    auVar29._20_4_ =
         (auVar141._20_4_ * auVar141._20_4_ +
         auVar16._20_4_ * auVar16._20_4_ + auVar144._20_4_ * auVar144._20_4_) * fVar322;
    auVar29._24_4_ =
         (auVar141._24_4_ * auVar141._24_4_ +
         auVar16._24_4_ * auVar16._24_4_ + auVar144._24_4_ * auVar144._24_4_) * fVar366;
    auVar29._28_4_ = auVar141._28_4_ + auVar16._28_4_ + fVar181;
    auVar30._4_4_ =
         (auVar142._4_4_ * auVar142._4_4_ +
         auVar17._4_4_ * auVar17._4_4_ + auVar107._4_4_ * auVar107._4_4_) * fVar288;
    auVar30._0_4_ =
         (auVar142._0_4_ * auVar142._0_4_ +
         auVar17._0_4_ * auVar17._0_4_ + auVar107._0_4_ * auVar107._0_4_) * fVar287;
    auVar30._8_4_ =
         (auVar142._8_4_ * auVar142._8_4_ +
         auVar17._8_4_ * auVar17._8_4_ + auVar107._8_4_ * auVar107._8_4_) * fVar290;
    auVar30._12_4_ =
         (auVar142._12_4_ * auVar142._12_4_ +
         auVar17._12_4_ * auVar17._12_4_ + auVar107._12_4_ * auVar107._12_4_) * fVar312;
    auVar30._16_4_ =
         (auVar142._16_4_ * auVar142._16_4_ +
         auVar17._16_4_ * auVar17._16_4_ + auVar107._16_4_ * auVar107._16_4_) * fVar317;
    auVar30._20_4_ =
         (auVar142._20_4_ * auVar142._20_4_ +
         auVar17._20_4_ * auVar17._20_4_ + auVar107._20_4_ * auVar107._20_4_) * fVar322;
    auVar30._24_4_ =
         (auVar142._24_4_ * auVar142._24_4_ +
         auVar17._24_4_ * auVar17._24_4_ + auVar107._24_4_ * auVar107._24_4_) * fVar366;
    auVar30._28_4_ = auVar384._28_4_ + auVar106._28_4_;
    auVar106 = vmaxps_avx(auVar29,auVar30);
    auVar107 = vperm2f128_avx(local_7e0,local_7e0,1);
    auVar107 = vshufps_avx(auVar107,local_7e0,0x30);
    auVar16 = vshufps_avx(local_7e0,auVar107,0x29);
    auVar108._0_4_ = (float)local_7e0._0_4_ + fVar238;
    auVar108._4_4_ = local_7e0._4_4_ + fVar355;
    auVar108._8_4_ = local_7e0._8_4_ + fVar263;
    auVar108._12_4_ = local_7e0._12_4_ + fVar267;
    auVar108._16_4_ = local_7e0._16_4_ + fVar195;
    auVar108._20_4_ = local_7e0._20_4_ + fVar234;
    auVar108._24_4_ = local_7e0._24_4_ + fVar236;
    auVar108._28_4_ = local_7e0._28_4_ + fVar266;
    auVar107 = vmaxps_avx(local_7e0,auVar108);
    auVar141 = vmaxps_avx(local_660,auVar16);
    auVar107 = vmaxps_avx(auVar107,auVar141);
    auVar141 = vrsqrtps_avx(auVar140);
    fVar181 = auVar141._0_4_;
    fVar195 = auVar141._4_4_;
    fVar238 = auVar141._8_4_;
    fVar234 = auVar141._12_4_;
    fVar355 = auVar141._16_4_;
    fVar236 = auVar141._20_4_;
    fVar263 = auVar141._24_4_;
    auVar31._4_4_ = fVar195 * fVar195 * fVar195 * auVar140._4_4_ * 0.5;
    auVar31._0_4_ = fVar181 * fVar181 * fVar181 * auVar140._0_4_ * 0.5;
    auVar31._8_4_ = fVar238 * fVar238 * fVar238 * auVar140._8_4_ * 0.5;
    auVar31._12_4_ = fVar234 * fVar234 * fVar234 * auVar140._12_4_ * 0.5;
    auVar31._16_4_ = fVar355 * fVar355 * fVar355 * auVar140._16_4_ * 0.5;
    auVar31._20_4_ = fVar236 * fVar236 * fVar236 * auVar140._20_4_ * 0.5;
    auVar31._24_4_ = fVar263 * fVar263 * fVar263 * auVar140._24_4_ * 0.5;
    auVar31._28_4_ = auVar140._28_4_;
    auVar32._4_4_ = fVar195 * 1.5;
    auVar32._0_4_ = fVar181 * 1.5;
    auVar32._8_4_ = fVar238 * 1.5;
    auVar32._12_4_ = fVar234 * 1.5;
    auVar32._16_4_ = fVar355 * 1.5;
    auVar32._20_4_ = fVar236 * 1.5;
    auVar32._24_4_ = fVar263 * 1.5;
    auVar32._28_4_ = auVar141._28_4_;
    local_2a0 = vsubps_avx(auVar32,auVar31);
    auVar73._4_4_ = fVar309;
    auVar73._0_4_ = fVar300;
    auVar73._8_4_ = fVar314;
    auVar73._12_4_ = fVar319;
    auVar73._16_4_ = fVar324;
    auVar73._20_4_ = fVar329;
    auVar73._24_4_ = fVar334;
    auVar73._28_4_ = fVar339;
    auVar141 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_780 = vsubps_avx(auVar141,auVar73);
    auVar75._4_4_ = fVar310;
    auVar75._0_4_ = fVar301;
    auVar75._8_4_ = fVar315;
    auVar75._12_4_ = fVar320;
    auVar75._16_4_ = fVar325;
    auVar75._20_4_ = fVar330;
    auVar75._24_4_ = fVar335;
    auVar75._28_4_ = fVar340;
    auVar141 = vsubps_avx(auVar141,auVar75);
    fVar195 = auVar141._0_4_;
    fVar234 = auVar141._4_4_;
    fVar263 = auVar141._8_4_;
    fVar287 = auVar141._12_4_;
    fVar312 = auVar141._16_4_;
    fVar366 = auVar141._20_4_;
    fVar14 = auVar141._24_4_;
    fVar238 = local_780._0_4_;
    fVar355 = local_780._4_4_;
    fVar266 = local_780._8_4_;
    fVar288 = local_780._12_4_;
    fVar317 = local_780._16_4_;
    fVar8 = local_780._20_4_;
    fVar15 = local_780._24_4_;
    auVar142 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar144 = vsubps_avx(auVar142,auVar76);
    auVar359 = ZEXT3264(auVar144);
    fVar356 = auVar144._0_4_;
    fVar360 = auVar144._4_4_;
    fVar361 = auVar144._8_4_;
    fVar362 = auVar144._12_4_;
    fVar363 = auVar144._16_4_;
    fVar364 = auVar144._20_4_;
    fVar365 = auVar144._24_4_;
    auVar369._0_4_ =
         fVar356 * (float)local_800._0_4_ +
         (float)local_820._0_4_ * fVar238 + (float)local_840._0_4_ * fVar195;
    auVar369._4_4_ =
         fVar360 * (float)local_800._4_4_ +
         (float)local_820._4_4_ * fVar355 + (float)local_840._4_4_ * fVar234;
    auVar369._8_4_ = fVar361 * fStack_7f8 + fStack_818 * fVar266 + fStack_838 * fVar263;
    auVar369._12_4_ = fVar362 * fStack_7f4 + fStack_814 * fVar288 + fStack_834 * fVar287;
    auVar369._16_4_ = fVar363 * fStack_7f0 + fStack_810 * fVar317 + fStack_830 * fVar312;
    auVar369._20_4_ = fVar364 * fStack_7ec + fStack_80c * fVar8 + fStack_82c * fVar366;
    auVar369._24_4_ = fVar365 * fStack_7e8 + fStack_808 * fVar15 + fStack_828 * fVar14;
    auVar369._28_4_ = fVar251 + fVar251 + auVar17._28_4_ + fVar251;
    auVar381._0_4_ = fVar356 * fVar356 + fVar238 * fVar238 + fVar195 * fVar195;
    auVar381._4_4_ = fVar360 * fVar360 + fVar355 * fVar355 + fVar234 * fVar234;
    auVar381._8_4_ = fVar361 * fVar361 + fVar266 * fVar266 + fVar263 * fVar263;
    auVar381._12_4_ = fVar362 * fVar362 + fVar288 * fVar288 + fVar287 * fVar287;
    auVar381._16_4_ = fVar363 * fVar363 + fVar317 * fVar317 + fVar312 * fVar312;
    auVar381._20_4_ = fVar364 * fVar364 + fVar8 * fVar8 + fVar366 * fVar366;
    auVar381._24_4_ = fVar365 * fVar365 + fVar15 * fVar15 + fVar14 * fVar14;
    auVar381._28_4_ = fStack_1e4 + fStack_1e4 + fVar251;
    fVar251 = local_2a0._0_4_;
    fVar236 = local_2a0._4_4_;
    fVar267 = local_2a0._8_4_;
    fVar290 = local_2a0._12_4_;
    fVar322 = local_2a0._16_4_;
    fVar235 = local_2a0._20_4_;
    fVar237 = local_2a0._24_4_;
    fVar302 = (float)local_800._0_4_ * fVar229 * fVar251 +
              fVar228 * fVar251 * (float)local_820._0_4_ +
              fVar193 * fVar251 * (float)local_840._0_4_;
    fVar311 = (float)local_800._4_4_ * fVar230 * fVar236 +
              fVar256 * fVar236 * (float)local_820._4_4_ +
              fVar261 * fVar236 * (float)local_840._4_4_;
    fVar316 = fStack_7f8 * fVar257 * fVar267 +
              fVar252 * fVar267 * fStack_818 + fVar253 * fVar267 * fStack_838;
    fVar321 = fStack_7f4 * fVar274 * fVar290 +
              fVar270 * fVar290 * fStack_814 + fVar271 * fVar290 * fStack_834;
    fVar326 = fStack_7f0 * fVar296 * fVar322 +
              fVar292 * fVar322 * fStack_810 + fVar294 * fVar322 * fStack_830;
    fVar331 = fStack_7ec * fVar337 * fVar235 +
              fVar327 * fVar235 * fStack_80c + fVar332 * fVar235 * fStack_82c;
    fVar336 = fStack_7e8 * fVar11 * fVar237 +
              fVar9 * fVar237 * fStack_808 + fVar10 * fVar237 * fStack_828;
    fVar341 = fStack_7e4 + fStack_804 + fStack_824;
    fVar181 = fStack_7e4 + fStack_804 + fStack_824;
    local_500._0_4_ =
         fVar356 * fVar229 * fVar251 + fVar228 * fVar251 * fVar238 + fVar193 * fVar251 * fVar195;
    local_500._4_4_ =
         fVar360 * fVar230 * fVar236 + fVar256 * fVar236 * fVar355 + fVar261 * fVar236 * fVar234;
    local_500._8_4_ =
         fVar361 * fVar257 * fVar267 + fVar252 * fVar267 * fVar266 + fVar253 * fVar267 * fVar263;
    local_500._12_4_ =
         fVar362 * fVar274 * fVar290 + fVar270 * fVar290 * fVar288 + fVar271 * fVar290 * fVar287;
    local_500._16_4_ =
         fVar363 * fVar296 * fVar322 + fVar292 * fVar322 * fVar317 + fVar294 * fVar322 * fVar312;
    local_500._20_4_ =
         fVar364 * fVar337 * fVar235 + fVar327 * fVar235 * fVar8 + fVar332 * fVar235 * fVar366;
    local_500._24_4_ =
         fVar365 * fVar11 * fVar237 + fVar9 * fVar237 * fVar15 + fVar10 * fVar237 * fVar14;
    local_500._28_4_ = fStack_804 + fVar181;
    auVar354 = ZEXT3264(local_500);
    auVar33._4_4_ = fVar311 * local_500._4_4_;
    auVar33._0_4_ = fVar302 * local_500._0_4_;
    auVar33._8_4_ = fVar316 * local_500._8_4_;
    auVar33._12_4_ = fVar321 * local_500._12_4_;
    auVar33._16_4_ = fVar326 * local_500._16_4_;
    auVar33._20_4_ = fVar331 * local_500._20_4_;
    auVar33._24_4_ = fVar336 * local_500._24_4_;
    auVar33._28_4_ = fVar181;
    auVar144 = vsubps_avx(auVar369,auVar33);
    auVar34._4_4_ = local_500._4_4_ * local_500._4_4_;
    auVar34._0_4_ = local_500._0_4_ * local_500._0_4_;
    auVar34._8_4_ = local_500._8_4_ * local_500._8_4_;
    auVar34._12_4_ = local_500._12_4_ * local_500._12_4_;
    auVar34._16_4_ = local_500._16_4_ * local_500._16_4_;
    auVar34._20_4_ = local_500._20_4_ * local_500._20_4_;
    auVar34._24_4_ = local_500._24_4_ * local_500._24_4_;
    auVar34._28_4_ = fStack_804;
    auVar384 = vsubps_avx(auVar381,auVar34);
    local_580 = vsqrtps_avx(auVar106);
    local_b60._0_4_ = auVar107._0_4_;
    local_b60._4_4_ = auVar107._4_4_;
    fStack_b58 = auVar107._8_4_;
    fStack_b54 = auVar107._12_4_;
    fStack_b50 = auVar107._16_4_;
    fStack_b4c = auVar107._20_4_;
    fStack_b48 = auVar107._24_4_;
    fStack_b44 = auVar107._28_4_;
    fVar181 = (local_580._0_4_ + (float)local_b60._0_4_) * 1.0000002;
    fVar117 = (local_580._4_4_ + (float)local_b60._4_4_) * 1.0000002;
    fVar119 = (local_580._8_4_ + fStack_b58) * 1.0000002;
    fVar121 = (local_580._12_4_ + fStack_b54) * 1.0000002;
    fVar122 = (local_580._16_4_ + fStack_b50) * 1.0000002;
    fVar123 = (local_580._20_4_ + fStack_b4c) * 1.0000002;
    fVar124 = (local_580._24_4_ + fStack_b48) * 1.0000002;
    auVar35._4_4_ = fVar117 * fVar117;
    auVar35._0_4_ = fVar181 * fVar181;
    auVar35._8_4_ = fVar119 * fVar119;
    auVar35._12_4_ = fVar121 * fVar121;
    auVar35._16_4_ = fVar122 * fVar122;
    auVar35._20_4_ = fVar123 * fVar123;
    auVar35._24_4_ = fVar124 * fVar124;
    auVar35._28_4_ = local_580._28_4_ + fStack_b44;
    fVar379 = auVar144._0_4_ + auVar144._0_4_;
    fVar387 = auVar144._4_4_ + auVar144._4_4_;
    local_600._0_8_ = CONCAT44(fVar387,fVar379);
    local_600._8_4_ = auVar144._8_4_ + auVar144._8_4_;
    local_600._12_4_ = auVar144._12_4_ + auVar144._12_4_;
    local_600._16_4_ = auVar144._16_4_ + auVar144._16_4_;
    local_600._20_4_ = auVar144._20_4_ + auVar144._20_4_;
    local_600._24_4_ = auVar144._24_4_ + auVar144._24_4_;
    fVar181 = auVar144._28_4_;
    local_600._28_4_ = fVar181 + fVar181;
    auVar144 = vsubps_avx(auVar384,auVar35);
    local_2c0._4_4_ = fVar311 * fVar311;
    local_2c0._0_4_ = fVar302 * fVar302;
    local_2c0._8_4_ = fVar316 * fVar316;
    local_2c0._12_4_ = fVar321 * fVar321;
    local_2c0._16_4_ = fVar326 * fVar326;
    local_2c0._20_4_ = fVar331 * fVar331;
    local_2c0._24_4_ = fVar336 * fVar336;
    local_2c0._28_4_ = local_5e0._28_4_;
    local_6a0 = vsubps_avx(local_260,local_2c0);
    auVar347 = ZEXT3264(local_6a0);
    auVar36._4_4_ = fVar387 * fVar387;
    auVar36._0_4_ = fVar379 * fVar379;
    auVar36._8_4_ = local_600._8_4_ * local_600._8_4_;
    auVar36._12_4_ = local_600._12_4_ * local_600._12_4_;
    auVar36._16_4_ = local_600._16_4_ * local_600._16_4_;
    auVar36._20_4_ = local_600._20_4_ * local_600._20_4_;
    auVar36._24_4_ = local_600._24_4_ * local_600._24_4_;
    auVar36._28_4_ = fVar181;
    fVar117 = local_6a0._0_4_;
    local_680._0_4_ = fVar117 * 4.0;
    fVar119 = local_6a0._4_4_;
    local_680._4_4_ = fVar119 * 4.0;
    fVar121 = local_6a0._8_4_;
    fStack_678 = fVar121 * 4.0;
    fVar122 = local_6a0._12_4_;
    fStack_674 = fVar122 * 4.0;
    fVar123 = local_6a0._16_4_;
    fStack_670 = fVar123 * 4.0;
    fVar124 = local_6a0._20_4_;
    fStack_66c = fVar124 * 4.0;
    fVar348 = local_6a0._24_4_;
    fStack_668 = fVar348 * 4.0;
    fStack_664 = 4.0;
    auVar37._4_4_ = (float)local_680._4_4_ * auVar144._4_4_;
    auVar37._0_4_ = (float)local_680._0_4_ * auVar144._0_4_;
    auVar37._8_4_ = fStack_678 * auVar144._8_4_;
    auVar37._12_4_ = fStack_674 * auVar144._12_4_;
    auVar37._16_4_ = fStack_670 * auVar144._16_4_;
    auVar37._20_4_ = fStack_66c * auVar144._20_4_;
    auVar37._24_4_ = fStack_668 * auVar144._24_4_;
    auVar37._28_4_ = 0x40800000;
    auVar107 = vsubps_avx(auVar36,auVar37);
    auVar106 = vcmpps_avx(auVar107,auVar142,5);
    fVar181 = local_6a0._28_4_;
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0x7f,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar106 >> 0xbf,0) == '\0') &&
        (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar106[0x1f])
    {
      fStack_b58 = INFINITY;
      local_b60 = (undefined1  [8])0x7f8000007f800000;
      fStack_b54 = INFINITY;
      fStack_b50 = INFINITY;
      fStack_b4c = INFINITY;
      fStack_b48 = INFINITY;
      fStack_b44 = INFINITY;
      auVar398._8_4_ = 0xff800000;
      auVar398._0_8_ = 0xff800000ff800000;
      auVar398._12_4_ = 0xff800000;
      auVar398._16_4_ = 0xff800000;
      auVar398._20_4_ = 0xff800000;
      auVar398._24_4_ = 0xff800000;
      auVar398._28_4_ = 0xff800000;
      fVar341 = 0.0;
    }
    else {
      auVar18 = vsqrtps_avx(auVar107);
      auVar244._0_4_ = fVar117 + fVar117;
      auVar244._4_4_ = fVar119 + fVar119;
      auVar244._8_4_ = fVar121 + fVar121;
      auVar244._12_4_ = fVar122 + fVar122;
      auVar244._16_4_ = fVar123 + fVar123;
      auVar244._20_4_ = fVar124 + fVar124;
      auVar244._24_4_ = fVar348 + fVar348;
      auVar244._28_4_ = fVar181 + fVar181;
      auVar17 = vrcpps_avx(auVar244);
      auVar107 = vcmpps_avx(auVar107,auVar142,5);
      fVar240 = auVar17._0_4_;
      fVar255 = auVar17._4_4_;
      auVar38._4_4_ = auVar244._4_4_ * fVar255;
      auVar38._0_4_ = auVar244._0_4_ * fVar240;
      fVar260 = auVar17._8_4_;
      auVar38._8_4_ = auVar244._8_4_ * fVar260;
      fVar265 = auVar17._12_4_;
      auVar38._12_4_ = auVar244._12_4_ * fVar265;
      fVar269 = auVar17._16_4_;
      auVar38._16_4_ = auVar244._16_4_ * fVar269;
      fVar273 = auVar17._20_4_;
      auVar38._20_4_ = auVar244._20_4_ * fVar273;
      fVar277 = auVar17._24_4_;
      auVar38._24_4_ = auVar244._24_4_ * fVar277;
      auVar38._28_4_ = auVar244._28_4_;
      auVar143._8_4_ = 0x3f800000;
      auVar143._0_8_ = &DAT_3f8000003f800000;
      auVar143._12_4_ = 0x3f800000;
      auVar143._16_4_ = 0x3f800000;
      auVar143._20_4_ = 0x3f800000;
      auVar143._24_4_ = 0x3f800000;
      auVar143._28_4_ = 0x3f800000;
      auVar142 = vsubps_avx(auVar143,auVar38);
      fVar240 = fVar240 + fVar240 * auVar142._0_4_;
      fVar255 = fVar255 + fVar255 * auVar142._4_4_;
      fVar260 = fVar260 + fVar260 * auVar142._8_4_;
      fVar265 = fVar265 + fVar265 * auVar142._12_4_;
      fVar269 = fVar269 + fVar269 * auVar142._16_4_;
      fVar273 = fVar273 + fVar273 * auVar142._20_4_;
      fVar277 = fVar277 + fVar277 * auVar142._24_4_;
      auVar283._0_8_ = CONCAT44(fVar387,fVar379) ^ 0x8000000080000000;
      auVar283._8_4_ = -local_600._8_4_;
      auVar283._12_4_ = -local_600._12_4_;
      auVar283._16_4_ = -local_600._16_4_;
      auVar283._20_4_ = -local_600._20_4_;
      auVar283._24_4_ = -local_600._24_4_;
      auVar283._28_4_ = -local_600._28_4_;
      auVar19 = vsubps_avx(auVar283,auVar18);
      fVar379 = auVar19._0_4_ * fVar240;
      fVar387 = auVar19._4_4_ * fVar255;
      auVar39._4_4_ = fVar387;
      auVar39._0_4_ = fVar379;
      fVar289 = auVar19._8_4_ * fVar260;
      auVar39._8_4_ = fVar289;
      fVar291 = auVar19._12_4_ * fVar265;
      auVar39._12_4_ = fVar291;
      fVar293 = auVar19._16_4_ * fVar269;
      auVar39._16_4_ = fVar293;
      fVar295 = auVar19._20_4_ * fVar273;
      auVar39._20_4_ = fVar295;
      fVar297 = auVar19._24_4_ * fVar277;
      auVar39._24_4_ = fVar297;
      auVar39._28_4_ = auVar19._28_4_;
      auVar18 = vsubps_avx(auVar18,local_600);
      fVar240 = auVar18._0_4_ * fVar240;
      fVar255 = auVar18._4_4_ * fVar255;
      auVar40._4_4_ = fVar255;
      auVar40._0_4_ = fVar240;
      fVar260 = auVar18._8_4_ * fVar260;
      auVar40._8_4_ = fVar260;
      fVar265 = auVar18._12_4_ * fVar265;
      auVar40._12_4_ = fVar265;
      fVar269 = auVar18._16_4_ * fVar269;
      auVar40._16_4_ = fVar269;
      fVar273 = auVar18._20_4_ * fVar273;
      auVar40._20_4_ = fVar273;
      fVar277 = auVar18._24_4_ * fVar277;
      auVar40._24_4_ = fVar277;
      auVar40._28_4_ = auVar18._28_4_;
      fStack_524 = local_500._28_4_ + auVar17._28_4_ + auVar142._28_4_;
      local_540[0] = fVar251 * (local_500._0_4_ + fVar302 * fVar379);
      local_540[1] = fVar236 * (local_500._4_4_ + fVar311 * fVar387);
      local_540[2] = fVar267 * (local_500._8_4_ + fVar316 * fVar289);
      local_540[3] = fVar290 * (local_500._12_4_ + fVar321 * fVar291);
      fStack_530 = fVar322 * (local_500._16_4_ + fVar326 * fVar293);
      fStack_52c = fVar235 * (local_500._20_4_ + fVar331 * fVar295);
      fStack_528 = fVar237 * (local_500._24_4_ + fVar336 * fVar297);
      local_560[0] = fVar251 * (local_500._0_4_ + fVar302 * fVar240);
      local_560[1] = fVar236 * (local_500._4_4_ + fVar311 * fVar255);
      local_560[2] = fVar267 * (local_500._8_4_ + fVar316 * fVar260);
      local_560[3] = fVar290 * (local_500._12_4_ + fVar321 * fVar265);
      fStack_550 = fVar322 * (local_500._16_4_ + fVar326 * fVar269);
      fStack_54c = fVar235 * (local_500._20_4_ + fVar331 * fVar273);
      fStack_548 = fVar237 * (local_500._24_4_ + fVar336 * fVar277);
      fStack_544 = local_500._28_4_ + fStack_524;
      auVar245._8_4_ = 0x7f800000;
      auVar245._0_8_ = 0x7f8000007f800000;
      auVar245._12_4_ = 0x7f800000;
      auVar245._16_4_ = 0x7f800000;
      auVar245._20_4_ = 0x7f800000;
      auVar245._24_4_ = 0x7f800000;
      auVar245._28_4_ = 0x7f800000;
      _local_b60 = vblendvps_avx(auVar245,auVar39,auVar107);
      auVar284._8_4_ = 0x7fffffff;
      auVar284._0_8_ = 0x7fffffff7fffffff;
      auVar284._12_4_ = 0x7fffffff;
      auVar284._16_4_ = 0x7fffffff;
      auVar284._20_4_ = 0x7fffffff;
      auVar284._24_4_ = 0x7fffffff;
      auVar284._28_4_ = 0x7fffffff;
      auVar142 = vandps_avx(local_2c0,auVar284);
      auVar142 = vmaxps_avx(local_4c0,auVar142);
      auVar41._4_4_ = auVar142._4_4_ * 1.9073486e-06;
      auVar41._0_4_ = auVar142._0_4_ * 1.9073486e-06;
      auVar41._8_4_ = auVar142._8_4_ * 1.9073486e-06;
      auVar41._12_4_ = auVar142._12_4_ * 1.9073486e-06;
      auVar41._16_4_ = auVar142._16_4_ * 1.9073486e-06;
      auVar41._20_4_ = auVar142._20_4_ * 1.9073486e-06;
      auVar41._24_4_ = auVar142._24_4_ * 1.9073486e-06;
      auVar41._28_4_ = auVar142._28_4_;
      auVar142 = vandps_avx(local_6a0,auVar284);
      auVar142 = vcmpps_avx(auVar142,auVar41,1);
      auVar246._8_4_ = 0xff800000;
      auVar246._0_8_ = 0xff800000ff800000;
      auVar246._12_4_ = 0xff800000;
      auVar246._16_4_ = 0xff800000;
      auVar246._20_4_ = 0xff800000;
      auVar246._24_4_ = 0xff800000;
      auVar246._28_4_ = 0xff800000;
      auVar398 = vblendvps_avx(auVar246,auVar40,auVar107);
      auVar17 = auVar107 & auVar142;
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0x7f,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0xbf,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar17[0x1f] < '\0') {
        auVar106 = vandps_avx(auVar142,auVar107);
        auVar128 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
        auVar142 = vcmpps_avx(auVar144,ZEXT832(0) << 0x20,2);
        auVar305._8_4_ = 0xff800000;
        auVar305._0_8_ = 0xff800000ff800000;
        auVar305._12_4_ = 0xff800000;
        auVar305._16_4_ = 0xff800000;
        auVar305._20_4_ = 0xff800000;
        auVar305._24_4_ = 0xff800000;
        auVar305._28_4_ = 0xff800000;
        auVar383._8_4_ = 0x7f800000;
        auVar383._0_8_ = 0x7f8000007f800000;
        auVar383._12_4_ = 0x7f800000;
        auVar383._16_4_ = 0x7f800000;
        auVar383._20_4_ = 0x7f800000;
        auVar383._24_4_ = 0x7f800000;
        auVar383._28_4_ = 0x7f800000;
        auVar144 = vblendvps_avx(auVar383,auVar305,auVar142);
        auVar164 = vpmovsxwd_avx(auVar128);
        auVar128 = vpunpckhwd_avx(auVar128,auVar128);
        auVar226._16_16_ = auVar128;
        auVar226._0_16_ = auVar164;
        _local_b60 = vblendvps_avx(_local_b60,auVar144,auVar226);
        auVar144 = vblendvps_avx(auVar305,auVar383,auVar142);
        auVar398 = vblendvps_avx(auVar398,auVar144,auVar226);
        auVar144 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar114._0_4_ = auVar106._0_4_ ^ auVar144._0_4_;
        auVar114._4_4_ = auVar106._4_4_ ^ auVar144._4_4_;
        auVar114._8_4_ = auVar106._8_4_ ^ auVar144._8_4_;
        auVar114._12_4_ = auVar106._12_4_ ^ auVar144._12_4_;
        auVar114._16_4_ = auVar106._16_4_ ^ auVar144._16_4_;
        auVar114._20_4_ = auVar106._20_4_ ^ auVar144._20_4_;
        auVar114._24_4_ = auVar106._24_4_ ^ auVar144._24_4_;
        auVar114._28_4_ = auVar106._28_4_ ^ auVar144._28_4_;
        auVar106 = vorps_avx(auVar142,auVar114);
        auVar106 = vandps_avx(auVar107,auVar106);
      }
    }
    auVar370 = ZEXT3264(auVar107);
    auVar107 = local_4a0 & auVar106;
    auVar218._8_4_ = 0x3f800000;
    auVar218._0_8_ = &DAT_3f8000003f800000;
    auVar218._12_4_ = 0x3f800000;
    auVar218._16_4_ = 0x3f800000;
    auVar218._20_4_ = 0x3f800000;
    auVar218._24_4_ = 0x3f800000;
    auVar218._28_4_ = 0x3f800000;
    auVar227 = ZEXT3264(auVar218);
    auVar250 = ZEXT3264(_local_940);
    auVar286 = ZEXT1664(local_a00);
    if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar107 >> 0x7f,0) != '\0') ||
          (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar107 >> 0xbf,0) != '\0') ||
        (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar107[0x1f] < '\0') {
      auVar128 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_900._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_900._0_4_)),0);
      auVar206._16_16_ = auVar128;
      auVar206._0_16_ = auVar128;
      auVar142 = vminps_avx(auVar206,auVar398);
      fVar269 = auVar141._28_4_;
      auVar175._0_4_ =
           (float)local_800._0_4_ * fVar239 +
           (float)local_820._0_4_ * fVar367 + (float)local_840._0_4_ * fVar377;
      auVar175._4_4_ =
           (float)local_800._4_4_ * fVar254 +
           (float)local_820._4_4_ * fVar371 + (float)local_840._4_4_ * fVar385;
      auVar175._8_4_ = fStack_7f8 * fVar259 + fStack_818 * fVar372 + fStack_838 * fVar388;
      auVar175._12_4_ = fStack_7f4 * fVar264 + fStack_814 * fVar373 + fStack_834 * fVar390;
      auVar175._16_4_ = fStack_7f0 * fVar268 + fStack_810 * fVar374 + fStack_830 * fVar392;
      auVar175._20_4_ = fStack_7ec * fVar272 + fStack_80c * fVar375 + fStack_82c * fVar394;
      auVar175._24_4_ = fStack_7e8 * fVar276 + fStack_808 * fVar376 + fStack_828 * fVar396;
      auVar175._28_4_ = fVar278 + fVar269 + 1.0;
      auVar107 = vrcpps_avx(auVar175);
      fVar278 = auVar107._0_4_;
      fVar379 = auVar107._4_4_;
      auVar42._4_4_ = auVar175._4_4_ * fVar379;
      auVar42._0_4_ = auVar175._0_4_ * fVar278;
      fVar387 = auVar107._8_4_;
      auVar42._8_4_ = auVar175._8_4_ * fVar387;
      fVar240 = auVar107._12_4_;
      auVar42._12_4_ = auVar175._12_4_ * fVar240;
      fVar255 = auVar107._16_4_;
      auVar42._16_4_ = auVar175._16_4_ * fVar255;
      fVar260 = auVar107._20_4_;
      auVar42._20_4_ = auVar175._20_4_ * fVar260;
      fVar265 = auVar107._24_4_;
      auVar42._24_4_ = auVar175._24_4_ * fVar265;
      auVar42._28_4_ = 0x3f800000;
      auVar144 = vsubps_avx(auVar218,auVar42);
      auVar285._8_4_ = 0x7fffffff;
      auVar285._0_8_ = 0x7fffffff7fffffff;
      auVar285._12_4_ = 0x7fffffff;
      auVar285._16_4_ = 0x7fffffff;
      auVar285._20_4_ = 0x7fffffff;
      auVar285._24_4_ = 0x7fffffff;
      auVar285._28_4_ = 0x7fffffff;
      auVar107 = vandps_avx(auVar175,auVar285);
      auVar382._8_4_ = 0x219392ef;
      auVar382._0_8_ = 0x219392ef219392ef;
      auVar382._12_4_ = 0x219392ef;
      auVar382._16_4_ = 0x219392ef;
      auVar382._20_4_ = 0x219392ef;
      auVar382._24_4_ = 0x219392ef;
      auVar382._28_4_ = 0x219392ef;
      auVar141 = vcmpps_avx(auVar107,auVar382,1);
      auVar43._4_4_ =
           (fVar379 + fVar379 * auVar144._4_4_) *
           -(fVar360 * fVar254 + fVar371 * fVar355 + fVar385 * fVar234);
      auVar43._0_4_ =
           (fVar278 + fVar278 * auVar144._0_4_) *
           -(fVar356 * fVar239 + fVar367 * fVar238 + fVar377 * fVar195);
      auVar43._8_4_ =
           (fVar387 + fVar387 * auVar144._8_4_) *
           -(fVar361 * fVar259 + fVar372 * fVar266 + fVar388 * fVar263);
      auVar43._12_4_ =
           (fVar240 + fVar240 * auVar144._12_4_) *
           -(fVar362 * fVar264 + fVar373 * fVar288 + fVar390 * fVar287);
      auVar43._16_4_ =
           (fVar255 + fVar255 * auVar144._16_4_) *
           -(fVar363 * fVar268 + fVar374 * fVar317 + fVar392 * fVar312);
      auVar43._20_4_ =
           (fVar260 + fVar260 * auVar144._20_4_) *
           -(fVar364 * fVar272 + fVar375 * fVar8 + fVar394 * fVar366);
      auVar43._24_4_ =
           (fVar265 + fVar265 * auVar144._24_4_) *
           -(fVar365 * fVar276 + fVar376 * fVar15 + fVar396 * fVar14);
      auVar43._28_4_ = -(fVar269 + fVar341 + fVar269);
      auVar347 = ZEXT864(0) << 0x20;
      auVar107 = vcmpps_avx(auVar175,ZEXT832(0) << 0x20,1);
      auVar107 = vorps_avx(auVar141,auVar107);
      auVar352._8_4_ = 0xff800000;
      auVar352._0_8_ = 0xff800000ff800000;
      auVar352._12_4_ = 0xff800000;
      auVar352._16_4_ = 0xff800000;
      auVar352._20_4_ = 0xff800000;
      auVar352._24_4_ = 0xff800000;
      auVar352._28_4_ = 0xff800000;
      auVar354 = ZEXT3264(auVar352);
      auVar107 = vblendvps_avx(auVar43,auVar352,auVar107);
      auVar144 = vcmpps_avx(auVar175,ZEXT832(0) << 0x20,6);
      auVar141 = vorps_avx(auVar141,auVar144);
      auVar358._8_4_ = 0x7f800000;
      auVar358._0_8_ = 0x7f8000007f800000;
      auVar358._12_4_ = 0x7f800000;
      auVar358._16_4_ = 0x7f800000;
      auVar358._20_4_ = 0x7f800000;
      auVar358._24_4_ = 0x7f800000;
      auVar358._28_4_ = 0x7f800000;
      auVar359 = ZEXT3264(auVar358);
      auVar141 = vblendvps_avx(auVar43,auVar358,auVar141);
      auVar144 = vmaxps_avx(local_280,_local_b60);
      auVar144 = vmaxps_avx(auVar144,auVar107);
      auVar142 = vminps_avx(auVar142,auVar141);
      auVar346 = ZEXT832(0) << 0x20;
      auVar107 = vsubps_avx(auVar346,_local_9e0);
      auVar141 = vsubps_avx(auVar346,local_b00);
      auVar44._4_4_ = auVar141._4_4_ * -fVar386;
      auVar44._0_4_ = auVar141._0_4_ * -fVar378;
      auVar44._8_4_ = auVar141._8_4_ * -fVar389;
      auVar44._12_4_ = auVar141._12_4_ * -fVar391;
      auVar44._16_4_ = auVar141._16_4_ * -fVar393;
      auVar44._20_4_ = auVar141._20_4_ * -fVar395;
      auVar44._24_4_ = auVar141._24_4_ * -fVar397;
      auVar44._28_4_ = auVar141._28_4_;
      auVar45._4_4_ = fVar232 * auVar107._4_4_;
      auVar45._0_4_ = fVar194 * auVar107._0_4_;
      auVar45._8_4_ = fVar258 * auVar107._8_4_;
      auVar45._12_4_ = fVar275 * auVar107._12_4_;
      auVar45._16_4_ = fVar298 * auVar107._16_4_;
      auVar45._20_4_ = fVar349 * auVar107._20_4_;
      auVar45._24_4_ = fVar12 * auVar107._24_4_;
      auVar45._28_4_ = auVar107._28_4_;
      auVar107 = vsubps_avx(auVar44,auVar45);
      auVar141 = vsubps_avx(auVar346,local_ac0);
      auVar370 = ZEXT3264(local_9a0);
      auVar46._4_4_ = fVar233 * auVar141._4_4_;
      auVar46._0_4_ = fVar231 * auVar141._0_4_;
      auVar46._8_4_ = fVar262 * auVar141._8_4_;
      auVar46._12_4_ = fVar279 * auVar141._12_4_;
      auVar46._16_4_ = fVar307 * auVar141._16_4_;
      auVar46._20_4_ = fVar350 * auVar141._20_4_;
      uVar1 = auVar141._28_4_;
      auVar46._24_4_ = fVar13 * auVar141._24_4_;
      auVar46._28_4_ = uVar1;
      auVar17 = vsubps_avx(auVar107,auVar46);
      auVar47._4_4_ = (float)local_840._4_4_ * -fVar386;
      auVar47._0_4_ = (float)local_840._0_4_ * -fVar378;
      auVar47._8_4_ = fStack_838 * -fVar389;
      auVar47._12_4_ = fStack_834 * -fVar391;
      auVar47._16_4_ = fStack_830 * -fVar393;
      auVar47._20_4_ = fStack_82c * -fVar395;
      auVar47._24_4_ = fStack_828 * -fVar397;
      auVar47._28_4_ = uVar4 ^ 0x80000000;
      auVar48._4_4_ = (float)local_820._4_4_ * fVar232;
      auVar48._0_4_ = (float)local_820._0_4_ * fVar194;
      auVar48._8_4_ = fStack_818 * fVar258;
      auVar48._12_4_ = fStack_814 * fVar275;
      auVar48._16_4_ = fStack_810 * fVar298;
      auVar48._20_4_ = fStack_80c * fVar349;
      auVar48._24_4_ = fStack_808 * fVar12;
      auVar48._28_4_ = uVar1;
      auVar224._8_4_ = 0x3f800000;
      auVar224._0_8_ = &DAT_3f8000003f800000;
      auVar224._12_4_ = 0x3f800000;
      auVar224._16_4_ = 0x3f800000;
      auVar224._20_4_ = 0x3f800000;
      auVar224._24_4_ = 0x3f800000;
      auVar224._28_4_ = 0x3f800000;
      auVar107 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar233 * (float)local_800._4_4_;
      auVar49._0_4_ = fVar231 * (float)local_800._0_4_;
      auVar49._8_4_ = fVar262 * fStack_7f8;
      auVar49._12_4_ = fVar279 * fStack_7f4;
      auVar49._16_4_ = fVar307 * fStack_7f0;
      auVar49._20_4_ = fVar350 * fStack_7ec;
      auVar49._24_4_ = fVar13 * fStack_7e8;
      auVar49._28_4_ = uVar1;
      auVar18 = vsubps_avx(auVar107,auVar49);
      auVar107 = vrcpps_avx(auVar18);
      fVar194 = auVar107._0_4_;
      fVar231 = auVar107._4_4_;
      auVar50._4_4_ = auVar18._4_4_ * fVar231;
      auVar50._0_4_ = auVar18._0_4_ * fVar194;
      fVar195 = auVar107._8_4_;
      auVar50._8_4_ = auVar18._8_4_ * fVar195;
      fVar238 = auVar107._12_4_;
      auVar50._12_4_ = auVar18._12_4_ * fVar238;
      fVar232 = auVar107._16_4_;
      auVar50._16_4_ = auVar18._16_4_ * fVar232;
      fVar233 = auVar107._20_4_;
      auVar50._20_4_ = auVar18._20_4_ * fVar233;
      fVar234 = auVar107._24_4_;
      auVar50._24_4_ = auVar18._24_4_ * fVar234;
      auVar50._28_4_ = fStack_7e4;
      auVar19 = vsubps_avx(auVar224,auVar50);
      auVar247._8_4_ = 0x7fffffff;
      auVar247._0_8_ = 0x7fffffff7fffffff;
      auVar247._12_4_ = 0x7fffffff;
      auVar247._16_4_ = 0x7fffffff;
      auVar247._20_4_ = 0x7fffffff;
      auVar247._24_4_ = 0x7fffffff;
      auVar247._28_4_ = 0x7fffffff;
      auVar107 = vandps_avx(auVar18,auVar247);
      auVar141 = vcmpps_avx(auVar107,auVar382,1);
      auVar51._4_4_ = (fVar231 + fVar231 * auVar19._4_4_) * -auVar17._4_4_;
      auVar51._0_4_ = (fVar194 + fVar194 * auVar19._0_4_) * -auVar17._0_4_;
      auVar51._8_4_ = (fVar195 + fVar195 * auVar19._8_4_) * -auVar17._8_4_;
      auVar51._12_4_ = (fVar238 + fVar238 * auVar19._12_4_) * -auVar17._12_4_;
      auVar51._16_4_ = (fVar232 + fVar232 * auVar19._16_4_) * -auVar17._16_4_;
      auVar51._20_4_ = (fVar233 + fVar233 * auVar19._20_4_) * -auVar17._20_4_;
      auVar51._24_4_ = (fVar234 + fVar234 * auVar19._24_4_) * -auVar17._24_4_;
      auVar51._28_4_ = auVar17._28_4_ ^ 0x80000000;
      auVar107 = vcmpps_avx(auVar18,auVar346,1);
      auVar107 = vorps_avx(auVar141,auVar107);
      auVar107 = vblendvps_avx(auVar51,auVar352,auVar107);
      local_4e0 = vmaxps_avx(auVar144,auVar107);
      auVar107 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,6);
      auVar107 = vorps_avx(auVar141,auVar107);
      auVar107 = vblendvps_avx(auVar51,auVar358,auVar107);
      auVar106 = vandps_avx(auVar106,local_4a0);
      local_2e0 = vminps_avx(auVar142,auVar107);
      auVar107 = vcmpps_avx(local_4e0,local_2e0,2);
      auVar141 = auVar106 & auVar107;
      if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar141 >> 0x7f,0) == '\0') &&
            (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar141 >> 0xbf,0) == '\0') &&
          (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar141[0x1f]) {
LAB_00f9a1ee:
        auVar250 = ZEXT3264(_local_940);
      }
      else {
        auVar141 = vminps_avx(local_7e0,auVar108);
        auVar16 = vminps_avx(local_660,auVar16);
        auVar141 = vminps_avx(auVar141,auVar16);
        auVar141 = vsubps_avx(auVar141,local_580);
        auVar106 = vandps_avx(auVar107,auVar106);
        auVar82._4_4_ = local_540[1];
        auVar82._0_4_ = local_540[0];
        auVar82._8_4_ = local_540[2];
        auVar82._12_4_ = local_540[3];
        auVar82._16_4_ = fStack_530;
        auVar82._20_4_ = fStack_52c;
        auVar82._24_4_ = fStack_528;
        auVar82._28_4_ = fStack_524;
        auVar107 = vminps_avx(auVar82,auVar224);
        auVar107 = vmaxps_avx(auVar107,ZEXT832(0) << 0x20);
        local_540[0] = fVar90 + fVar125 * (auVar107._0_4_ + 0.0) * 0.125;
        local_540[1] = fVar116 + fVar157 * (auVar107._4_4_ + 1.0) * 0.125;
        local_540[2] = fVar118 + fVar158 * (auVar107._8_4_ + 2.0) * 0.125;
        local_540[3] = fVar120 + fVar159 * (auVar107._12_4_ + 3.0) * 0.125;
        fStack_530 = fVar90 + fVar125 * (auVar107._16_4_ + 4.0) * 0.125;
        fStack_52c = fVar116 + fVar157 * (auVar107._20_4_ + 5.0) * 0.125;
        fStack_528 = fVar118 + fVar158 * (auVar107._24_4_ + 6.0) * 0.125;
        fStack_524 = fVar120 + auVar107._28_4_ + 7.0;
        auVar81._4_4_ = local_560[1];
        auVar81._0_4_ = local_560[0];
        auVar81._8_4_ = local_560[2];
        auVar81._12_4_ = local_560[3];
        auVar81._16_4_ = fStack_550;
        auVar81._20_4_ = fStack_54c;
        auVar81._24_4_ = fStack_548;
        auVar81._28_4_ = fStack_544;
        auVar107 = vminps_avx(auVar81,auVar224);
        auVar107 = vmaxps_avx(auVar107,ZEXT832(0) << 0x20);
        local_560[0] = fVar90 + fVar125 * (auVar107._0_4_ + 0.0) * 0.125;
        local_560[1] = fVar116 + fVar157 * (auVar107._4_4_ + 1.0) * 0.125;
        local_560[2] = fVar118 + fVar158 * (auVar107._8_4_ + 2.0) * 0.125;
        local_560[3] = fVar120 + fVar159 * (auVar107._12_4_ + 3.0) * 0.125;
        fStack_550 = fVar90 + fVar125 * (auVar107._16_4_ + 4.0) * 0.125;
        fStack_54c = fVar116 + fVar157 * (auVar107._20_4_ + 5.0) * 0.125;
        fStack_548 = fVar118 + fVar158 * (auVar107._24_4_ + 6.0) * 0.125;
        fStack_544 = fVar120 + auVar107._28_4_ + 7.0;
        auVar52._4_4_ = auVar141._4_4_ * 0.99999976;
        auVar52._0_4_ = auVar141._0_4_ * 0.99999976;
        auVar52._8_4_ = auVar141._8_4_ * 0.99999976;
        auVar52._12_4_ = auVar141._12_4_ * 0.99999976;
        auVar52._16_4_ = auVar141._16_4_ * 0.99999976;
        auVar52._20_4_ = auVar141._20_4_ * 0.99999976;
        auVar52._24_4_ = auVar141._24_4_ * 0.99999976;
        auVar52._28_4_ = 0x3f7ffffc;
        auVar107 = vmaxps_avx(ZEXT832(0) << 0x20,auVar52);
        auVar53._4_4_ = auVar107._4_4_ * auVar107._4_4_;
        auVar53._0_4_ = auVar107._0_4_ * auVar107._0_4_;
        auVar53._8_4_ = auVar107._8_4_ * auVar107._8_4_;
        auVar53._12_4_ = auVar107._12_4_ * auVar107._12_4_;
        auVar53._16_4_ = auVar107._16_4_ * auVar107._16_4_;
        auVar53._20_4_ = auVar107._20_4_ * auVar107._20_4_;
        auVar53._24_4_ = auVar107._24_4_ * auVar107._24_4_;
        auVar53._28_4_ = auVar107._28_4_;
        local_920 = vsubps_avx(auVar384,auVar53);
        auVar54._4_4_ = local_920._4_4_ * (float)local_680._4_4_;
        auVar54._0_4_ = local_920._0_4_ * (float)local_680._0_4_;
        auVar54._8_4_ = local_920._8_4_ * fStack_678;
        auVar54._12_4_ = local_920._12_4_ * fStack_674;
        auVar54._16_4_ = local_920._16_4_ * fStack_670;
        auVar54._20_4_ = local_920._20_4_ * fStack_66c;
        auVar54._24_4_ = local_920._24_4_ * fStack_668;
        auVar54._28_4_ = auVar107._28_4_;
        auVar141 = vsubps_avx(auVar36,auVar54);
        local_aa0 = vcmpps_avx(auVar141,ZEXT832(0) << 0x20,5);
        auVar107 = local_aa0;
        if ((((((((local_aa0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_aa0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_aa0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_aa0 >> 0x7f,0) == '\0') &&
              (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_aa0 >> 0xbf,0) == '\0') &&
            (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_aa0[0x1f]) {
          auVar144 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_8e0 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          auVar188 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar207._8_4_ = 0x7f800000;
          auVar207._0_8_ = 0x7f8000007f800000;
          auVar207._12_4_ = 0x7f800000;
          auVar207._16_4_ = 0x7f800000;
          auVar207._20_4_ = 0x7f800000;
          auVar207._24_4_ = 0x7f800000;
          auVar207._28_4_ = 0x7f800000;
          auVar219._8_4_ = 0xff800000;
          auVar219._0_8_ = 0xff800000ff800000;
          auVar219._12_4_ = 0xff800000;
          auVar219._16_4_ = 0xff800000;
          auVar219._20_4_ = 0xff800000;
          auVar219._24_4_ = 0xff800000;
          auVar219._28_4_ = 0xff800000;
          auVar353 = local_7c0;
          local_aa0 = auVar20;
          local_920 = auVar21;
          _local_8c0 = _local_8e0;
        }
        else {
          auVar144 = vsqrtps_avx(auVar141);
          auVar190._0_4_ = fVar117 + fVar117;
          auVar190._4_4_ = fVar119 + fVar119;
          auVar190._8_4_ = fVar121 + fVar121;
          auVar190._12_4_ = fVar122 + fVar122;
          auVar190._16_4_ = fVar123 + fVar123;
          auVar190._20_4_ = fVar124 + fVar124;
          auVar190._24_4_ = fVar348 + fVar348;
          auVar190._28_4_ = fVar181 + fVar181;
          auVar16 = vrcpps_avx(auVar190);
          fVar181 = auVar16._0_4_;
          fVar194 = auVar16._4_4_;
          auVar55._4_4_ = auVar190._4_4_ * fVar194;
          auVar55._0_4_ = auVar190._0_4_ * fVar181;
          fVar231 = auVar16._8_4_;
          auVar55._8_4_ = auVar190._8_4_ * fVar231;
          fVar195 = auVar16._12_4_;
          auVar55._12_4_ = auVar190._12_4_ * fVar195;
          fVar238 = auVar16._16_4_;
          auVar55._16_4_ = auVar190._16_4_ * fVar238;
          fVar232 = auVar16._20_4_;
          auVar55._20_4_ = auVar190._20_4_ * fVar232;
          fVar233 = auVar16._24_4_;
          auVar55._24_4_ = auVar190._24_4_ * fVar233;
          auVar55._28_4_ = auVar190._28_4_;
          auVar384 = vsubps_avx(auVar224,auVar55);
          fVar181 = fVar181 + fVar181 * auVar384._0_4_;
          fVar194 = fVar194 + fVar194 * auVar384._4_4_;
          fVar231 = fVar231 + fVar231 * auVar384._8_4_;
          fVar195 = fVar195 + fVar195 * auVar384._12_4_;
          fVar238 = fVar238 + fVar238 * auVar384._16_4_;
          fVar232 = fVar232 + fVar232 * auVar384._20_4_;
          fVar233 = fVar233 + fVar233 * auVar384._24_4_;
          fVar234 = auVar16._28_4_ + auVar384._28_4_;
          auVar220._0_8_ = local_600._0_8_ ^ 0x8000000080000000;
          auVar220._8_4_ = -local_600._8_4_;
          auVar220._12_4_ = -local_600._12_4_;
          auVar220._16_4_ = -local_600._16_4_;
          auVar220._20_4_ = -local_600._20_4_;
          auVar220._24_4_ = -local_600._24_4_;
          auVar220._28_4_ = -local_600._28_4_;
          auVar16 = vsubps_avx(auVar220,auVar144);
          fVar287 = auVar16._0_4_ * fVar181;
          fVar288 = auVar16._4_4_ * fVar194;
          auVar56._4_4_ = fVar288;
          auVar56._0_4_ = fVar287;
          fVar298 = auVar16._8_4_ * fVar231;
          auVar56._8_4_ = fVar298;
          fVar307 = auVar16._12_4_ * fVar195;
          auVar56._12_4_ = fVar307;
          fVar312 = auVar16._16_4_ * fVar238;
          auVar56._16_4_ = fVar312;
          fVar317 = auVar16._20_4_ * fVar232;
          auVar56._20_4_ = fVar317;
          fVar349 = auVar16._24_4_ * fVar233;
          auVar56._24_4_ = fVar349;
          auVar56._28_4_ = 0x219392ef;
          auVar144 = vsubps_avx(auVar144,local_600);
          fVar181 = auVar144._0_4_ * fVar181;
          fVar194 = auVar144._4_4_ * fVar194;
          auVar57._4_4_ = fVar194;
          auVar57._0_4_ = fVar181;
          fVar231 = auVar144._8_4_ * fVar231;
          auVar57._8_4_ = fVar231;
          fVar195 = auVar144._12_4_ * fVar195;
          auVar57._12_4_ = fVar195;
          fVar238 = auVar144._16_4_ * fVar238;
          auVar57._16_4_ = fVar238;
          fVar232 = auVar144._20_4_ * fVar232;
          auVar57._20_4_ = fVar232;
          fVar233 = auVar144._24_4_ * fVar233;
          auVar57._24_4_ = fVar233;
          auVar57._28_4_ = local_9a0._28_4_;
          auVar370 = ZEXT3264(auVar57);
          fVar355 = fVar251 * (fVar287 * fVar302 + local_500._0_4_);
          fVar258 = fVar236 * (fVar288 * fVar311 + local_500._4_4_);
          fVar262 = fVar267 * (fVar298 * fVar316 + local_500._8_4_);
          fVar263 = fVar290 * (fVar307 * fVar321 + local_500._12_4_);
          fVar266 = fVar322 * (fVar312 * fVar326 + local_500._16_4_);
          fVar275 = fVar235 * (fVar317 * fVar331 + local_500._20_4_);
          fVar279 = fVar237 * (fVar349 * fVar336 + local_500._24_4_);
          auVar145._0_4_ = fVar299 + fVar229 * fVar355;
          auVar145._4_4_ = fVar308 + fVar230 * fVar258;
          auVar145._8_4_ = fVar313 + fVar257 * fVar262;
          auVar145._12_4_ = fVar318 + fVar274 * fVar263;
          auVar145._16_4_ = fVar323 + fVar296 * fVar266;
          auVar145._20_4_ = fVar328 + fVar337 * fVar275;
          auVar145._24_4_ = fVar333 + fVar11 * fVar279;
          auVar145._28_4_ = fVar338 + auVar144._28_4_ + local_500._28_4_;
          auVar58._4_4_ = (float)local_800._4_4_ * fVar288;
          auVar58._0_4_ = (float)local_800._0_4_ * fVar287;
          auVar58._8_4_ = fStack_7f8 * fVar298;
          auVar58._12_4_ = fStack_7f4 * fVar307;
          auVar58._16_4_ = fStack_7f0 * fVar312;
          auVar58._20_4_ = fStack_7ec * fVar317;
          auVar58._24_4_ = fStack_7e8 * fVar349;
          auVar58._28_4_ = fVar234;
          auVar144 = vsubps_avx(auVar58,auVar145);
          auVar191._0_4_ = fVar300 + fVar228 * fVar355;
          auVar191._4_4_ = fVar309 + fVar256 * fVar258;
          auVar191._8_4_ = fVar314 + fVar252 * fVar262;
          auVar191._12_4_ = fVar319 + fVar270 * fVar263;
          auVar191._16_4_ = fVar324 + fVar292 * fVar266;
          auVar191._20_4_ = fVar329 + fVar327 * fVar275;
          auVar191._24_4_ = fVar334 + fVar9 * fVar279;
          auVar191._28_4_ = fVar339 + fVar234;
          auVar59._4_4_ = (float)local_820._4_4_ * fVar288;
          auVar59._0_4_ = (float)local_820._0_4_ * fVar287;
          auVar59._8_4_ = fStack_818 * fVar298;
          auVar59._12_4_ = fStack_814 * fVar307;
          auVar59._16_4_ = fStack_810 * fVar312;
          auVar59._20_4_ = fStack_80c * fVar317;
          auVar59._24_4_ = fStack_808 * fVar349;
          auVar59._28_4_ = fVar120;
          local_b00 = vsubps_avx(auVar59,auVar191);
          auVar221._0_4_ = fVar301 + fVar193 * fVar355;
          auVar221._4_4_ = fVar310 + fVar261 * fVar258;
          auVar221._8_4_ = fVar315 + fVar253 * fVar262;
          auVar221._12_4_ = fVar320 + fVar271 * fVar263;
          auVar221._16_4_ = fVar325 + fVar294 * fVar266;
          auVar221._20_4_ = fVar330 + fVar332 * fVar275;
          auVar221._24_4_ = fVar335 + fVar10 * fVar279;
          auVar221._28_4_ = fVar340 + auVar16._28_4_;
          auVar60._4_4_ = (float)local_840._4_4_ * fVar288;
          auVar60._0_4_ = (float)local_840._0_4_ * fVar287;
          auVar60._8_4_ = fStack_838 * fVar298;
          auVar60._12_4_ = fStack_834 * fVar307;
          auVar60._16_4_ = fStack_830 * fVar312;
          auVar60._20_4_ = fStack_82c * fVar317;
          auVar60._24_4_ = fStack_828 * fVar349;
          auVar60._28_4_ = fVar120;
          local_960 = vsubps_avx(auVar60,auVar221);
          fVar251 = fVar251 * (fVar181 * fVar302 + local_500._0_4_);
          fVar236 = fVar236 * (fVar194 * fVar311 + local_500._4_4_);
          fVar267 = fVar267 * (fVar231 * fVar316 + local_500._8_4_);
          fVar290 = fVar290 * (fVar195 * fVar321 + local_500._12_4_);
          fVar322 = fVar322 * (fVar238 * fVar326 + local_500._16_4_);
          fVar235 = fVar235 * (fVar232 * fVar331 + local_500._20_4_);
          fVar237 = fVar237 * (fVar233 * fVar336 + local_500._24_4_);
          auVar248._0_4_ = fVar299 + fVar229 * fVar251;
          auVar248._4_4_ = fVar308 + fVar230 * fVar236;
          auVar248._8_4_ = fVar313 + fVar257 * fVar267;
          auVar248._12_4_ = fVar318 + fVar274 * fVar290;
          auVar248._16_4_ = fVar323 + fVar296 * fVar322;
          auVar248._20_4_ = fVar328 + fVar337 * fVar235;
          auVar248._24_4_ = fVar333 + fVar11 * fVar237;
          auVar248._28_4_ = fVar338 + fVar120;
          auVar61._4_4_ = (float)local_800._4_4_ * fVar194;
          auVar61._0_4_ = (float)local_800._0_4_ * fVar181;
          auVar61._8_4_ = fStack_7f8 * fVar231;
          auVar61._12_4_ = fStack_7f4 * fVar195;
          auVar61._16_4_ = fStack_7f0 * fVar238;
          auVar61._20_4_ = fStack_7ec * fVar232;
          auVar61._24_4_ = fStack_7e8 * fVar233;
          auVar61._28_4_ = fStack_7e4;
          _local_8c0 = vsubps_avx(auVar61,auVar248);
          auVar249._0_4_ = fVar300 + fVar228 * fVar251;
          auVar249._4_4_ = fVar309 + fVar256 * fVar236;
          auVar249._8_4_ = fVar314 + fVar252 * fVar267;
          auVar249._12_4_ = fVar319 + fVar270 * fVar290;
          auVar249._16_4_ = fVar324 + fVar292 * fVar322;
          auVar249._20_4_ = fVar329 + fVar327 * fVar235;
          auVar249._24_4_ = fVar334 + fVar9 * fVar237;
          auVar249._28_4_ = fVar339 + local_8c0._28_4_;
          auVar62._4_4_ = (float)local_820._4_4_ * fVar194;
          auVar62._0_4_ = (float)local_820._0_4_ * fVar181;
          auVar62._8_4_ = fStack_818 * fVar231;
          auVar62._12_4_ = fStack_814 * fVar195;
          auVar62._16_4_ = fStack_810 * fVar238;
          auVar62._20_4_ = fStack_80c * fVar232;
          auVar62._24_4_ = fStack_808 * fVar233;
          auVar62._28_4_ = fStack_7e4;
          _local_8e0 = vsubps_avx(auVar62,auVar249);
          auVar222._0_4_ = fVar301 + fVar193 * fVar251;
          auVar222._4_4_ = fVar310 + fVar261 * fVar236;
          auVar222._8_4_ = fVar315 + fVar253 * fVar267;
          auVar222._12_4_ = fVar320 + fVar271 * fVar290;
          auVar222._16_4_ = fVar325 + fVar294 * fVar322;
          auVar222._20_4_ = fVar330 + fVar332 * fVar235;
          auVar222._24_4_ = fVar335 + fVar10 * fVar237;
          auVar222._28_4_ = fVar340 + local_960._28_4_ + local_500._28_4_;
          auVar63._4_4_ = (float)local_840._4_4_ * fVar194;
          auVar63._0_4_ = (float)local_840._0_4_ * fVar181;
          auVar63._8_4_ = fStack_838 * fVar231;
          auVar63._12_4_ = fStack_834 * fVar195;
          auVar63._16_4_ = fStack_830 * fVar238;
          auVar63._20_4_ = fStack_82c * fVar232;
          auVar63._24_4_ = fStack_828 * fVar233;
          auVar63._28_4_ = local_8e0._28_4_;
          _local_680 = vsubps_avx(auVar63,auVar222);
          auVar16 = vcmpps_avx(auVar141,_DAT_02020f00,5);
          auVar208._8_4_ = 0x7f800000;
          auVar208._0_8_ = 0x7f8000007f800000;
          auVar208._12_4_ = 0x7f800000;
          auVar208._16_4_ = 0x7f800000;
          auVar208._20_4_ = 0x7f800000;
          auVar208._24_4_ = 0x7f800000;
          auVar208._28_4_ = 0x7f800000;
          auVar207 = vblendvps_avx(auVar208,auVar56,auVar16);
          auVar304._8_4_ = 0x7fffffff;
          auVar304._0_8_ = 0x7fffffff7fffffff;
          auVar304._12_4_ = 0x7fffffff;
          auVar304._16_4_ = 0x7fffffff;
          auVar304._20_4_ = 0x7fffffff;
          auVar304._24_4_ = 0x7fffffff;
          auVar304._28_4_ = 0x7fffffff;
          auVar141 = vandps_avx(auVar304,local_2c0);
          auVar141 = vmaxps_avx(local_4c0,auVar141);
          auVar353._8_4_ = 0x36000000;
          auVar353._0_8_ = 0x3600000036000000;
          auVar353._12_4_ = 0x36000000;
          auVar353._16_4_ = 0x36000000;
          auVar353._20_4_ = 0x36000000;
          auVar353._24_4_ = 0x36000000;
          auVar353._28_4_ = 0x36000000;
          auVar64._4_4_ = auVar141._4_4_ * 1.9073486e-06;
          auVar64._0_4_ = auVar141._0_4_ * 1.9073486e-06;
          auVar64._8_4_ = auVar141._8_4_ * 1.9073486e-06;
          auVar64._12_4_ = auVar141._12_4_ * 1.9073486e-06;
          auVar64._16_4_ = auVar141._16_4_ * 1.9073486e-06;
          auVar64._20_4_ = auVar141._20_4_ * 1.9073486e-06;
          auVar64._24_4_ = auVar141._24_4_ * 1.9073486e-06;
          auVar64._28_4_ = auVar141._28_4_;
          auVar141 = vandps_avx(auVar304,local_6a0);
          auVar141 = vcmpps_avx(auVar141,auVar64,1);
          auVar223._8_4_ = 0xff800000;
          auVar223._0_8_ = 0xff800000ff800000;
          auVar223._12_4_ = 0xff800000;
          auVar223._16_4_ = 0xff800000;
          auVar223._20_4_ = 0xff800000;
          auVar223._24_4_ = 0xff800000;
          auVar223._28_4_ = 0xff800000;
          auVar219 = vblendvps_avx(auVar223,auVar57,auVar16);
          auVar384 = auVar16 & auVar141;
          if ((((((((auVar384 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar384 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar384 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar384 >> 0x7f,0) != '\0') ||
                (auVar384 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar384 >> 0xbf,0) != '\0') ||
              (auVar384 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar384[0x1f] < '\0') {
            auVar107 = vandps_avx(auVar141,auVar16);
            auVar128 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
            auVar384 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar353 = vcmpps_avx(local_920,auVar384,2);
            auVar399._8_4_ = 0xff800000;
            auVar399._0_8_ = 0xff800000ff800000;
            auVar399._12_4_ = 0xff800000;
            auVar399._16_4_ = 0xff800000;
            auVar399._20_4_ = 0xff800000;
            auVar399._24_4_ = 0xff800000;
            auVar399._28_4_ = 0xff800000;
            auVar400._8_4_ = 0x7f800000;
            auVar400._0_8_ = 0x7f8000007f800000;
            auVar400._12_4_ = 0x7f800000;
            auVar400._16_4_ = 0x7f800000;
            auVar400._20_4_ = 0x7f800000;
            auVar400._24_4_ = 0x7f800000;
            auVar400._28_4_ = 0x7f800000;
            auVar141 = vblendvps_avx(auVar400,auVar399,auVar353);
            auVar164 = vpmovsxwd_avx(auVar128);
            auVar370 = ZEXT1664(auVar164);
            auVar128 = vpunpckhwd_avx(auVar128,auVar128);
            auVar306._16_16_ = auVar128;
            auVar306._0_16_ = auVar164;
            auVar207 = vblendvps_avx(auVar207,auVar141,auVar306);
            auVar141 = vblendvps_avx(auVar399,auVar400,auVar353);
            auVar219 = vblendvps_avx(auVar219,auVar141,auVar306);
            auVar141 = vcmpps_avx(auVar384,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar115._0_4_ = auVar141._0_4_ ^ auVar107._0_4_;
            auVar115._4_4_ = auVar141._4_4_ ^ auVar107._4_4_;
            auVar115._8_4_ = auVar141._8_4_ ^ auVar107._8_4_;
            auVar115._12_4_ = auVar141._12_4_ ^ auVar107._12_4_;
            auVar115._16_4_ = auVar141._16_4_ ^ auVar107._16_4_;
            auVar115._20_4_ = auVar141._20_4_ ^ auVar107._20_4_;
            auVar115._24_4_ = auVar141._24_4_ ^ auVar107._24_4_;
            auVar115._28_4_ = auVar141._28_4_ ^ auVar107._28_4_;
            auVar107 = vorps_avx(auVar353,auVar115);
            auVar107 = vandps_avx(auVar16,auVar107);
          }
          auVar188 = local_b00._0_28_;
          auVar347 = ZEXT3264(local_960);
          _local_9e0 = auVar144;
        }
        auVar354 = ZEXT3264(auVar353);
        auVar359 = ZEXT3264(auVar106);
        _local_340 = local_4e0;
        local_320 = vminps_avx(local_2e0,auVar207);
        local_860 = vmaxps_avx(local_4e0,auVar219);
        _local_300 = local_860;
        auVar141 = vcmpps_avx(local_4e0,local_320,2);
        local_580 = vandps_avx(auVar106,auVar141);
        local_620 = local_580;
        auVar141 = vcmpps_avx(local_860,local_2e0,2);
        local_640 = vandps_avx(auVar106,auVar141);
        auVar106 = vorps_avx(local_640,local_580);
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
          auVar224._8_4_ = 0x3f800000;
          auVar224._0_8_ = &DAT_3f8000003f800000;
          auVar224._12_4_ = 0x3f800000;
          auVar224._16_4_ = 0x3f800000;
          auVar224._20_4_ = 0x3f800000;
          auVar224._24_4_ = 0x3f800000;
          auVar224._28_4_ = 0x3f800000;
          goto LAB_00f9a1ee;
        }
        local_5c0 = local_640;
        local_8a0 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
        local_600._0_4_ = auVar107._0_4_ ^ local_8a0._0_4_;
        local_600._4_4_ = auVar107._4_4_ ^ local_8a0._4_4_;
        local_600._8_4_ = (float)(auVar107._8_4_ ^ local_8a0._8_4_);
        local_600._12_4_ = (float)(auVar107._12_4_ ^ local_8a0._12_4_);
        local_600._16_4_ = (float)(auVar107._16_4_ ^ local_8a0._16_4_);
        local_600._20_4_ = (float)(auVar107._20_4_ ^ local_8a0._20_4_);
        local_600._24_4_ = (float)(auVar107._24_4_ ^ local_8a0._24_4_);
        local_600._28_4_ = (float)((uint)auVar107._28_4_ ^ (uint)local_8a0._28_4_);
        auVar110._0_4_ =
             auVar144._0_4_ * (float)local_800._0_4_ +
             auVar188._0_4_ * (float)local_820._0_4_ + auVar347._0_4_ * (float)local_840._0_4_;
        auVar110._4_4_ =
             auVar144._4_4_ * (float)local_800._4_4_ +
             auVar188._4_4_ * (float)local_820._4_4_ + auVar347._4_4_ * (float)local_840._4_4_;
        auVar110._8_4_ =
             auVar144._8_4_ * fStack_7f8 + auVar188._8_4_ * fStack_818 + auVar347._8_4_ * fStack_838
        ;
        auVar110._12_4_ =
             auVar144._12_4_ * fStack_7f4 +
             auVar188._12_4_ * fStack_814 + auVar347._12_4_ * fStack_834;
        auVar110._16_4_ =
             auVar144._16_4_ * fStack_7f0 +
             auVar188._16_4_ * fStack_810 + auVar347._16_4_ * fStack_830;
        auVar110._20_4_ =
             auVar144._20_4_ * fStack_7ec +
             auVar188._20_4_ * fStack_80c + auVar347._20_4_ * fStack_82c;
        auVar110._24_4_ =
             auVar144._24_4_ * fStack_7e8 +
             auVar188._24_4_ * fStack_808 + auVar347._24_4_ * fStack_828;
        auVar110._28_4_ = auVar107._28_4_ + auVar144._28_4_ + local_8a0._28_4_;
        auVar146._8_4_ = 0x7fffffff;
        auVar146._0_8_ = 0x7fffffff7fffffff;
        auVar146._12_4_ = 0x7fffffff;
        auVar146._16_4_ = 0x7fffffff;
        auVar146._20_4_ = 0x7fffffff;
        auVar146._24_4_ = 0x7fffffff;
        auVar146._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(auVar110,auVar146);
        auVar147._8_4_ = 0x3e99999a;
        auVar147._0_8_ = 0x3e99999a3e99999a;
        auVar147._12_4_ = 0x3e99999a;
        auVar147._16_4_ = 0x3e99999a;
        auVar147._20_4_ = 0x3e99999a;
        auVar147._24_4_ = 0x3e99999a;
        auVar147._28_4_ = 0x3e99999a;
        auVar106 = vcmpps_avx(auVar106,auVar147,1);
        auVar106 = vorps_avx(auVar106,local_600);
        auVar148._8_4_ = 3;
        auVar148._0_8_ = 0x300000003;
        auVar148._12_4_ = 3;
        auVar148._16_4_ = 3;
        auVar148._20_4_ = 3;
        auVar148._24_4_ = 3;
        auVar148._28_4_ = 3;
        auVar177._8_4_ = 2;
        auVar177._0_8_ = 0x200000002;
        auVar177._12_4_ = 2;
        auVar177._16_4_ = 2;
        auVar177._20_4_ = 2;
        auVar177._24_4_ = 2;
        auVar177._28_4_ = 2;
        auVar106 = vblendvps_avx(auVar177,auVar148,auVar106);
        local_5e0 = ZEXT432((uint)uVar87);
        auVar164 = vpshufd_avx(ZEXT416((uint)uVar87),0);
        auVar128 = vpcmpgtd_avx(auVar106._16_16_,auVar164);
        local_6a0._0_16_ = auVar164;
        auVar164 = vpcmpgtd_avx(auVar106._0_16_,auVar164);
        auVar149._16_16_ = auVar128;
        auVar149._0_16_ = auVar164;
        local_5a0 = vblendps_avx(ZEXT1632(auVar164),auVar149,0xf0);
        local_620 = vandnps_avx(local_5a0,local_580);
        auVar106 = local_580 & ~local_5a0;
        auVar227 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_660._0_8_ = uVar87;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0x7f,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0xbf,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar106[0x1f] < '\0') {
          local_880._4_4_ = local_4e0._4_4_ + (float)local_940._4_4_;
          local_880._0_4_ = local_4e0._0_4_ + (float)local_940._0_4_;
          fStack_878 = local_4e0._8_4_ + fStack_938;
          fStack_874 = local_4e0._12_4_ + fStack_934;
          fStack_870 = local_4e0._16_4_ + fStack_930;
          fStack_86c = local_4e0._20_4_ + fStack_92c;
          fStack_868 = local_4e0._24_4_ + fStack_928;
          fStack_864 = local_4e0._28_4_ + fStack_924;
          do {
            auVar198 = auVar227._0_16_;
            auVar150._8_4_ = 0x7f800000;
            auVar150._0_8_ = 0x7f8000007f800000;
            auVar150._12_4_ = 0x7f800000;
            auVar150._16_4_ = 0x7f800000;
            auVar150._20_4_ = 0x7f800000;
            auVar150._24_4_ = 0x7f800000;
            auVar150._28_4_ = 0x7f800000;
            auVar106 = vblendvps_avx(auVar150,local_4e0,local_620);
            auVar107 = vshufps_avx(auVar106,auVar106,0xb1);
            auVar107 = vminps_avx(auVar106,auVar107);
            auVar141 = vshufpd_avx(auVar107,auVar107,5);
            auVar107 = vminps_avx(auVar107,auVar141);
            auVar141 = vperm2f128_avx(auVar107,auVar107,1);
            auVar107 = vminps_avx(auVar107,auVar141);
            auVar107 = vcmpps_avx(auVar106,auVar107,0);
            auVar141 = local_620 & auVar107;
            auVar106 = local_620;
            if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar141 >> 0x7f,0) != '\0') ||
                  (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar141 >> 0xbf,0) != '\0') ||
                (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar141[0x1f] < '\0') {
              auVar106 = vandps_avx(auVar107,local_620);
            }
            uVar86 = vmovmskps_avx(auVar106);
            uVar4 = 0;
            if (uVar86 != 0) {
              for (; (uVar86 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            uVar87 = (ulong)uVar4;
            *(undefined4 *)(local_620 + uVar87 * 4) = 0;
            fVar181 = local_540[uVar87];
            uVar4 = *(uint *)(local_340 + uVar87 * 4);
            fVar228 = local_b04;
            if ((float)local_980._0_4_ < 0.0) {
              fVar228 = sqrtf((float)local_980._0_4_);
              auVar198._8_4_ = 0x7fffffff;
              auVar198._0_8_ = 0x7fffffff7fffffff;
              auVar198._12_4_ = 0x7fffffff;
            }
            auVar359 = ZEXT464(uVar4);
            auVar354 = ZEXT464((uint)fVar181);
            auVar164 = vminps_avx(_local_a40,_local_a60);
            auVar128 = vmaxps_avx(_local_a40,_local_a60);
            auVar97 = vminps_avx(_local_a50,_local_a70);
            auVar166 = vminps_avx(auVar164,auVar97);
            auVar164 = vmaxps_avx(_local_a50,_local_a70);
            auVar97 = vmaxps_avx(auVar128,auVar164);
            auVar128 = vandps_avx(auVar166,auVar198);
            auVar164 = vandps_avx(auVar97,auVar198);
            auVar128 = vmaxps_avx(auVar128,auVar164);
            auVar164 = vmovshdup_avx(auVar128);
            auVar164 = vmaxss_avx(auVar164,auVar128);
            auVar128 = vshufpd_avx(auVar128,auVar128,1);
            auVar128 = vmaxss_avx(auVar128,auVar164);
            fVar181 = auVar128._0_4_ * 1.9073486e-06;
            local_920._0_4_ = fVar228 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar97,auVar97,0xff);
            lVar88 = 4;
            do {
              fVar238 = auVar354._0_4_;
              fVar195 = 1.0 - fVar238;
              fVar228 = fVar195 * fVar195;
              fVar193 = fVar195 * fVar228;
              fVar229 = fVar238 * fVar238;
              fVar194 = fVar238 * fVar229;
              fVar231 = fVar238 * fVar195;
              local_b00._0_4_ = fVar231;
              auVar128 = vshufps_avx(ZEXT416((uint)(fVar194 * 0.16666667)),
                                     ZEXT416((uint)(fVar194 * 0.16666667)),0);
              auVar164 = ZEXT416((uint)((fVar194 * 4.0 + fVar193 +
                                        fVar238 * fVar231 * 12.0 + fVar195 * fVar231 * 6.0) *
                                       0.16666667));
              auVar164 = vshufps_avx(auVar164,auVar164,0);
              auVar97 = ZEXT416((uint)((fVar193 * 4.0 + fVar194 +
                                       fVar195 * fVar231 * 12.0 + fVar238 * fVar231 * 6.0) *
                                      0.16666667));
              auVar97 = vshufps_avx(auVar97,auVar97,0);
              auVar166 = vshufps_avx(auVar359._0_16_,auVar359._0_16_,0);
              auVar165._0_4_ = auVar166._0_4_ * (float)local_970._0_4_ + 0.0;
              auVar165._4_4_ = auVar166._4_4_ * (float)local_970._4_4_ + 0.0;
              auVar165._8_4_ = auVar166._8_4_ * fStack_968 + 0.0;
              auVar165._12_4_ = auVar166._12_4_ * fStack_964 + 0.0;
              auVar166 = vshufps_avx(ZEXT416((uint)(fVar193 * 0.16666667)),
                                     ZEXT416((uint)(fVar193 * 0.16666667)),0);
              auVar95._0_4_ =
                   auVar166._0_4_ * (float)local_a40._0_4_ +
                   auVar97._0_4_ * (float)local_a60._0_4_ +
                   auVar128._0_4_ * (float)local_a70._0_4_ + auVar164._0_4_ * (float)local_a50._0_4_
              ;
              auVar95._4_4_ =
                   auVar166._4_4_ * (float)local_a40._4_4_ +
                   auVar97._4_4_ * (float)local_a60._4_4_ +
                   auVar128._4_4_ * (float)local_a70._4_4_ + auVar164._4_4_ * (float)local_a50._4_4_
              ;
              auVar95._8_4_ =
                   auVar166._8_4_ * fStack_a38 +
                   auVar97._8_4_ * fStack_a58 +
                   auVar128._8_4_ * fStack_a68 + auVar164._8_4_ * fStack_a48;
              auVar95._12_4_ =
                   auVar166._12_4_ * fStack_a34 +
                   auVar97._12_4_ * fStack_a54 +
                   auVar128._12_4_ * fStack_a64 + auVar164._12_4_ * fStack_a44;
              local_960._0_16_ = auVar95;
              auVar128 = vsubps_avx(auVar165,auVar95);
              _local_9e0 = auVar128;
              auVar128 = vdpps_avx(auVar128,auVar128,0x7f);
              fVar193 = auVar128._0_4_;
              local_ba0 = auVar359._0_4_;
              if (fVar193 < 0.0) {
                local_aa0._0_16_ = ZEXT416((uint)fVar195);
                local_ac0._0_4_ = fVar229;
                local_ae0._0_4_ = fVar228;
                fVar194 = sqrtf(fVar193);
                fVar228 = (float)local_ae0._0_4_;
                fVar229 = (float)local_ac0._0_4_;
                auVar164 = local_aa0._0_16_;
              }
              else {
                auVar164 = vsqrtss_avx(auVar128,auVar128);
                fVar194 = auVar164._0_4_;
                auVar164 = ZEXT416((uint)fVar195);
              }
              fVar231 = auVar164._0_4_;
              auVar97 = vshufps_avx(ZEXT416((uint)(fVar229 * 0.5)),ZEXT416((uint)(fVar229 * 0.5)),0)
              ;
              auVar166 = ZEXT416((uint)((fVar228 + (float)local_b00._0_4_ * 4.0) * 0.5));
              auVar166 = vshufps_avx(auVar166,auVar166,0);
              auVar129 = ZEXT416((uint)((fVar238 * -fVar238 - (float)local_b00._0_4_ * 4.0) * 0.5));
              auVar129 = vshufps_avx(auVar129,auVar129,0);
              auVar96 = ZEXT416((uint)(fVar231 * -fVar231 * 0.5));
              auVar96 = vshufps_avx(auVar96,auVar96,0);
              auVar344._0_4_ =
                   (float)local_a40._0_4_ * auVar96._0_4_ +
                   (float)local_a60._0_4_ * auVar129._0_4_ +
                   (float)local_a70._0_4_ * auVar97._0_4_ + (float)local_a50._0_4_ * auVar166._0_4_;
              auVar344._4_4_ =
                   (float)local_a40._4_4_ * auVar96._4_4_ +
                   (float)local_a60._4_4_ * auVar129._4_4_ +
                   (float)local_a70._4_4_ * auVar97._4_4_ + (float)local_a50._4_4_ * auVar166._4_4_;
              auVar344._8_4_ =
                   fStack_a38 * auVar96._8_4_ +
                   fStack_a58 * auVar129._8_4_ +
                   fStack_a68 * auVar97._8_4_ + fStack_a48 * auVar166._8_4_;
              auVar344._12_4_ =
                   fStack_a34 * auVar96._12_4_ +
                   fStack_a54 * auVar129._12_4_ +
                   fStack_a64 * auVar97._12_4_ + fStack_a44 * auVar166._12_4_;
              auVar166 = vshufps_avx(auVar354._0_16_,auVar354._0_16_,0);
              auVar97 = ZEXT416((uint)(fVar231 - (fVar238 + fVar238)));
              auVar129 = vshufps_avx(auVar97,auVar97,0);
              auVar97 = ZEXT416((uint)(fVar238 - (fVar231 + fVar231)));
              auVar96 = vshufps_avx(auVar97,auVar97,0);
              auVar164 = vshufps_avx(auVar164,auVar164,0);
              auVar97 = vdpps_avx(auVar344,auVar344,0x7f);
              auVar130._0_4_ =
                   (float)local_a40._0_4_ * auVar164._0_4_ +
                   (float)local_a60._0_4_ * auVar96._0_4_ +
                   (float)local_a70._0_4_ * auVar166._0_4_ + (float)local_a50._0_4_ * auVar129._0_4_
              ;
              auVar130._4_4_ =
                   (float)local_a40._4_4_ * auVar164._4_4_ +
                   (float)local_a60._4_4_ * auVar96._4_4_ +
                   (float)local_a70._4_4_ * auVar166._4_4_ + (float)local_a50._4_4_ * auVar129._4_4_
              ;
              auVar130._8_4_ =
                   fStack_a38 * auVar164._8_4_ +
                   fStack_a58 * auVar96._8_4_ +
                   fStack_a68 * auVar166._8_4_ + fStack_a48 * auVar129._8_4_;
              auVar130._12_4_ =
                   fStack_a34 * auVar164._12_4_ +
                   fStack_a54 * auVar96._12_4_ +
                   fStack_a64 * auVar166._12_4_ + fStack_a44 * auVar129._12_4_;
              auVar164 = vblendps_avx(auVar97,_DAT_01feba10,0xe);
              auVar166 = vrsqrtss_avx(auVar164,auVar164);
              fVar229 = auVar166._0_4_;
              fVar228 = auVar97._0_4_;
              auVar166 = vdpps_avx(auVar344,auVar130,0x7f);
              auVar129 = vshufps_avx(auVar97,auVar97,0);
              auVar131._0_4_ = auVar130._0_4_ * auVar129._0_4_;
              auVar131._4_4_ = auVar130._4_4_ * auVar129._4_4_;
              auVar131._8_4_ = auVar130._8_4_ * auVar129._8_4_;
              auVar131._12_4_ = auVar130._12_4_ * auVar129._12_4_;
              auVar166 = vshufps_avx(auVar166,auVar166,0);
              auVar199._0_4_ = auVar344._0_4_ * auVar166._0_4_;
              auVar199._4_4_ = auVar344._4_4_ * auVar166._4_4_;
              auVar199._8_4_ = auVar344._8_4_ * auVar166._8_4_;
              auVar199._12_4_ = auVar344._12_4_ * auVar166._12_4_;
              auVar96 = vsubps_avx(auVar131,auVar199);
              auVar166 = vrcpss_avx(auVar164,auVar164);
              auVar164 = vmaxss_avx(ZEXT416((uint)fVar181),
                                    ZEXT416((uint)(local_ba0 * (float)local_920._0_4_)));
              auVar370 = ZEXT1664(auVar164);
              auVar166 = ZEXT416((uint)(auVar166._0_4_ * (2.0 - fVar228 * auVar166._0_4_)));
              auVar166 = vshufps_avx(auVar166,auVar166,0);
              uVar87 = CONCAT44(auVar344._4_4_,auVar344._0_4_);
              auVar214._0_8_ = uVar87 ^ 0x8000000080000000;
              auVar214._8_4_ = -auVar344._8_4_;
              auVar214._12_4_ = -auVar344._12_4_;
              auVar129 = ZEXT416((uint)(fVar229 * 1.5 + fVar228 * -0.5 * fVar229 * fVar229 * fVar229
                                       ));
              auVar129 = vshufps_avx(auVar129,auVar129,0);
              auVar184._0_4_ = auVar129._0_4_ * auVar96._0_4_ * auVar166._0_4_;
              auVar184._4_4_ = auVar129._4_4_ * auVar96._4_4_ * auVar166._4_4_;
              auVar184._8_4_ = auVar129._8_4_ * auVar96._8_4_ * auVar166._8_4_;
              auVar184._12_4_ = auVar129._12_4_ * auVar96._12_4_ * auVar166._12_4_;
              auVar242._0_4_ = auVar344._0_4_ * auVar129._0_4_;
              auVar242._4_4_ = auVar344._4_4_ * auVar129._4_4_;
              auVar242._8_4_ = auVar344._8_4_ * auVar129._8_4_;
              auVar242._12_4_ = auVar344._12_4_ * auVar129._12_4_;
              local_b00._0_16_ = auVar344;
              local_aa0._0_4_ = auVar164._0_4_;
              if (fVar228 < 0.0) {
                local_ac0._0_4_ = fVar194;
                local_ae0._0_16_ = auVar214;
                local_9a0._0_16_ = auVar242;
                local_9c0._0_16_ = auVar184;
                fVar228 = sqrtf(fVar228);
                auVar370 = ZEXT464((uint)local_aa0._0_4_);
                auVar184 = local_9c0._0_16_;
                auVar214 = local_ae0._0_16_;
                auVar242 = local_9a0._0_16_;
                fVar194 = (float)local_ac0._0_4_;
              }
              else {
                auVar164 = vsqrtss_avx(auVar97,auVar97);
                fVar228 = auVar164._0_4_;
              }
              auVar164 = vdpps_avx(_local_9e0,auVar242,0x7f);
              fVar228 = (fVar181 / fVar228) * (fVar194 + 1.0) + auVar370._0_4_ + fVar194 * fVar181;
              auVar97 = vdpps_avx(auVar214,auVar242,0x7f);
              auVar166 = vdpps_avx(_local_9e0,auVar184,0x7f);
              auVar129 = vdpps_avx(_local_970,auVar242,0x7f);
              auVar96 = vdpps_avx(_local_9e0,auVar214,0x7f);
              fVar229 = auVar97._0_4_ + auVar166._0_4_;
              fVar194 = auVar164._0_4_;
              auVar98._0_4_ = fVar194 * fVar194;
              auVar98._4_4_ = auVar164._4_4_ * auVar164._4_4_;
              auVar98._8_4_ = auVar164._8_4_ * auVar164._8_4_;
              auVar98._12_4_ = auVar164._12_4_ * auVar164._12_4_;
              auVar166 = vsubps_avx(auVar128,auVar98);
              auVar97 = vdpps_avx(_local_9e0,_local_970,0x7f);
              fVar231 = auVar96._0_4_ - fVar194 * fVar229;
              fVar195 = auVar97._0_4_ - fVar194 * auVar129._0_4_;
              auVar97 = vrsqrtss_avx(auVar166,auVar166);
              fVar251 = auVar166._0_4_;
              fVar194 = auVar97._0_4_;
              fVar194 = fVar194 * 1.5 + fVar251 * -0.5 * fVar194 * fVar194 * fVar194;
              if (fVar251 < 0.0) {
                local_ac0._0_16_ = auVar164;
                local_ae0._0_4_ = fVar228;
                local_9a0._0_16_ = ZEXT416((uint)fVar229);
                local_9c0._0_16_ = auVar129;
                local_780._0_4_ = fVar231;
                local_7a0._0_4_ = fVar195;
                local_7c0._0_4_ = fVar194;
                fVar251 = sqrtf(fVar251);
                auVar370 = ZEXT464((uint)local_aa0._0_4_);
                fVar194 = (float)local_7c0._0_4_;
                fVar231 = (float)local_780._0_4_;
                fVar195 = (float)local_7a0._0_4_;
                auVar129 = local_9c0._0_16_;
                fVar228 = (float)local_ae0._0_4_;
                auVar164 = local_ac0._0_16_;
                auVar97 = local_9a0._0_16_;
              }
              else {
                auVar97 = vsqrtss_avx(auVar166,auVar166);
                fVar251 = auVar97._0_4_;
                auVar97 = ZEXT416((uint)fVar229);
              }
              auVar347 = ZEXT1664(local_b00._0_16_);
              auVar93 = vpermilps_avx(local_960._0_16_,0xff);
              auVar92 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
              fVar229 = fVar231 * fVar194 - auVar92._0_4_;
              auVar200._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
              auVar200._8_4_ = auVar129._8_4_ ^ 0x80000000;
              auVar200._12_4_ = auVar129._12_4_ ^ 0x80000000;
              auVar215._0_4_ = -fVar229;
              auVar215._4_4_ = 0x80000000;
              auVar215._8_4_ = 0x80000000;
              auVar215._12_4_ = 0x80000000;
              auVar166 = vinsertps_avx(ZEXT416((uint)(fVar195 * fVar194)),auVar200,0x10);
              auVar96 = vmovsldup_avx(ZEXT416((uint)(auVar97._0_4_ * fVar195 * fVar194 -
                                                    auVar129._0_4_ * fVar229)));
              auVar166 = vdivps_avx(auVar166,auVar96);
              auVar93 = ZEXT416((uint)(fVar251 - auVar93._0_4_));
              auVar129 = vinsertps_avx(auVar164,auVar93,0x10);
              auVar185._0_4_ = auVar129._0_4_ * auVar166._0_4_;
              auVar185._4_4_ = auVar129._4_4_ * auVar166._4_4_;
              auVar185._8_4_ = auVar129._8_4_ * auVar166._8_4_;
              auVar185._12_4_ = auVar129._12_4_ * auVar166._12_4_;
              auVar97 = vinsertps_avx(auVar215,auVar97,0x1c);
              auVar97 = vdivps_avx(auVar97,auVar96);
              auVar167._0_4_ = auVar129._0_4_ * auVar97._0_4_;
              auVar167._4_4_ = auVar129._4_4_ * auVar97._4_4_;
              auVar167._8_4_ = auVar129._8_4_ * auVar97._8_4_;
              auVar167._12_4_ = auVar129._12_4_ * auVar97._12_4_;
              auVar97 = vhaddps_avx(auVar185,auVar185);
              auVar166 = vhaddps_avx(auVar167,auVar167);
              fVar238 = fVar238 - auVar97._0_4_;
              local_ba0 = local_ba0 - auVar166._0_4_;
              auVar359 = ZEXT464((uint)local_ba0);
              auVar201._8_4_ = 0x7fffffff;
              auVar201._0_8_ = 0x7fffffff7fffffff;
              auVar201._12_4_ = 0x7fffffff;
              auVar227 = ZEXT1664(auVar201);
              auVar164 = vandps_avx(auVar164,auVar201);
              if (fVar228 <= auVar164._0_4_) {
LAB_00f9ac82:
                bVar65 = false;
              }
              else {
                auVar164 = vandps_avx(auVar93,auVar201);
                if ((float)local_7e0._0_4_ * 1.9073486e-06 + auVar370._0_4_ + fVar228 <=
                    auVar164._0_4_) goto LAB_00f9ac82;
                local_ba0 = local_ba0 + (float)local_900._0_4_;
                auVar359 = ZEXT464((uint)local_ba0);
                bVar65 = true;
                if (((fVar210 <= local_ba0) &&
                    (fVar228 = *(float *)(ray + k * 4 + 0x80), local_ba0 <= fVar228)) &&
                   ((0.0 <= fVar238 && (fVar238 <= 1.0)))) {
                  auVar128 = vrsqrtss_avx(auVar128,auVar128);
                  fVar229 = auVar128._0_4_;
                  pGVar5 = (context->scene->geometries).items[uVar83].ptr;
                  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar128 = ZEXT416((uint)(fVar229 * 1.5 +
                                             fVar193 * -0.5 * fVar229 * fVar229 * fVar229));
                    auVar128 = vshufps_avx(auVar128,auVar128,0);
                    auVar132._0_4_ = auVar128._0_4_ * (float)local_9e0._0_4_;
                    auVar132._4_4_ = auVar128._4_4_ * (float)local_9e0._4_4_;
                    auVar132._8_4_ = auVar128._8_4_ * fStack_9d8;
                    auVar132._12_4_ = auVar128._12_4_ * fStack_9d4;
                    auVar99._0_4_ = local_b00._0_4_ + auVar92._0_4_ * auVar132._0_4_;
                    auVar99._4_4_ = local_b00._4_4_ + auVar92._4_4_ * auVar132._4_4_;
                    auVar99._8_4_ = local_b00._8_4_ + auVar92._8_4_ * auVar132._8_4_;
                    auVar99._12_4_ = local_b00._12_4_ + auVar92._12_4_ * auVar132._12_4_;
                    auVar128 = vshufps_avx(auVar132,auVar132,0xc9);
                    auVar164 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                    auVar133._0_4_ = auVar164._0_4_ * auVar132._0_4_;
                    auVar133._4_4_ = auVar164._4_4_ * auVar132._4_4_;
                    auVar133._8_4_ = auVar164._8_4_ * auVar132._8_4_;
                    auVar133._12_4_ = auVar164._12_4_ * auVar132._12_4_;
                    auVar168._0_4_ = local_b00._0_4_ * auVar128._0_4_;
                    auVar168._4_4_ = local_b00._4_4_ * auVar128._4_4_;
                    auVar168._8_4_ = local_b00._8_4_ * auVar128._8_4_;
                    auVar168._12_4_ = local_b00._12_4_ * auVar128._12_4_;
                    auVar97 = vsubps_avx(auVar168,auVar133);
                    auVar128 = vshufps_avx(auVar97,auVar97,0xc9);
                    auVar164 = vshufps_avx(auVar99,auVar99,0xc9);
                    auVar169._0_4_ = auVar164._0_4_ * auVar128._0_4_;
                    auVar169._4_4_ = auVar164._4_4_ * auVar128._4_4_;
                    auVar169._8_4_ = auVar164._8_4_ * auVar128._8_4_;
                    auVar169._12_4_ = auVar164._12_4_ * auVar128._12_4_;
                    auVar128 = vshufps_avx(auVar97,auVar97,0xd2);
                    auVar100._0_4_ = auVar99._0_4_ * auVar128._0_4_;
                    auVar100._4_4_ = auVar99._4_4_ * auVar128._4_4_;
                    auVar100._8_4_ = auVar99._8_4_ * auVar128._8_4_;
                    auVar100._12_4_ = auVar99._12_4_ * auVar128._12_4_;
                    auVar128 = vsubps_avx(auVar169,auVar100);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = local_ba0;
                      uVar1 = vextractps_avx(auVar128,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                      uVar1 = vextractps_avx(auVar128,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                      *(int *)(ray + k * 4 + 0xe0) = auVar128._0_4_;
                      *(float *)(ray + k * 4 + 0xf0) = fVar238;
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_b10;
                      *(uint *)(ray + k * 4 + 0x120) = uVar83;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      local_710 = vshufps_avx(ZEXT416((uint)fVar238),ZEXT416((uint)fVar238),0);
                      local_740 = (RTCHitN  [16])vshufps_avx(auVar128,auVar128,0x55);
                      auVar164 = vshufps_avx(auVar128,auVar128,0xaa);
                      local_720 = vshufps_avx(auVar128,auVar128,0);
                      auStack_730 = auVar164;
                      local_700 = ZEXT816(0) << 0x20;
                      local_6f0 = local_760._0_8_;
                      uStack_6e8 = local_760._8_8_;
                      local_6e0 = local_750._0_8_;
                      uStack_6d8 = local_750._8_8_;
                      uVar4 = context->user->instID[0];
                      _local_6d0 = CONCAT44(uVar4,uVar4);
                      _uStack_6c8 = CONCAT44(uVar4,uVar4);
                      uVar4 = context->user->instPrimID[0];
                      _uStack_6c0 = CONCAT44(uVar4,uVar4);
                      _uStack_6b8 = CONCAT44(uVar4,uVar4);
                      *(float *)(ray + k * 4 + 0x80) = local_ba0;
                      local_b20 = *local_9e8;
                      uStack_b18 = local_9e8[1];
                      local_a30.valid = (int *)&local_b20;
                      local_a30.geometryUserPtr = pGVar5->userPtr;
                      local_a30.context = context->user;
                      local_a30.hit = local_740;
                      local_a30.N = 4;
                      local_a30.ray = (RTCRayN *)ray;
                      if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar347 = ZEXT1664(local_b00._0_16_);
                        auVar370 = ZEXT1664(auVar370._0_16_);
                        (*pGVar5->intersectionFilterN)(&local_a30);
                      }
                      auVar77._8_8_ = uStack_b18;
                      auVar77._0_8_ = local_b20;
                      if (auVar77 == (undefined1  [16])0x0) {
                        auVar128 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar128 = auVar128 ^ _DAT_01febe20;
                        auVar227 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      }
                      else {
                        p_Var6 = context->args->filter;
                        auVar227 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar347 = ZEXT1664(auVar347._0_16_);
                          auVar370 = ZEXT1664(auVar370._0_16_);
                          (*p_Var6)(&local_a30);
                          auVar227 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar78._8_8_ = uStack_b18;
                        auVar78._0_8_ = local_b20;
                        auVar97 = vpcmpeqd_avx(auVar78,_DAT_01feba10);
                        auVar164 = vpcmpeqd_avx(auVar164,auVar164);
                        auVar128 = auVar97 ^ auVar164;
                        if (auVar78 != (undefined1  [16])0x0) {
                          auVar97 = auVar97 ^ auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])local_a30.hit);
                          *(undefined1 (*) [16])(local_a30.ray + 0xc0) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x10));
                          *(undefined1 (*) [16])(local_a30.ray + 0xd0) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x20));
                          *(undefined1 (*) [16])(local_a30.ray + 0xe0) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x30));
                          *(undefined1 (*) [16])(local_a30.ray + 0xf0) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x40));
                          *(undefined1 (*) [16])(local_a30.ray + 0x100) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x50));
                          *(undefined1 (*) [16])(local_a30.ray + 0x110) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x60));
                          *(undefined1 (*) [16])(local_a30.ray + 0x120) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x70));
                          *(undefined1 (*) [16])(local_a30.ray + 0x130) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x80));
                          *(undefined1 (*) [16])(local_a30.ray + 0x140) = auVar164;
                        }
                      }
                      auVar359 = ZEXT464((uint)local_ba0);
                      auVar134._8_8_ = 0x100000001;
                      auVar134._0_8_ = 0x100000001;
                      if ((auVar134 & auVar128) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar228;
                      }
                    }
                  }
                }
              }
              auVar106 = local_620;
              auVar354 = ZEXT464((uint)fVar238);
              bVar89 = lVar88 != 0;
              lVar88 = lVar88 + -1;
            } while ((!bVar65) && (bVar89));
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar111._4_4_ = uVar1;
            auVar111._0_4_ = uVar1;
            auVar111._8_4_ = uVar1;
            auVar111._12_4_ = uVar1;
            auVar111._16_4_ = uVar1;
            auVar111._20_4_ = uVar1;
            auVar111._24_4_ = uVar1;
            auVar111._28_4_ = uVar1;
            auVar107 = vcmpps_avx(_local_880,auVar111,2);
            local_620 = vandps_avx(auVar107,local_620);
            auVar106 = auVar106 & auVar107;
            uVar87 = local_660._0_8_;
          } while ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar106 >> 0x7f,0) != '\0') ||
                     (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar106 >> 0xbf,0) != '\0') ||
                   (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar106[0x1f] < '\0');
        }
        auVar112._0_4_ =
             (float)local_8c0._0_4_ * (float)local_800._0_4_ +
             (float)local_8e0._0_4_ * (float)local_820._0_4_ +
             (float)local_680._0_4_ * (float)local_840._0_4_;
        auVar112._4_4_ =
             (float)local_8c0._4_4_ * (float)local_800._4_4_ +
             (float)local_8e0._4_4_ * (float)local_820._4_4_ +
             (float)local_680._4_4_ * (float)local_840._4_4_;
        auVar112._8_4_ = fStack_8b8 * fStack_7f8 + fStack_8d8 * fStack_818 + fStack_678 * fStack_838
        ;
        auVar112._12_4_ =
             fStack_8b4 * fStack_7f4 + fStack_8d4 * fStack_814 + fStack_674 * fStack_834;
        auVar112._16_4_ =
             fStack_8b0 * fStack_7f0 + fStack_8d0 * fStack_810 + fStack_670 * fStack_830;
        auVar112._20_4_ =
             fStack_8ac * fStack_7ec + fStack_8cc * fStack_80c + fStack_66c * fStack_82c;
        auVar112._24_4_ =
             fStack_8a8 * fStack_7e8 + fStack_8c8 * fStack_808 + fStack_668 * fStack_828;
        auVar112._28_4_ = fStack_8a4 + fStack_8c4 + fStack_664;
        auVar151._8_4_ = 0x7fffffff;
        auVar151._0_8_ = 0x7fffffff7fffffff;
        auVar151._12_4_ = 0x7fffffff;
        auVar151._16_4_ = 0x7fffffff;
        auVar151._20_4_ = 0x7fffffff;
        auVar151._24_4_ = 0x7fffffff;
        auVar151._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(auVar112,auVar151);
        auVar152._8_4_ = 0x3e99999a;
        auVar152._0_8_ = 0x3e99999a3e99999a;
        auVar152._12_4_ = 0x3e99999a;
        auVar152._16_4_ = 0x3e99999a;
        auVar152._20_4_ = 0x3e99999a;
        auVar152._24_4_ = 0x3e99999a;
        auVar152._28_4_ = 0x3e99999a;
        auVar106 = vcmpps_avx(auVar106,auVar152,1);
        auVar107 = vorps_avx(auVar106,local_600);
        auVar153._0_4_ = local_860._0_4_ + (float)local_940._0_4_;
        auVar153._4_4_ = local_860._4_4_ + (float)local_940._4_4_;
        auVar153._8_4_ = local_860._8_4_ + fStack_938;
        auVar153._12_4_ = local_860._12_4_ + fStack_934;
        auVar153._16_4_ = local_860._16_4_ + fStack_930;
        auVar153._20_4_ = local_860._20_4_ + fStack_92c;
        auVar153._24_4_ = local_860._24_4_ + fStack_928;
        auVar153._28_4_ = local_860._28_4_ + fStack_924;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar178._4_4_ = uVar1;
        auVar178._0_4_ = uVar1;
        auVar178._8_4_ = uVar1;
        auVar178._12_4_ = uVar1;
        auVar178._16_4_ = uVar1;
        auVar178._20_4_ = uVar1;
        auVar178._24_4_ = uVar1;
        auVar178._28_4_ = uVar1;
        auVar106 = vcmpps_avx(auVar153,auVar178,2);
        _local_8c0 = vandps_avx(auVar106,local_5c0);
        auVar154._8_4_ = 3;
        auVar154._0_8_ = 0x300000003;
        auVar154._12_4_ = 3;
        auVar154._16_4_ = 3;
        auVar154._20_4_ = 3;
        auVar154._24_4_ = 3;
        auVar154._28_4_ = 3;
        auVar179._8_4_ = 2;
        auVar179._0_8_ = 0x200000002;
        auVar179._12_4_ = 2;
        auVar179._16_4_ = 2;
        auVar179._20_4_ = 2;
        auVar179._24_4_ = 2;
        auVar179._28_4_ = 2;
        auVar106 = vblendvps_avx(auVar179,auVar154,auVar107);
        auVar128 = vpcmpgtd_avx(auVar106._16_16_,local_6a0._0_16_);
        auVar164 = vpshufd_avx(local_5e0._0_16_,0);
        auVar164 = vpcmpgtd_avx(auVar106._0_16_,auVar164);
        auVar155._16_16_ = auVar128;
        auVar155._0_16_ = auVar164;
        _local_8e0 = vblendps_avx(ZEXT1632(auVar164),auVar155,0xf0);
        local_640 = vandnps_avx(_local_8e0,_local_8c0);
        auVar106 = _local_8c0 & ~_local_8e0;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0x7f,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0xbf,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar106[0x1f] < '\0') {
          local_860 = _local_300;
          local_880._4_4_ = (float)local_300._4_4_ + (float)local_940._4_4_;
          local_880._0_4_ = (float)local_300._0_4_ + (float)local_940._0_4_;
          fStack_878 = fStack_2f8 + fStack_938;
          fStack_874 = fStack_2f4 + fStack_934;
          fStack_870 = fStack_2f0 + fStack_930;
          fStack_86c = fStack_2ec + fStack_92c;
          fStack_868 = fStack_2e8 + fStack_928;
          fStack_864 = fStack_2e4 + fStack_924;
          do {
            auVar202 = auVar227._0_16_;
            auVar156._8_4_ = 0x7f800000;
            auVar156._0_8_ = 0x7f8000007f800000;
            auVar156._12_4_ = 0x7f800000;
            auVar156._16_4_ = 0x7f800000;
            auVar156._20_4_ = 0x7f800000;
            auVar156._24_4_ = 0x7f800000;
            auVar156._28_4_ = 0x7f800000;
            auVar106 = vblendvps_avx(auVar156,local_860,local_640);
            auVar107 = vshufps_avx(auVar106,auVar106,0xb1);
            auVar107 = vminps_avx(auVar106,auVar107);
            auVar141 = vshufpd_avx(auVar107,auVar107,5);
            auVar107 = vminps_avx(auVar107,auVar141);
            auVar141 = vperm2f128_avx(auVar107,auVar107,1);
            auVar107 = vminps_avx(auVar107,auVar141);
            auVar107 = vcmpps_avx(auVar106,auVar107,0);
            auVar141 = local_640 & auVar107;
            auVar106 = local_640;
            if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar141 >> 0x7f,0) != '\0') ||
                  (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar141 >> 0xbf,0) != '\0') ||
                (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar141[0x1f] < '\0') {
              auVar106 = vandps_avx(auVar107,local_640);
            }
            uVar86 = vmovmskps_avx(auVar106);
            uVar4 = 0;
            if (uVar86 != 0) {
              for (; (uVar86 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            uVar87 = (ulong)uVar4;
            *(undefined4 *)(local_640 + uVar87 * 4) = 0;
            fVar181 = local_560[uVar87];
            uVar4 = *(uint *)(local_2e0 + uVar87 * 4);
            fVar228 = local_b08;
            if ((float)local_980._0_4_ < 0.0) {
              fVar228 = sqrtf((float)local_980._0_4_);
              auVar202._8_4_ = 0x7fffffff;
              auVar202._0_8_ = 0x7fffffff7fffffff;
              auVar202._12_4_ = 0x7fffffff;
            }
            auVar359 = ZEXT464(uVar4);
            auVar354 = ZEXT464((uint)fVar181);
            auVar164 = vminps_avx(_local_a40,_local_a60);
            auVar128 = vmaxps_avx(_local_a40,_local_a60);
            auVar97 = vminps_avx(_local_a50,_local_a70);
            auVar166 = vminps_avx(auVar164,auVar97);
            auVar164 = vmaxps_avx(_local_a50,_local_a70);
            auVar97 = vmaxps_avx(auVar128,auVar164);
            auVar128 = vandps_avx(auVar166,auVar202);
            auVar164 = vandps_avx(auVar97,auVar202);
            auVar128 = vmaxps_avx(auVar128,auVar164);
            auVar164 = vmovshdup_avx(auVar128);
            auVar164 = vmaxss_avx(auVar164,auVar128);
            auVar128 = vshufpd_avx(auVar128,auVar128,1);
            auVar128 = vmaxss_avx(auVar128,auVar164);
            fVar181 = auVar128._0_4_ * 1.9073486e-06;
            local_920._0_4_ = fVar228 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar97,auVar97,0xff);
            lVar88 = 4;
            do {
              fVar238 = auVar354._0_4_;
              fVar195 = 1.0 - fVar238;
              fVar228 = fVar195 * fVar195;
              fVar193 = fVar195 * fVar228;
              fVar229 = fVar238 * fVar238;
              fVar194 = fVar238 * fVar229;
              fVar231 = fVar238 * fVar195;
              local_b00._0_4_ = fVar231;
              auVar128 = vshufps_avx(ZEXT416((uint)(fVar194 * 0.16666667)),
                                     ZEXT416((uint)(fVar194 * 0.16666667)),0);
              auVar164 = ZEXT416((uint)((fVar194 * 4.0 + fVar193 +
                                        fVar238 * fVar231 * 12.0 + fVar195 * fVar231 * 6.0) *
                                       0.16666667));
              auVar164 = vshufps_avx(auVar164,auVar164,0);
              auVar97 = ZEXT416((uint)((fVar193 * 4.0 + fVar194 +
                                       fVar195 * fVar231 * 12.0 + fVar238 * fVar231 * 6.0) *
                                      0.16666667));
              auVar97 = vshufps_avx(auVar97,auVar97,0);
              auVar166 = vshufps_avx(auVar359._0_16_,auVar359._0_16_,0);
              auVar170._0_4_ = auVar166._0_4_ * (float)local_970._0_4_ + 0.0;
              auVar170._4_4_ = auVar166._4_4_ * (float)local_970._4_4_ + 0.0;
              auVar170._8_4_ = auVar166._8_4_ * fStack_968 + 0.0;
              auVar170._12_4_ = auVar166._12_4_ * fStack_964 + 0.0;
              auVar166 = vshufps_avx(ZEXT416((uint)(fVar193 * 0.16666667)),
                                     ZEXT416((uint)(fVar193 * 0.16666667)),0);
              auVar101._0_4_ =
                   auVar166._0_4_ * (float)local_a40._0_4_ +
                   auVar97._0_4_ * (float)local_a60._0_4_ +
                   auVar128._0_4_ * (float)local_a70._0_4_ + auVar164._0_4_ * (float)local_a50._0_4_
              ;
              auVar101._4_4_ =
                   auVar166._4_4_ * (float)local_a40._4_4_ +
                   auVar97._4_4_ * (float)local_a60._4_4_ +
                   auVar128._4_4_ * (float)local_a70._4_4_ + auVar164._4_4_ * (float)local_a50._4_4_
              ;
              auVar101._8_4_ =
                   auVar166._8_4_ * fStack_a38 +
                   auVar97._8_4_ * fStack_a58 +
                   auVar128._8_4_ * fStack_a68 + auVar164._8_4_ * fStack_a48;
              auVar101._12_4_ =
                   auVar166._12_4_ * fStack_a34 +
                   auVar97._12_4_ * fStack_a54 +
                   auVar128._12_4_ * fStack_a64 + auVar164._12_4_ * fStack_a44;
              local_960._0_16_ = auVar101;
              auVar128 = vsubps_avx(auVar170,auVar101);
              _local_9e0 = auVar128;
              auVar128 = vdpps_avx(auVar128,auVar128,0x7f);
              fVar193 = auVar128._0_4_;
              local_ba0 = auVar359._0_4_;
              if (fVar193 < 0.0) {
                local_aa0._0_16_ = ZEXT416((uint)fVar195);
                local_ac0._0_4_ = fVar229;
                local_ae0._0_4_ = fVar228;
                fVar194 = sqrtf(fVar193);
                fVar228 = (float)local_ae0._0_4_;
                fVar229 = (float)local_ac0._0_4_;
                auVar164 = local_aa0._0_16_;
              }
              else {
                auVar164 = vsqrtss_avx(auVar128,auVar128);
                fVar194 = auVar164._0_4_;
                auVar164 = ZEXT416((uint)fVar195);
              }
              fVar231 = auVar164._0_4_;
              auVar97 = vshufps_avx(ZEXT416((uint)(fVar229 * 0.5)),ZEXT416((uint)(fVar229 * 0.5)),0)
              ;
              auVar166 = ZEXT416((uint)((fVar228 + (float)local_b00._0_4_ * 4.0) * 0.5));
              auVar166 = vshufps_avx(auVar166,auVar166,0);
              auVar129 = ZEXT416((uint)((fVar238 * -fVar238 - (float)local_b00._0_4_ * 4.0) * 0.5));
              auVar129 = vshufps_avx(auVar129,auVar129,0);
              auVar96 = ZEXT416((uint)(fVar231 * -fVar231 * 0.5));
              auVar96 = vshufps_avx(auVar96,auVar96,0);
              auVar345._0_4_ =
                   (float)local_a40._0_4_ * auVar96._0_4_ +
                   (float)local_a60._0_4_ * auVar129._0_4_ +
                   (float)local_a70._0_4_ * auVar97._0_4_ + (float)local_a50._0_4_ * auVar166._0_4_;
              auVar345._4_4_ =
                   (float)local_a40._4_4_ * auVar96._4_4_ +
                   (float)local_a60._4_4_ * auVar129._4_4_ +
                   (float)local_a70._4_4_ * auVar97._4_4_ + (float)local_a50._4_4_ * auVar166._4_4_;
              auVar345._8_4_ =
                   fStack_a38 * auVar96._8_4_ +
                   fStack_a58 * auVar129._8_4_ +
                   fStack_a68 * auVar97._8_4_ + fStack_a48 * auVar166._8_4_;
              auVar345._12_4_ =
                   fStack_a34 * auVar96._12_4_ +
                   fStack_a54 * auVar129._12_4_ +
                   fStack_a64 * auVar97._12_4_ + fStack_a44 * auVar166._12_4_;
              auVar166 = vshufps_avx(auVar354._0_16_,auVar354._0_16_,0);
              auVar97 = ZEXT416((uint)(fVar231 - (fVar238 + fVar238)));
              auVar129 = vshufps_avx(auVar97,auVar97,0);
              auVar97 = ZEXT416((uint)(fVar238 - (fVar231 + fVar231)));
              auVar96 = vshufps_avx(auVar97,auVar97,0);
              auVar164 = vshufps_avx(auVar164,auVar164,0);
              auVar97 = vdpps_avx(auVar345,auVar345,0x7f);
              auVar135._0_4_ =
                   (float)local_a40._0_4_ * auVar164._0_4_ +
                   (float)local_a60._0_4_ * auVar96._0_4_ +
                   (float)local_a70._0_4_ * auVar166._0_4_ + (float)local_a50._0_4_ * auVar129._0_4_
              ;
              auVar135._4_4_ =
                   (float)local_a40._4_4_ * auVar164._4_4_ +
                   (float)local_a60._4_4_ * auVar96._4_4_ +
                   (float)local_a70._4_4_ * auVar166._4_4_ + (float)local_a50._4_4_ * auVar129._4_4_
              ;
              auVar135._8_4_ =
                   fStack_a38 * auVar164._8_4_ +
                   fStack_a58 * auVar96._8_4_ +
                   fStack_a68 * auVar166._8_4_ + fStack_a48 * auVar129._8_4_;
              auVar135._12_4_ =
                   fStack_a34 * auVar164._12_4_ +
                   fStack_a54 * auVar96._12_4_ +
                   fStack_a64 * auVar166._12_4_ + fStack_a44 * auVar129._12_4_;
              auVar164 = vblendps_avx(auVar97,_DAT_01feba10,0xe);
              auVar166 = vrsqrtss_avx(auVar164,auVar164);
              fVar229 = auVar166._0_4_;
              fVar228 = auVar97._0_4_;
              auVar166 = vdpps_avx(auVar345,auVar135,0x7f);
              auVar129 = vshufps_avx(auVar97,auVar97,0);
              auVar136._0_4_ = auVar135._0_4_ * auVar129._0_4_;
              auVar136._4_4_ = auVar135._4_4_ * auVar129._4_4_;
              auVar136._8_4_ = auVar135._8_4_ * auVar129._8_4_;
              auVar136._12_4_ = auVar135._12_4_ * auVar129._12_4_;
              auVar166 = vshufps_avx(auVar166,auVar166,0);
              auVar203._0_4_ = auVar345._0_4_ * auVar166._0_4_;
              auVar203._4_4_ = auVar345._4_4_ * auVar166._4_4_;
              auVar203._8_4_ = auVar345._8_4_ * auVar166._8_4_;
              auVar203._12_4_ = auVar345._12_4_ * auVar166._12_4_;
              auVar96 = vsubps_avx(auVar136,auVar203);
              auVar166 = vrcpss_avx(auVar164,auVar164);
              auVar164 = vmaxss_avx(ZEXT416((uint)fVar181),
                                    ZEXT416((uint)(local_ba0 * (float)local_920._0_4_)));
              auVar370 = ZEXT1664(auVar164);
              auVar166 = ZEXT416((uint)(auVar166._0_4_ * (2.0 - fVar228 * auVar166._0_4_)));
              auVar166 = vshufps_avx(auVar166,auVar166,0);
              uVar87 = CONCAT44(auVar345._4_4_,auVar345._0_4_);
              auVar216._0_8_ = uVar87 ^ 0x8000000080000000;
              auVar216._8_4_ = -auVar345._8_4_;
              auVar216._12_4_ = -auVar345._12_4_;
              auVar129 = ZEXT416((uint)(fVar229 * 1.5 + fVar228 * -0.5 * fVar229 * fVar229 * fVar229
                                       ));
              auVar129 = vshufps_avx(auVar129,auVar129,0);
              auVar186._0_4_ = auVar129._0_4_ * auVar96._0_4_ * auVar166._0_4_;
              auVar186._4_4_ = auVar129._4_4_ * auVar96._4_4_ * auVar166._4_4_;
              auVar186._8_4_ = auVar129._8_4_ * auVar96._8_4_ * auVar166._8_4_;
              auVar186._12_4_ = auVar129._12_4_ * auVar96._12_4_ * auVar166._12_4_;
              auVar243._0_4_ = auVar345._0_4_ * auVar129._0_4_;
              auVar243._4_4_ = auVar345._4_4_ * auVar129._4_4_;
              auVar243._8_4_ = auVar345._8_4_ * auVar129._8_4_;
              auVar243._12_4_ = auVar345._12_4_ * auVar129._12_4_;
              local_b00._0_16_ = auVar345;
              local_aa0._0_4_ = auVar164._0_4_;
              if (fVar228 < 0.0) {
                local_ac0._0_4_ = fVar194;
                local_ae0._0_16_ = auVar216;
                local_9a0._0_16_ = auVar243;
                local_9c0._0_16_ = auVar186;
                fVar228 = sqrtf(fVar228);
                auVar370 = ZEXT464((uint)local_aa0._0_4_);
                auVar186 = local_9c0._0_16_;
                auVar216 = local_ae0._0_16_;
                auVar243 = local_9a0._0_16_;
                fVar194 = (float)local_ac0._0_4_;
              }
              else {
                auVar164 = vsqrtss_avx(auVar97,auVar97);
                fVar228 = auVar164._0_4_;
              }
              auVar164 = vdpps_avx(_local_9e0,auVar243,0x7f);
              fVar228 = (fVar181 / fVar228) * (fVar194 + 1.0) + auVar370._0_4_ + fVar194 * fVar181;
              auVar97 = vdpps_avx(auVar216,auVar243,0x7f);
              auVar166 = vdpps_avx(_local_9e0,auVar186,0x7f);
              auVar129 = vdpps_avx(_local_970,auVar243,0x7f);
              auVar96 = vdpps_avx(_local_9e0,auVar216,0x7f);
              fVar229 = auVar97._0_4_ + auVar166._0_4_;
              fVar194 = auVar164._0_4_;
              auVar102._0_4_ = fVar194 * fVar194;
              auVar102._4_4_ = auVar164._4_4_ * auVar164._4_4_;
              auVar102._8_4_ = auVar164._8_4_ * auVar164._8_4_;
              auVar102._12_4_ = auVar164._12_4_ * auVar164._12_4_;
              auVar166 = vsubps_avx(auVar128,auVar102);
              auVar97 = vdpps_avx(_local_9e0,_local_970,0x7f);
              fVar231 = auVar96._0_4_ - fVar194 * fVar229;
              fVar195 = auVar97._0_4_ - fVar194 * auVar129._0_4_;
              auVar97 = vrsqrtss_avx(auVar166,auVar166);
              fVar251 = auVar166._0_4_;
              fVar194 = auVar97._0_4_;
              fVar194 = fVar194 * 1.5 + fVar251 * -0.5 * fVar194 * fVar194 * fVar194;
              if (fVar251 < 0.0) {
                local_ac0._0_16_ = auVar164;
                local_ae0._0_4_ = fVar228;
                local_9a0._0_16_ = ZEXT416((uint)fVar229);
                local_9c0._0_16_ = auVar129;
                local_780._0_4_ = fVar231;
                local_7a0._0_4_ = fVar195;
                local_7c0._0_4_ = fVar194;
                fVar251 = sqrtf(fVar251);
                auVar370 = ZEXT464((uint)local_aa0._0_4_);
                fVar194 = (float)local_7c0._0_4_;
                fVar231 = (float)local_780._0_4_;
                fVar195 = (float)local_7a0._0_4_;
                auVar129 = local_9c0._0_16_;
                fVar228 = (float)local_ae0._0_4_;
                auVar164 = local_ac0._0_16_;
                auVar97 = local_9a0._0_16_;
              }
              else {
                auVar97 = vsqrtss_avx(auVar166,auVar166);
                fVar251 = auVar97._0_4_;
                auVar97 = ZEXT416((uint)fVar229);
              }
              auVar347 = ZEXT1664(local_b00._0_16_);
              auVar93 = vpermilps_avx(local_960._0_16_,0xff);
              auVar92 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
              fVar229 = fVar231 * fVar194 - auVar92._0_4_;
              auVar204._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
              auVar204._8_4_ = auVar129._8_4_ ^ 0x80000000;
              auVar204._12_4_ = auVar129._12_4_ ^ 0x80000000;
              auVar217._0_4_ = -fVar229;
              auVar217._4_4_ = 0x80000000;
              auVar217._8_4_ = 0x80000000;
              auVar217._12_4_ = 0x80000000;
              auVar166 = vinsertps_avx(ZEXT416((uint)(fVar195 * fVar194)),auVar204,0x10);
              auVar96 = vmovsldup_avx(ZEXT416((uint)(auVar97._0_4_ * fVar195 * fVar194 -
                                                    auVar129._0_4_ * fVar229)));
              auVar166 = vdivps_avx(auVar166,auVar96);
              auVar93 = ZEXT416((uint)(fVar251 - auVar93._0_4_));
              auVar129 = vinsertps_avx(auVar164,auVar93,0x10);
              auVar187._0_4_ = auVar129._0_4_ * auVar166._0_4_;
              auVar187._4_4_ = auVar129._4_4_ * auVar166._4_4_;
              auVar187._8_4_ = auVar129._8_4_ * auVar166._8_4_;
              auVar187._12_4_ = auVar129._12_4_ * auVar166._12_4_;
              auVar97 = vinsertps_avx(auVar217,auVar97,0x1c);
              auVar97 = vdivps_avx(auVar97,auVar96);
              auVar171._0_4_ = auVar129._0_4_ * auVar97._0_4_;
              auVar171._4_4_ = auVar129._4_4_ * auVar97._4_4_;
              auVar171._8_4_ = auVar129._8_4_ * auVar97._8_4_;
              auVar171._12_4_ = auVar129._12_4_ * auVar97._12_4_;
              auVar97 = vhaddps_avx(auVar187,auVar187);
              auVar166 = vhaddps_avx(auVar171,auVar171);
              fVar238 = fVar238 - auVar97._0_4_;
              local_ba0 = local_ba0 - auVar166._0_4_;
              auVar359 = ZEXT464((uint)local_ba0);
              auVar205._8_4_ = 0x7fffffff;
              auVar205._0_8_ = 0x7fffffff7fffffff;
              auVar205._12_4_ = 0x7fffffff;
              auVar227 = ZEXT1664(auVar205);
              auVar164 = vandps_avx(auVar164,auVar205);
              if (fVar228 <= auVar164._0_4_) {
LAB_00f9b930:
                bVar65 = false;
              }
              else {
                auVar164 = vandps_avx(auVar93,auVar205);
                if ((float)local_7e0._0_4_ * 1.9073486e-06 + auVar370._0_4_ + fVar228 <=
                    auVar164._0_4_) goto LAB_00f9b930;
                local_ba0 = local_ba0 + (float)local_900._0_4_;
                auVar359 = ZEXT464((uint)local_ba0);
                bVar65 = true;
                if ((((fVar210 <= local_ba0) &&
                     (fVar228 = *(float *)(ray + k * 4 + 0x80), local_ba0 <= fVar228)) &&
                    (0.0 <= fVar238)) && (fVar238 <= 1.0)) {
                  auVar128 = vrsqrtss_avx(auVar128,auVar128);
                  fVar229 = auVar128._0_4_;
                  pGVar5 = (context->scene->geometries).items[uVar83].ptr;
                  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar128 = ZEXT416((uint)(fVar229 * 1.5 +
                                             fVar193 * -0.5 * fVar229 * fVar229 * fVar229));
                    auVar128 = vshufps_avx(auVar128,auVar128,0);
                    auVar137._0_4_ = auVar128._0_4_ * (float)local_9e0._0_4_;
                    auVar137._4_4_ = auVar128._4_4_ * (float)local_9e0._4_4_;
                    auVar137._8_4_ = auVar128._8_4_ * fStack_9d8;
                    auVar137._12_4_ = auVar128._12_4_ * fStack_9d4;
                    auVar103._0_4_ = local_b00._0_4_ + auVar92._0_4_ * auVar137._0_4_;
                    auVar103._4_4_ = local_b00._4_4_ + auVar92._4_4_ * auVar137._4_4_;
                    auVar103._8_4_ = local_b00._8_4_ + auVar92._8_4_ * auVar137._8_4_;
                    auVar103._12_4_ = local_b00._12_4_ + auVar92._12_4_ * auVar137._12_4_;
                    auVar128 = vshufps_avx(auVar137,auVar137,0xc9);
                    auVar164 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                    auVar138._0_4_ = auVar164._0_4_ * auVar137._0_4_;
                    auVar138._4_4_ = auVar164._4_4_ * auVar137._4_4_;
                    auVar138._8_4_ = auVar164._8_4_ * auVar137._8_4_;
                    auVar138._12_4_ = auVar164._12_4_ * auVar137._12_4_;
                    auVar172._0_4_ = local_b00._0_4_ * auVar128._0_4_;
                    auVar172._4_4_ = local_b00._4_4_ * auVar128._4_4_;
                    auVar172._8_4_ = local_b00._8_4_ * auVar128._8_4_;
                    auVar172._12_4_ = local_b00._12_4_ * auVar128._12_4_;
                    auVar97 = vsubps_avx(auVar172,auVar138);
                    auVar128 = vshufps_avx(auVar97,auVar97,0xc9);
                    auVar164 = vshufps_avx(auVar103,auVar103,0xc9);
                    auVar173._0_4_ = auVar164._0_4_ * auVar128._0_4_;
                    auVar173._4_4_ = auVar164._4_4_ * auVar128._4_4_;
                    auVar173._8_4_ = auVar164._8_4_ * auVar128._8_4_;
                    auVar173._12_4_ = auVar164._12_4_ * auVar128._12_4_;
                    auVar128 = vshufps_avx(auVar97,auVar97,0xd2);
                    auVar104._0_4_ = auVar103._0_4_ * auVar128._0_4_;
                    auVar104._4_4_ = auVar103._4_4_ * auVar128._4_4_;
                    auVar104._8_4_ = auVar103._8_4_ * auVar128._8_4_;
                    auVar104._12_4_ = auVar103._12_4_ * auVar128._12_4_;
                    auVar128 = vsubps_avx(auVar173,auVar104);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = local_ba0;
                      uVar1 = vextractps_avx(auVar128,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                      uVar1 = vextractps_avx(auVar128,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                      *(int *)(ray + k * 4 + 0xe0) = auVar128._0_4_;
                      *(float *)(ray + k * 4 + 0xf0) = fVar238;
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_b10;
                      *(uint *)(ray + k * 4 + 0x120) = uVar83;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      local_710 = vshufps_avx(ZEXT416((uint)fVar238),ZEXT416((uint)fVar238),0);
                      local_740 = (RTCHitN  [16])vshufps_avx(auVar128,auVar128,0x55);
                      auVar164 = vshufps_avx(auVar128,auVar128,0xaa);
                      local_720 = vshufps_avx(auVar128,auVar128,0);
                      auStack_730 = auVar164;
                      local_700 = ZEXT816(0) << 0x20;
                      local_6f0 = local_760._0_8_;
                      uStack_6e8 = local_760._8_8_;
                      local_6e0 = local_750._0_8_;
                      uStack_6d8 = local_750._8_8_;
                      uVar4 = context->user->instID[0];
                      _local_6d0 = CONCAT44(uVar4,uVar4);
                      _uStack_6c8 = CONCAT44(uVar4,uVar4);
                      uVar4 = context->user->instPrimID[0];
                      _uStack_6c0 = CONCAT44(uVar4,uVar4);
                      _uStack_6b8 = CONCAT44(uVar4,uVar4);
                      *(float *)(ray + k * 4 + 0x80) = local_ba0;
                      local_b20 = *local_9e8;
                      uStack_b18 = local_9e8[1];
                      local_a30.valid = (int *)&local_b20;
                      local_a30.geometryUserPtr = pGVar5->userPtr;
                      local_a30.context = context->user;
                      local_a30.hit = local_740;
                      local_a30.N = 4;
                      local_a30.ray = (RTCRayN *)ray;
                      if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar347 = ZEXT1664(local_b00._0_16_);
                        auVar370 = ZEXT1664(auVar370._0_16_);
                        (*pGVar5->intersectionFilterN)(&local_a30);
                      }
                      auVar79._8_8_ = uStack_b18;
                      auVar79._0_8_ = local_b20;
                      if (auVar79 == (undefined1  [16])0x0) {
                        auVar128 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar128 = auVar128 ^ _DAT_01febe20;
                        auVar227 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      }
                      else {
                        p_Var6 = context->args->filter;
                        auVar227 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar347 = ZEXT1664(auVar347._0_16_);
                          auVar370 = ZEXT1664(auVar370._0_16_);
                          (*p_Var6)(&local_a30);
                          auVar227 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar80._8_8_ = uStack_b18;
                        auVar80._0_8_ = local_b20;
                        auVar97 = vpcmpeqd_avx(auVar80,_DAT_01feba10);
                        auVar164 = vpcmpeqd_avx(auVar164,auVar164);
                        auVar128 = auVar97 ^ auVar164;
                        if (auVar80 != (undefined1  [16])0x0) {
                          auVar97 = auVar97 ^ auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])local_a30.hit);
                          *(undefined1 (*) [16])(local_a30.ray + 0xc0) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x10));
                          *(undefined1 (*) [16])(local_a30.ray + 0xd0) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x20));
                          *(undefined1 (*) [16])(local_a30.ray + 0xe0) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x30));
                          *(undefined1 (*) [16])(local_a30.ray + 0xf0) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x40));
                          *(undefined1 (*) [16])(local_a30.ray + 0x100) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x50));
                          *(undefined1 (*) [16])(local_a30.ray + 0x110) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x60));
                          *(undefined1 (*) [16])(local_a30.ray + 0x120) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x70));
                          *(undefined1 (*) [16])(local_a30.ray + 0x130) = auVar164;
                          auVar164 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                             (local_a30.hit + 0x80));
                          *(undefined1 (*) [16])(local_a30.ray + 0x140) = auVar164;
                        }
                      }
                      auVar359 = ZEXT464((uint)local_ba0);
                      auVar139._8_8_ = 0x100000001;
                      auVar139._0_8_ = 0x100000001;
                      if ((auVar139 & auVar128) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar228;
                      }
                    }
                  }
                }
              }
              auVar106 = local_640;
              auVar354 = ZEXT464((uint)fVar238);
              bVar89 = lVar88 != 0;
              lVar88 = lVar88 + -1;
            } while ((!bVar65) && (bVar89));
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar113._4_4_ = uVar1;
            auVar113._0_4_ = uVar1;
            auVar113._8_4_ = uVar1;
            auVar113._12_4_ = uVar1;
            auVar113._16_4_ = uVar1;
            auVar113._20_4_ = uVar1;
            auVar113._24_4_ = uVar1;
            auVar113._28_4_ = uVar1;
            auVar107 = vcmpps_avx(_local_880,auVar113,2);
            local_640 = vandps_avx(auVar107,local_640);
            auVar106 = auVar106 & auVar107;
            uVar87 = local_660._0_8_;
          } while ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar106 >> 0x7f,0) != '\0') ||
                     (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar106 >> 0xbf,0) != '\0') ||
                   (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar106[0x1f] < '\0');
        }
        auVar106 = vandps_avx(local_5a0,local_580);
        auVar107 = vandps_avx(_local_8e0,_local_8c0);
        auVar250 = ZEXT3264(_local_940);
        auVar180._0_4_ = local_940._0_4_ + local_340._0_4_;
        auVar180._4_4_ = local_940._4_4_ + local_340._4_4_;
        auVar180._8_4_ = local_940._8_4_ + local_340._8_4_;
        auVar180._12_4_ = local_940._12_4_ + local_340._12_4_;
        auVar180._16_4_ = local_940._16_4_ + local_340._16_4_;
        auVar180._20_4_ = local_940._20_4_ + local_340._20_4_;
        auVar180._24_4_ = local_940._24_4_ + local_340._24_4_;
        auVar180._28_4_ = local_940._28_4_ + local_340._28_4_;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar209._4_4_ = uVar1;
        auVar209._0_4_ = uVar1;
        auVar209._8_4_ = uVar1;
        auVar209._12_4_ = uVar1;
        auVar209._16_4_ = uVar1;
        auVar209._20_4_ = uVar1;
        auVar209._24_4_ = uVar1;
        auVar209._28_4_ = uVar1;
        auVar141 = vcmpps_avx(auVar180,auVar209,2);
        auVar106 = vandps_avx(auVar141,auVar106);
        auVar225._0_4_ = local_940._0_4_ + local_300._0_4_;
        auVar225._4_4_ = local_940._4_4_ + local_300._4_4_;
        auVar225._8_4_ = local_940._8_4_ + local_300._8_4_;
        auVar225._12_4_ = local_940._12_4_ + local_300._12_4_;
        auVar225._16_4_ = local_940._16_4_ + local_300._16_4_;
        auVar225._20_4_ = local_940._20_4_ + local_300._20_4_;
        auVar225._24_4_ = local_940._24_4_ + local_300._24_4_;
        auVar225._28_4_ = local_940._28_4_ + local_300._28_4_;
        auVar141 = vcmpps_avx(auVar225,auVar209,2);
        auVar107 = vandps_avx(auVar141,auVar107);
        auVar107 = vorps_avx(auVar106,auVar107);
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar107 >> 0x7f,0) != '\0') ||
              (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar107 >> 0xbf,0) != '\0') ||
            (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar107[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar84 * 0x60) = auVar107;
          auVar106 = vblendvps_avx(_local_300,_local_340,auVar106);
          *(undefined1 (*) [32])(auStack_160 + uVar84 * 0x60) = auVar106;
          auVar286 = ZEXT1664(local_a00);
          uVar2 = vmovlps_avx(local_a00);
          *(undefined8 *)(afStack_140 + uVar84 * 0x18) = uVar2;
          auStack_138[uVar84 * 0x18] = (int)uVar87 + 1;
          uVar84 = (ulong)((int)uVar84 + 1);
          auVar227 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          goto LAB_00f9a202;
        }
        auVar224._8_4_ = 0x3f800000;
        auVar224._0_8_ = &DAT_3f8000003f800000;
        auVar224._12_4_ = 0x3f800000;
        auVar224._16_4_ = 0x3f800000;
        auVar224._20_4_ = 0x3f800000;
        auVar224._24_4_ = 0x3f800000;
        auVar224._28_4_ = 0x3f800000;
      }
      auVar227 = ZEXT3264(auVar224);
      auVar286 = ZEXT1664(local_a00);
    }
LAB_00f9a202:
    do {
      if ((int)uVar84 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar105._4_4_ = uVar1;
        auVar105._0_4_ = uVar1;
        auVar105._8_4_ = uVar1;
        auVar105._12_4_ = uVar1;
        auVar128 = vcmpps_avx(local_510,auVar105,2);
        uVar83 = vmovmskps_avx(auVar128);
        uVar83 = (uint)local_8e8 & uVar83;
        if (uVar83 == 0) {
          return;
        }
        goto LAB_00f99087;
      }
      uVar85 = (ulong)((int)uVar84 - 1);
      lVar88 = uVar85 * 0x60;
      auVar106 = *(undefined1 (*) [32])(auStack_160 + lVar88);
      auVar109._0_4_ = auVar250._0_4_ + auVar106._0_4_;
      auVar109._4_4_ = auVar250._4_4_ + auVar106._4_4_;
      auVar109._8_4_ = auVar250._8_4_ + auVar106._8_4_;
      auVar109._12_4_ = auVar250._12_4_ + auVar106._12_4_;
      auVar109._16_4_ = auVar250._16_4_ + auVar106._16_4_;
      auVar109._20_4_ = auVar250._20_4_ + auVar106._20_4_;
      auVar109._24_4_ = auVar250._24_4_ + auVar106._24_4_;
      auVar109._28_4_ = auVar250._28_4_ + auVar106._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar192._4_4_ = uVar1;
      auVar192._0_4_ = uVar1;
      auVar192._8_4_ = uVar1;
      auVar192._12_4_ = uVar1;
      auVar192._16_4_ = uVar1;
      auVar192._20_4_ = uVar1;
      auVar192._24_4_ = uVar1;
      auVar192._28_4_ = uVar1;
      auVar141 = vcmpps_avx(auVar109,auVar192,2);
      auVar107 = vandps_avx(auVar141,*(undefined1 (*) [32])(auStack_180 + lVar88));
      _local_740 = auVar107;
      auVar141 = *(undefined1 (*) [32])(auStack_180 + lVar88) & auVar141;
      bVar70 = (auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar71 = (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar69 = (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar68 = SUB321(auVar141 >> 0x7f,0) == '\0';
      bVar67 = (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar66 = SUB321(auVar141 >> 0xbf,0) == '\0';
      bVar89 = (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar65 = -1 < auVar141[0x1f];
      if (((((((!bVar70 || !bVar71) || !bVar69) || !bVar68) || !bVar67) || !bVar66) || !bVar89) ||
          !bVar65) {
        auVar176._8_4_ = 0x7f800000;
        auVar176._0_8_ = 0x7f8000007f800000;
        auVar176._12_4_ = 0x7f800000;
        auVar176._16_4_ = 0x7f800000;
        auVar176._20_4_ = 0x7f800000;
        auVar176._24_4_ = 0x7f800000;
        auVar176._28_4_ = 0x7f800000;
        auVar106 = vblendvps_avx(auVar176,auVar106,auVar107);
        auVar141 = vshufps_avx(auVar106,auVar106,0xb1);
        auVar141 = vminps_avx(auVar106,auVar141);
        auVar16 = vshufpd_avx(auVar141,auVar141,5);
        auVar141 = vminps_avx(auVar141,auVar16);
        auVar16 = vperm2f128_avx(auVar141,auVar141,1);
        auVar141 = vminps_avx(auVar141,auVar16);
        auVar106 = vcmpps_avx(auVar106,auVar141,0);
        auVar141 = auVar107 & auVar106;
        if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar141 >> 0x7f,0) != '\0') ||
              (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar141 >> 0xbf,0) != '\0') ||
            (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar141[0x1f] < '\0') {
          auVar107 = vandps_avx(auVar106,auVar107);
        }
        fVar181 = afStack_140[uVar85 * 0x18 + 1];
        uVar87 = (ulong)auStack_138[uVar85 * 0x18];
        uVar86 = vmovmskps_avx(auVar107);
        uVar4 = 0;
        if (uVar86 != 0) {
          for (; (uVar86 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        fVar228 = afStack_140[uVar85 * 0x18];
        *(undefined4 *)(local_740 + (ulong)uVar4 * 4) = 0;
        if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_740 >> 0x7f,0) != '\0') ||
              (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_740 >> 0xbf,0) != '\0') ||
            (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_740[0x1f] < '\0') {
          uVar85 = uVar84;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar88) = _local_740;
        auVar128 = vshufps_avx(ZEXT416((uint)(fVar181 - fVar228)),ZEXT416((uint)(fVar181 - fVar228))
                               ,0);
        local_340._4_4_ = fVar228 + auVar128._4_4_ * 0.14285715;
        local_340._0_4_ = fVar228 + auVar128._0_4_ * 0.0;
        fStack_338 = fVar228 + auVar128._8_4_ * 0.2857143;
        fStack_334 = fVar228 + auVar128._12_4_ * 0.42857146;
        fStack_330 = fVar228 + auVar128._0_4_ * 0.5714286;
        fStack_32c = fVar228 + auVar128._4_4_ * 0.71428573;
        fStack_328 = fVar228 + auVar128._8_4_ * 0.8571429;
        fStack_324 = fVar228 + auVar128._12_4_;
        auVar286 = ZEXT864(*(ulong *)(local_340 + (ulong)uVar4 * 4));
      }
      uVar84 = uVar85;
    } while (((((((bVar70 && bVar71) && bVar69) && bVar68) && bVar67) && bVar66) && bVar89) &&
             bVar65);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }